

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamANCF_3333::ComputeInternalJacobianContIntDamping
          (ChElementBeamANCF_3333 *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor)

{
  undefined1 (*pauVar1) [32];
  assign_op<double,_double> *paVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined8 *puVar6;
  plainobjectbase_evaluator_data<double,_45> *ppVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  element_type *peVar35;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var36;
  element_type *peVar37;
  double *pdVar38;
  undefined1 (*pauVar39) [16];
  ulong uVar40;
  long lVar41;
  plainobjectbase_evaluator_data<double,_45> *ppVar42;
  Matrix<double,_27,_81,_1,_27,_81> *pMVar43;
  Matrix<double,_27,_81,_1,_27,_81> *pMVar44;
  Matrix<double,_27,_81,_1,_27,_81> *pMVar45;
  Matrix<double,_27,_81,_1,_27,_81> *pMVar46;
  Matrix<double,_27,_81,_1,_27,_81> *pMVar47;
  Matrix<double,_27,_81,_1,_27,_81> *pMVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  long lVar119;
  uint uVar120;
  PointerType pdVar121;
  ulong uVar122;
  double *pdVar123;
  double *pdVar124;
  double *pdVar125;
  undefined1 (*pauVar126) [32];
  char *pcVar127;
  Index row;
  ulong uVar128;
  double *pdVar129;
  long lVar130;
  double *pdVar131;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  long lVar132;
  long lVar133;
  ulong uVar134;
  bool bVar135;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  double dVar185;
  undefined1 auVar186 [16];
  double dVar189;
  double dVar190;
  double dVar191;
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  double dVar198;
  double dVar202;
  double dVar203;
  double dVar204;
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  VectorNIP_D0 E_BlockDamping_D0;
  ChMatrixNMc<double,_3_*_NIP,_6> FC;
  ChVectorN<double,_(NSF_*_(NSF___1))___2>_conflict1 ScaledMassMatrix;
  ChMatrixNMc<double,_3_*_NIP,_3> FCscaled;
  ChMatrixNM<double,_3_*_NSF,_3_*_NIP_Dv>_conflict Scaled_Combined_PE_Dv;
  ChMatrixNM<double,_NSF,_3_*_NIP>_conflict1 S_scaled_SD;
  MatrixNx6 ebar_ebardot;
  ChMatrixNM<double,_3_*_NSF,_6_*_NIP_D0___3_*_NIP_Dv>_conflict PE;
  ChMatrixNM<double,_3_*_NSF,_6_*_NIP_D0___3_*_NIP_Dv>_conflict DScaled_Combined_PE;
  scalar_sum_op<double,_double> local_bb79;
  ChElementBeamANCF_3333 *local_bb78;
  double local_bb70;
  undefined8 uStack_bb68;
  undefined1 local_bb60 [16];
  undefined1 local_bb50 [16];
  Matrix<double,_27,_81,_1,_27,_81> **local_bb40;
  double dStack_bb38;
  double local_bb30;
  double dStack_bb28;
  ChMatrixRef *local_bb18;
  double local_bb10;
  Matrix<double,__1,__1,_1,__1,__1> *local_bb08;
  undefined1 local_bb00 [16];
  double dStack_baf0;
  double dStack_bae8;
  undefined1 local_bad0 [16];
  double *local_bac0;
  double *local_bab0;
  Scalar local_baa8;
  int local_baa0;
  undefined4 uStack_ba9c;
  double dStack_ba98;
  double dStack_ba90;
  double dStack_ba88;
  undefined1 local_ba80 [16];
  double dStack_ba70;
  double dStack_ba68;
  undefined1 local_ba60 [16];
  double dStack_ba50;
  double dStack_ba48;
  undefined1 local_ba40 [16];
  double dStack_ba30;
  double dStack_ba28;
  double local_ba20;
  double dStack_ba18;
  double dStack_ba10;
  double dStack_ba08;
  double local_ba00;
  double dStack_b9f8;
  double dStack_b9f0;
  double dStack_b9e8;
  undefined1 local_b9e0 [16];
  undefined1 local_b9d0 [16];
  undefined1 local_b9c0 [16];
  double local_b9b0;
  double dStack_b9a8;
  double local_b9a0;
  double dStack_b998;
  undefined1 local_b990 [16];
  Matrix<double,_27,_81,_1,_27,_81> **local_b980;
  Matrix<double,_27,_81,_1,_27,_81> **ppMStack_b978;
  undefined1 local_b970 [16];
  undefined1 local_b960 [16];
  undefined1 local_b950 [16];
  undefined1 local_b940 [16];
  undefined1 local_b930 [16];
  double local_b920;
  double dStack_b918;
  double local_b910;
  double dStack_b908;
  undefined1 local_b900 [256];
  undefined1 local_b800 [32];
  undefined1 local_b7e0 [16];
  double local_b7d0;
  undefined1 local_b7c8 [16];
  double local_b7b8;
  undefined1 local_b7b0 [16];
  double local_b7a0;
  double local_b798;
  double dStack_b790;
  double dStack_b788;
  double dStack_b780;
  double local_b778;
  double dStack_b770;
  double dStack_b768;
  double dStack_b760;
  double local_b758;
  double dStack_b750;
  double dStack_b748;
  double dStack_b740;
  double local_b738;
  double dStack_b730;
  double dStack_b728;
  double dStack_b720;
  double local_b718;
  double dStack_b710;
  double dStack_b708;
  double dStack_b700;
  double local_b6f8;
  double dStack_b6f0;
  double dStack_b6e8;
  double dStack_b6e0;
  undefined1 local_b6d8 [32];
  undefined1 local_b6b8 [32];
  undefined1 local_b698 [32];
  undefined1 local_b678 [16];
  double local_b668;
  undefined1 local_b660 [16];
  double local_b650;
  undefined1 local_b648 [16];
  double local_b638;
  double local_b630;
  double dStack_b628;
  double dStack_b620;
  double dStack_b618;
  double local_b610;
  double dStack_b608;
  double dStack_b600;
  double dStack_b5f8;
  double local_b5f0;
  double dStack_b5e8;
  double dStack_b5e0;
  double dStack_b5d8;
  double local_b5d0;
  double dStack_b5c8;
  double dStack_b5c0;
  double dStack_b5b8;
  double local_b5b0;
  double dStack_b5a8;
  double dStack_b5a0;
  double dStack_b598;
  double local_b590;
  double dStack_b588;
  double dStack_b580;
  double dStack_b578;
  undefined1 local_b570 [32];
  undefined1 local_b550 [32];
  undefined1 local_b530 [32];
  undefined1 local_b510 [16];
  double local_b500;
  undefined1 local_b4f8 [16];
  double local_b4e8;
  undefined1 local_b4e0 [16];
  double local_b4d0;
  double local_b4c8;
  double dStack_b4c0;
  double dStack_b4b8;
  double dStack_b4b0;
  double local_b4a8;
  double dStack_b4a0;
  double dStack_b498;
  double dStack_b490;
  double local_b488;
  double dStack_b480;
  double dStack_b478;
  double dStack_b470;
  double local_b468;
  double dStack_b460;
  double dStack_b458;
  double dStack_b450;
  double local_b448;
  double dStack_b440;
  double dStack_b438;
  double dStack_b430;
  double local_b428;
  double dStack_b420;
  double dStack_b418;
  double dStack_b410;
  double local_b408;
  double dStack_b400;
  double dStack_b3f8;
  double dStack_b3f0;
  undefined1 local_b3e8 [32];
  undefined1 local_b3c8 [32];
  double local_b3a8;
  double dStack_b3a0;
  double local_b398;
  undefined1 local_b390 [16];
  double local_b380;
  undefined1 local_b378 [16];
  double local_b368;
  double local_b360;
  double dStack_b358;
  double dStack_b350;
  double dStack_b348;
  double local_b340;
  double dStack_b338;
  double dStack_b330;
  double dStack_b328;
  double local_b320;
  double dStack_b318;
  double dStack_b310;
  double dStack_b308;
  double local_b300;
  double dStack_b2f8;
  double dStack_b2f0;
  double dStack_b2e8;
  double local_b2e0;
  double dStack_b2d8;
  double dStack_b2d0;
  double dStack_b2c8;
  double local_b2c0;
  double dStack_b2b8;
  double dStack_b2b0;
  double dStack_b2a8;
  double local_b2a0;
  double dStack_b298;
  double dStack_b290;
  double dStack_b288;
  undefined1 local_b280 [32];
  undefined1 local_b260 [32];
  undefined1 local_b240 [16];
  double local_b230;
  undefined1 local_b228 [16];
  double local_b218;
  undefined1 local_b210 [16];
  double local_b200;
  double local_b1f8;
  double dStack_b1f0;
  double dStack_b1e8;
  double dStack_b1e0;
  double local_b1d8;
  double dStack_b1d0;
  double dStack_b1c8;
  double dStack_b1c0;
  double local_b1b8;
  double dStack_b1b0;
  double dStack_b1a8;
  double dStack_b1a0;
  double local_b198;
  double dStack_b190;
  double dStack_b188;
  double dStack_b180;
  double local_b178;
  double dStack_b170;
  double dStack_b168;
  double dStack_b160;
  double local_b158;
  double dStack_b150;
  double dStack_b148;
  double dStack_b140;
  double local_b138;
  double dStack_b130;
  double dStack_b128;
  double dStack_b120;
  undefined1 local_b118 [32];
  undefined1 local_b0f8 [32];
  undefined1 local_b0d8 [16];
  double local_b0c8;
  undefined1 local_b0c0 [16];
  double local_b0b0;
  undefined1 local_b0a8 [16];
  double local_b098;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_45,_true>_>_>
  local_b090;
  Matrix<double,_27,_81,_1,_27,_81> *local_aff0;
  Transpose<Eigen::Matrix<double,_27,_81,_1,_27,_81>_> TStack_afe8;
  double local_afe0 [44];
  double local_ae80 [4];
  double local_ae60;
  double dStack_ae58;
  double dStack_ae50;
  double dStack_ae48;
  double local_ae40;
  double dStack_ae38;
  double dStack_ae30;
  double dStack_ae28;
  double local_ae20;
  double dStack_ae18;
  double dStack_ae10;
  double dStack_ae08;
  double local_ae00;
  double dStack_adf8;
  double dStack_adf0;
  double dStack_ade8;
  double local_ade0;
  double dStack_add8;
  double dStack_add0;
  double dStack_adc8;
  double local_adc0;
  double dStack_adb8;
  double dStack_adb0;
  double dStack_ada8;
  double local_ada0;
  double dStack_ad98;
  double dStack_ad90;
  double dStack_ad88;
  double local_ad80;
  double dStack_ad78;
  double dStack_ad70;
  double dStack_ad68;
  undefined1 local_ad60 [16];
  double local_ad50;
  undefined1 local_ad48 [16];
  double local_ad38;
  undefined1 local_ad30 [16];
  double local_ad20;
  double local_ad18;
  double dStack_ad10;
  double dStack_ad08;
  double dStack_ad00;
  double local_acf8;
  double dStack_acf0;
  double dStack_ace8;
  double dStack_ace0;
  double local_acd8;
  double dStack_acd0;
  double dStack_acc8;
  double dStack_acc0;
  double local_acb8;
  double dStack_acb0;
  double dStack_aca8;
  double dStack_aca0;
  double local_ac98;
  double dStack_ac90;
  double dStack_ac88;
  double dStack_ac80;
  double local_ac78;
  double dStack_ac70;
  double dStack_ac68;
  double dStack_ac60;
  double local_ac58;
  double dStack_ac50;
  double dStack_ac48;
  double dStack_ac40;
  double local_ac38;
  double dStack_ac30;
  double dStack_ac28;
  double dStack_ac20;
  double local_ac18;
  double dStack_ac10;
  double dStack_ac08;
  double dStack_ac00;
  undefined1 local_abf8 [16];
  double local_abe8;
  undefined1 local_abe0 [16];
  double local_abd0;
  undefined1 local_abc8 [16];
  double local_abb8;
  double local_abb0;
  double dStack_aba8;
  double dStack_aba0;
  double dStack_ab98;
  double local_ab90;
  double dStack_ab88;
  double dStack_ab80;
  double dStack_ab78;
  double local_ab70;
  double dStack_ab68;
  double dStack_ab60;
  double dStack_ab58;
  double local_ab50;
  double dStack_ab48;
  double dStack_ab40;
  double dStack_ab38;
  double local_ab30;
  double dStack_ab28;
  double dStack_ab20;
  double dStack_ab18;
  double local_ab10;
  double dStack_ab08;
  double dStack_ab00;
  double dStack_aaf8;
  double local_aaf0;
  double dStack_aae8;
  double dStack_aae0;
  double dStack_aad8;
  double local_aad0;
  double dStack_aac8;
  double dStack_aac0;
  double dStack_aab8;
  double local_aab0;
  double dStack_aaa8;
  double dStack_aaa0;
  double dStack_aa98;
  undefined1 local_aa90 [16];
  double local_aa80;
  undefined1 local_aa78 [16];
  double local_aa68;
  undefined1 local_aa60 [16];
  double local_aa50;
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_45,_true>_>_>_>
  local_aa48;
  undefined1 local_aa00 [8];
  double dStack_a9f8;
  double dStack_a9f0;
  double dStack_a9e8;
  undefined8 local_a9e0;
  undefined1 auStack_a9d8 [16];
  undefined8 uStack_a9c8;
  undefined1 local_a9c0 [16];
  double dStack_a9b0;
  double dStack_a9a8;
  undefined1 local_a9a0 [8];
  double dStack_a998;
  double dStack_a990;
  double dStack_a988;
  double local_a980;
  double adStack_a978 [3];
  double local_a960 [3];
  double adStack_a948 [2];
  plainobjectbase_evaluator_data<double,_45> local_a938 [243];
  Matrix<double,_9,_45,_1,_9,_45> local_a1a0;
  undefined1 auStack_9098 [32];
  undefined1 auStack_9078 [32];
  undefined1 auStack_9058 [32];
  undefined1 auStack_9038 [32];
  undefined1 auStack_9018 [32];
  undefined1 auStack_8ff8 [32];
  undefined1 auStack_8fd8 [32];
  undefined1 auStack_8fb8 [32];
  undefined1 auStack_8f98 [32];
  undefined1 auStack_8f78 [32];
  undefined1 auStack_8f58 [32];
  undefined1 auStack_8f38 [32];
  undefined1 auStack_8f18 [32];
  undefined1 auStack_8ef8 [32];
  undefined1 auStack_8ed8 [32];
  undefined1 auStack_8eb8 [32];
  undefined1 auStack_8e98 [32];
  undefined1 auStack_8e78 [32];
  undefined1 auStack_8e58 [16];
  undefined8 uStack_8e48;
  undefined1 auStack_8e40 [16];
  undefined8 uStack_8e30;
  undefined1 auStack_8e28 [16];
  undefined8 uStack_8e18;
  undefined1 auStack_8e10 [32];
  undefined1 auStack_8df0 [32];
  undefined1 auStack_8dd0 [32];
  undefined1 auStack_8db0 [32];
  undefined1 auStack_8d90 [32];
  undefined1 auStack_8d70 [32];
  undefined1 auStack_8d50 [32];
  undefined1 auStack_8d30 [32];
  undefined1 auStack_8d10 [32];
  undefined1 auStack_8cf0 [32];
  undefined1 auStack_8cd0 [32];
  undefined1 auStack_8cb0 [32];
  undefined1 auStack_8c90 [32];
  undefined1 auStack_8c70 [32];
  undefined1 auStack_8c50 [32];
  undefined1 auStack_8c30 [32];
  undefined1 auStack_8c10 [32];
  undefined1 auStack_8bf0 [32];
  undefined1 auStack_8bd0 [16];
  undefined8 uStack_8bc0;
  undefined1 auStack_8bb8 [16];
  undefined8 uStack_8ba8;
  undefined1 auStack_8ba0 [16];
  undefined8 uStack_8b90;
  undefined1 auStack_8b88 [32];
  undefined1 auStack_8b68 [32];
  undefined1 auStack_8b48 [32];
  undefined1 auStack_8b28 [32];
  undefined1 auStack_8b08 [32];
  undefined1 auStack_8ae8 [32];
  undefined1 auStack_8ac8 [8];
  MatrixNx6 local_8ac0;
  Matrix<double,_27,_81,_1,_27,_81> local_8908;
  Matrix<double,_27,_81,_1,_27,_81> local_44b0;
  
  local_bb00._0_8_ = Rfactor;
  local_bb18 = H;
  local_bb10 = Kfactor;
  local_bac0 = (double *)Mfactor;
  CalcCombinedCoordMatrix(this,&local_8ac0);
  if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
      != 9) {
    pcVar127 = 
    "Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Eigen::Matrix<double, 9, 6, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Matrix<double, 9, 6, 1>, Option = 0]"
    ;
LAB_00721a44:
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar127);
  }
  local_bb08 = &this->m_SD;
  local_8908.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.array
  [0] = (double)local_bb08;
  local_8908.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.array
  [1] = (double)&local_8ac0;
  if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
      != 0x2d) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, 45, 6, 0>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 45, 6, 0>]"
                 );
  }
  memset((Matrix<double,_45,_6,_0,_45,_6> *)local_b900,0,0x870);
  local_44b0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.array
  [0] = 1.0;
  Eigen::internal::
  generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>,Eigen::Matrix<double,9,6,1,9,6>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,45,6,0,45,6>>
            ((Matrix<double,_45,_6,_0,_45,_6> *)local_b900,
             (Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_8908,&local_8ac0,
             (Scalar *)&local_44b0);
  uVar122 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_cols;
  if (0xb < (long)uVar122) {
    uVar128 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows;
    auVar152._8_8_ = local_b900._8_8_;
    auVar152._0_8_ = local_b900._0_8_;
    auVar152._16_8_ = local_b900._16_8_;
    auVar152._24_8_ = local_b900._24_8_;
    auVar153._8_8_ = local_b900._40_8_;
    auVar153._0_8_ = local_b900._32_8_;
    auVar153._16_8_ = local_b900._48_8_;
    auVar153._24_8_ = local_b900._56_8_;
    auVar154._8_8_ = local_b900._72_8_;
    auVar154._0_8_ = local_b900._64_8_;
    auVar154._16_8_ = local_b900._80_8_;
    auVar154._24_8_ = local_b900._88_8_;
    auVar155._8_8_ = local_b900._104_8_;
    auVar155._0_8_ = local_b900._96_8_;
    auVar155._16_8_ = local_b900._112_8_;
    auVar155._24_8_ = local_b900._120_8_;
    auVar156._8_8_ = local_b900._136_8_;
    auVar156._0_8_ = local_b900._128_8_;
    auVar156._16_8_ = local_b900._144_8_;
    auVar156._24_8_ = local_b900._152_8_;
    auVar157._8_8_ = local_b900._168_8_;
    auVar157._0_8_ = local_b900._160_8_;
    auVar157._16_8_ = local_b900._176_8_;
    auVar157._24_8_ = local_b900._184_8_;
    auVar158._8_8_ = local_b900._200_8_;
    auVar158._0_8_ = local_b900._192_8_;
    auVar158._16_8_ = local_b900._208_8_;
    auVar158._24_8_ = local_b900._216_8_;
    auVar140._8_8_ = 0;
    auVar140._0_8_ = local_b7d0;
    auVar137._8_8_ = 0;
    auVar137._0_8_ = local_b7b8;
    auVar138._8_8_ = 0;
    auVar138._0_8_ = local_b7a0;
    auVar159._8_8_ = dStack_b790;
    auVar159._0_8_ = local_b798;
    auVar159._16_8_ = dStack_b788;
    auVar159._24_8_ = dStack_b780;
    auVar160._8_8_ = dStack_b770;
    auVar160._0_8_ = local_b778;
    auVar160._16_8_ = dStack_b768;
    auVar160._24_8_ = dStack_b760;
    auVar161._8_8_ = dStack_b750;
    auVar161._0_8_ = local_b758;
    auVar161._16_8_ = dStack_b748;
    auVar161._24_8_ = dStack_b740;
    auVar162._8_8_ = dStack_b730;
    auVar162._0_8_ = local_b738;
    auVar162._16_8_ = dStack_b728;
    auVar162._24_8_ = dStack_b720;
    pauVar126 = (undefined1 (*) [32])
                (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
    lVar132 = 0x790;
    uVar128 = ~((long)uVar128 >> 0x3f) & uVar128;
    do {
      bVar135 = uVar128 == 0;
      uVar128 = uVar128 - 1;
      if (bVar135) goto LAB_00721a51;
      auVar148 = vmulpd_avx512vl(auVar152,*pauVar126);
      *(undefined1 (*) [32])(auStack_9098 + lVar132) = auVar148;
      auVar148 = vmulpd_avx512vl(auVar153,pauVar126[1]);
      *(undefined1 (*) [32])(auStack_9078 + lVar132) = auVar148;
      auVar148 = vmulpd_avx512vl(auVar154,pauVar126[2]);
      *(undefined1 (*) [32])(auStack_9058 + lVar132) = auVar148;
      if (uVar122 < 0x18) goto LAB_00721a51;
      auVar148 = vmulpd_avx512vl(auVar155,pauVar126[3]);
      *(undefined1 (*) [32])(auStack_9038 + lVar132) = auVar148;
      auVar148 = vmulpd_avx512vl(auVar156,pauVar126[4]);
      *(undefined1 (*) [32])(auStack_9018 + lVar132) = auVar148;
      auVar148 = vmulpd_avx512vl(auVar157,pauVar126[5]);
      *(undefined1 (*) [32])(auStack_8ff8 + lVar132) = auVar148;
      if (uVar122 < 0x24) goto LAB_00721a51;
      auVar148 = vmulpd_avx512vl(auVar158,pauVar126[6]);
      *(undefined1 (*) [32])(auStack_8fd8 + lVar132) = auVar148;
      auVar148 = vmulpd_avx512vl(local_b900._224_32_,pauVar126[7]);
      *(undefined1 (*) [32])(auStack_8fb8 + lVar132) = auVar148;
      auVar148 = vmulpd_avx512vl(local_b800,pauVar126[8]);
      *(undefined1 (*) [32])(auStack_8f98 + lVar132) = auVar148;
      auVar148 = vmulpd_avx512vl(auVar155,pauVar126[6]);
      auVar149 = vmulpd_avx512vl(auVar158,pauVar126[3]);
      auVar148 = vaddpd_avx512vl(auVar148,auVar149);
      *(undefined1 (*) [32])(auStack_8f78 + lVar132) = auVar148;
      auVar148 = vmulpd_avx512vl(auVar156,pauVar126[7]);
      auVar149 = vmulpd_avx512vl(local_b900._224_32_,pauVar126[4]);
      auVar148 = vaddpd_avx512vl(auVar148,auVar149);
      *(undefined1 (*) [32])(auStack_8f58 + lVar132) = auVar148;
      auVar148 = vmulpd_avx512vl(auVar157,pauVar126[8]);
      auVar149 = vmulpd_avx512vl(local_b800,pauVar126[5]);
      auVar148 = vaddpd_avx512vl(auVar148,auVar149);
      *(undefined1 (*) [32])(auStack_8f38 + lVar132) = auVar148;
      auVar148 = vmulpd_avx512vl(auVar152,pauVar126[6]);
      auVar149 = vmulpd_avx512vl(auVar158,*pauVar126);
      auVar148 = vaddpd_avx512vl(auVar148,auVar149);
      *(undefined1 (*) [32])(auStack_8f18 + lVar132) = auVar148;
      auVar148 = vmulpd_avx512vl(auVar153,pauVar126[7]);
      auVar149 = vmulpd_avx512vl(local_b900._224_32_,pauVar126[1]);
      auVar148 = vaddpd_avx512vl(auVar148,auVar149);
      *(undefined1 (*) [32])(auStack_8ef8 + lVar132) = auVar148;
      auVar148 = vmulpd_avx512vl(auVar154,pauVar126[8]);
      auVar149 = vmulpd_avx512vl(local_b800,pauVar126[2]);
      auVar148 = vaddpd_avx512vl(auVar148,auVar149);
      *(undefined1 (*) [32])(auStack_8ed8 + lVar132) = auVar148;
      auVar148 = vmulpd_avx512vl(auVar152,pauVar126[3]);
      auVar149 = vmulpd_avx512vl(auVar155,*pauVar126);
      auVar148 = vaddpd_avx512vl(auVar148,auVar149);
      *(undefined1 (*) [32])(auStack_8eb8 + lVar132) = auVar148;
      auVar148 = vmulpd_avx512vl(auVar153,pauVar126[4]);
      auVar149 = vmulpd_avx512vl(auVar156,pauVar126[1]);
      auVar148 = vaddpd_avx512vl(auVar148,auVar149);
      *(undefined1 (*) [32])(auStack_8e98 + lVar132) = auVar148;
      auVar148 = vmulpd_avx512vl(auVar154,pauVar126[5]);
      auVar149 = vmulpd_avx512vl(auVar157,pauVar126[2]);
      auVar148 = vaddpd_avx512vl(auVar148,auVar149);
      *(undefined1 (*) [32])(auStack_8e78 + lVar132) = auVar148;
      if (uVar122 < 0x27) goto LAB_00721a68;
      auVar136 = vmulpd_avx512vl(local_b7e0,*(undefined1 (*) [16])pauVar126[9]);
      *(undefined1 (*) [16])(auStack_8e58 + lVar132) = auVar136;
      auVar136._8_8_ = 0;
      auVar136._0_8_ = *(ulong *)(pauVar126[9] + 0x10);
      auVar136 = vmulsd_avx512f(auVar140,auVar136);
      vmovsd_avx512f(auVar136);
      *(undefined8 *)((long)&uStack_8e48 + lVar132) = *(undefined8 *)((long)&uStack_8e48 + lVar132);
      if (uVar122 < 0x2a) goto LAB_00721a68;
      auVar136 = vmulpd_avx512vl(local_b7c8,*(undefined1 (*) [16])(pauVar126[9] + 0x18));
      *(undefined1 (*) [16])(auStack_8e40 + lVar132) = auVar136;
      auVar139._8_8_ = 0;
      auVar139._0_8_ = *(ulong *)(pauVar126[10] + 8);
      auVar136 = vmulsd_avx512f(auVar137,auVar139);
      vmovsd_avx512f(auVar136);
      *(undefined8 *)((long)&uStack_8e30 + lVar132) = *(undefined8 *)((long)&uStack_8e30 + lVar132);
      if (uVar122 < 0x2d) goto LAB_00721a68;
      auVar136 = vmulpd_avx512vl(local_b7b0,*(undefined1 (*) [16])(pauVar126[10] + 0x10));
      auVar149._8_8_ = dStack_b6f0;
      auVar149._0_8_ = local_b6f8;
      auVar149._16_8_ = dStack_b6e8;
      auVar149._24_8_ = dStack_b6e0;
      auVar166._8_8_ = dStack_b588;
      auVar166._0_8_ = local_b590;
      auVar166._16_8_ = dStack_b580;
      auVar166._24_8_ = dStack_b578;
      *(undefined1 (*) [16])(auStack_8e28 + lVar132) = auVar136;
      auVar141._8_8_ = 0;
      auVar141._0_8_ = *(ulong *)pauVar126[0xb];
      auVar136 = vmulsd_avx512f(auVar138,auVar141);
      vmovsd_avx512f(auVar136);
      *(undefined8 *)((long)&uStack_8e18 + lVar132) = *(undefined8 *)((long)&uStack_8e18 + lVar132);
      auVar148 = vmulpd_avx512vl(auVar159,*pauVar126);
      *(undefined1 (*) [32])(auStack_8e10 + lVar132) = auVar148;
      auVar148 = vmulpd_avx512vl(auVar160,pauVar126[1]);
      *(undefined1 (*) [32])(auStack_8df0 + lVar132) = auVar148;
      auVar148 = vmulpd_avx512vl(auVar161,pauVar126[2]);
      *(undefined1 (*) [32])(auStack_8dd0 + lVar132) = auVar148;
      auVar148 = vmulpd_avx512vl(auVar162,pauVar126[3]);
      *(undefined1 (*) [32])(auStack_8db0 + lVar132) = auVar148;
      auVar148._8_8_ = dStack_b710;
      auVar148._0_8_ = local_b718;
      auVar148._16_8_ = dStack_b708;
      auVar148._24_8_ = dStack_b700;
      auVar150 = vmulpd_avx512vl(auVar148,pauVar126[4]);
      *(undefined1 (*) [32])(auStack_8d90 + lVar132) = auVar150;
      auVar150 = vmulpd_avx512vl(auVar149,pauVar126[5]);
      *(undefined1 (*) [32])(auStack_8d70 + lVar132) = auVar150;
      auVar150 = vmulpd_avx512vl(local_b6d8,pauVar126[6]);
      *(undefined1 (*) [32])(auStack_8d50 + lVar132) = auVar150;
      auVar150 = vmulpd_avx512vl(local_b6b8,pauVar126[7]);
      *(undefined1 (*) [32])(auStack_8d30 + lVar132) = auVar150;
      auVar150 = vmulpd_avx512vl(local_b698,pauVar126[8]);
      *(undefined1 (*) [32])(auStack_8d10 + lVar132) = auVar150;
      auVar150 = vmulpd_avx512vl(auVar162,pauVar126[6]);
      auVar151 = vmulpd_avx512vl(local_b6d8,pauVar126[3]);
      auVar150 = vaddpd_avx512vl(auVar150,auVar151);
      *(undefined1 (*) [32])(auStack_8cf0 + lVar132) = auVar150;
      auVar150 = vmulpd_avx512vl(auVar148,pauVar126[7]);
      auVar151 = vmulpd_avx512vl(local_b6b8,pauVar126[4]);
      auVar150 = vaddpd_avx512vl(auVar150,auVar151);
      *(undefined1 (*) [32])(auStack_8cd0 + lVar132) = auVar150;
      auVar150 = vmulpd_avx512vl(auVar149,pauVar126[8]);
      auVar151 = vmulpd_avx512vl(local_b698,pauVar126[5]);
      auVar150 = vaddpd_avx512vl(auVar150,auVar151);
      *(undefined1 (*) [32])(auStack_8cb0 + lVar132) = auVar150;
      auVar150 = vmulpd_avx512vl(auVar159,pauVar126[6]);
      auVar151 = vmulpd_avx512vl(local_b6d8,*pauVar126);
      auVar150 = vaddpd_avx512vl(auVar150,auVar151);
      *(undefined1 (*) [32])(auStack_8c90 + lVar132) = auVar150;
      auVar150 = vmulpd_avx512vl(auVar160,pauVar126[7]);
      auVar151 = vmulpd_avx512vl(local_b6b8,pauVar126[1]);
      auVar150 = vaddpd_avx512vl(auVar150,auVar151);
      *(undefined1 (*) [32])(auStack_8c70 + lVar132) = auVar150;
      auVar150 = vmulpd_avx512vl(auVar161,pauVar126[8]);
      auVar151 = vmulpd_avx512vl(local_b698,pauVar126[2]);
      auVar150 = vaddpd_avx512vl(auVar150,auVar151);
      *(undefined1 (*) [32])(auStack_8c50 + lVar132) = auVar150;
      auVar150 = vmulpd_avx512vl(auVar159,pauVar126[3]);
      auVar151 = vmulpd_avx512vl(auVar162,*pauVar126);
      auVar150 = vaddpd_avx512vl(auVar150,auVar151);
      *(undefined1 (*) [32])(auStack_8c30 + lVar132) = auVar150;
      auVar150 = vmulpd_avx512vl(auVar160,pauVar126[4]);
      auVar148 = vmulpd_avx512vl(auVar148,pauVar126[1]);
      auVar148 = vaddpd_avx512vl(auVar150,auVar148);
      *(undefined1 (*) [32])(auStack_8c10 + lVar132) = auVar148;
      auVar148 = vmulpd_avx512vl(auVar161,pauVar126[5]);
      auVar149 = vmulpd_avx512vl(auVar149,pauVar126[2]);
      auVar148 = vaddpd_avx512vl(auVar148,auVar149);
      *(undefined1 (*) [32])(auStack_8bf0 + lVar132) = auVar148;
      auVar136 = vmulpd_avx512vl(*(undefined1 (*) [16])pauVar126[9],local_b678);
      *(undefined1 (*) [16])(auStack_8bd0 + lVar132) = auVar136;
      auVar142._8_8_ = 0;
      auVar142._0_8_ = local_b668;
      auVar217._8_8_ = 0;
      auVar217._0_8_ = *(ulong *)(pauVar126[9] + 0x10);
      auVar136 = vmulsd_avx512f(auVar217,auVar142);
      vmovsd_avx512f(auVar136);
      *(undefined8 *)((long)&uStack_8bc0 + lVar132) = *(undefined8 *)((long)&uStack_8bc0 + lVar132);
      auVar136 = vmulpd_avx512vl(*(undefined1 (*) [16])(pauVar126[9] + 0x18),local_b660);
      *(undefined1 (*) [16])(auStack_8bb8 + lVar132) = auVar136;
      auVar143._8_8_ = 0;
      auVar143._0_8_ = local_b650;
      auVar218._8_8_ = 0;
      auVar218._0_8_ = *(ulong *)(pauVar126[10] + 8);
      auVar136 = vmulsd_avx512f(auVar218,auVar143);
      vmovsd_avx512f(auVar136);
      *(undefined8 *)((long)&uStack_8ba8 + lVar132) = *(undefined8 *)((long)&uStack_8ba8 + lVar132);
      auVar136 = vmulpd_avx512vl(*(undefined1 (*) [16])(pauVar126[10] + 0x10),local_b648);
      *(undefined1 (*) [16])(auStack_8ba0 + lVar132) = auVar136;
      auVar144._8_8_ = 0;
      auVar144._0_8_ = local_b638;
      auVar219._8_8_ = 0;
      auVar219._0_8_ = *(ulong *)pauVar126[0xb];
      auVar136 = vmulsd_avx512f(auVar219,auVar144);
      vmovsd_avx512f(auVar136);
      *(undefined8 *)((long)&uStack_8b90 + lVar132) = *(undefined8 *)((long)&uStack_8b90 + lVar132);
      auVar150._8_8_ = dStack_b628;
      auVar150._0_8_ = local_b630;
      auVar150._16_8_ = dStack_b620;
      auVar150._24_8_ = dStack_b618;
      auVar148 = vmulpd_avx512vl(auVar150,*pauVar126);
      *(undefined1 (*) [32])(auStack_8b88 + lVar132) = auVar148;
      auVar151._8_8_ = dStack_b608;
      auVar151._0_8_ = local_b610;
      auVar151._16_8_ = dStack_b600;
      auVar151._24_8_ = dStack_b5f8;
      auVar148 = vmulpd_avx512vl(auVar151,pauVar126[1]);
      *(undefined1 (*) [32])(auStack_8b68 + lVar132) = auVar148;
      auVar163._8_8_ = dStack_b5e8;
      auVar163._0_8_ = local_b5f0;
      auVar163._16_8_ = dStack_b5e0;
      auVar163._24_8_ = dStack_b5d8;
      auVar148 = vmulpd_avx512vl(auVar163,pauVar126[2]);
      *(undefined1 (*) [32])(auStack_8b48 + lVar132) = auVar148;
      auVar164._8_8_ = dStack_b5c8;
      auVar164._0_8_ = local_b5d0;
      auVar164._16_8_ = dStack_b5c0;
      auVar164._24_8_ = dStack_b5b8;
      auVar148 = vmulpd_avx512vl(auVar164,pauVar126[3]);
      *(undefined1 (*) [32])(auStack_8b28 + lVar132) = auVar148;
      auVar165._8_8_ = dStack_b5a8;
      auVar165._0_8_ = local_b5b0;
      auVar165._16_8_ = dStack_b5a0;
      auVar165._24_8_ = dStack_b598;
      auVar148 = vmulpd_avx512vl(auVar165,pauVar126[4]);
      *(undefined1 (*) [32])(auStack_8b08 + lVar132) = auVar148;
      auVar148 = vmulpd_avx512vl(auVar166,pauVar126[5]);
      *(undefined1 (*) [32])(auStack_8ae8 + lVar132) = auVar148;
      auVar148 = vmulpd_avx512vl(local_b570,pauVar126[6]);
      *(undefined1 (*) [32])(auStack_8ac8 + lVar132) = auVar148;
      auVar148 = vmulpd_avx512vl(local_b550,pauVar126[7]);
      *(undefined1 (*) [32])
       ((long)local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>.m_storage.
              m_data.array + lVar132 + 0x18) = auVar148;
      auVar148 = vmulpd_avx512vl(local_b530,pauVar126[8]);
      *(undefined1 (*) [32])
       ((long)local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>.m_storage.
              m_data.array + lVar132 + 0x38) = auVar148;
      auVar148 = vmulpd_avx512vl(auVar164,pauVar126[6]);
      auVar149 = vmulpd_avx512vl(local_b570,pauVar126[3]);
      auVar148 = vaddpd_avx512vl(auVar148,auVar149);
      *(undefined1 (*) [32])
       ((long)local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>.m_storage.
              m_data.array + lVar132 + 0x58) = auVar148;
      auVar148 = vmulpd_avx512vl(auVar165,pauVar126[7]);
      auVar149 = vmulpd_avx512vl(local_b550,pauVar126[4]);
      auVar148 = vaddpd_avx512vl(auVar148,auVar149);
      *(undefined1 (*) [32])
       ((long)local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>.m_storage.
              m_data.array + lVar132 + 0x78) = auVar148;
      auVar148 = vmulpd_avx512vl(auVar166,pauVar126[8]);
      auVar149 = vmulpd_avx512vl(local_b530,pauVar126[5]);
      auVar148 = vaddpd_avx512vl(auVar148,auVar149);
      *(undefined1 (*) [32])
       ((long)local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>.m_storage.
              m_data.array + lVar132 + 0x98) = auVar148;
      auVar148 = vmulpd_avx512vl(auVar150,pauVar126[6]);
      auVar149 = vmulpd_avx512vl(local_b570,*pauVar126);
      auVar148 = vaddpd_avx512vl(auVar148,auVar149);
      *(undefined1 (*) [32])
       ((long)local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>.m_storage.
              m_data.array + lVar132 + 0xb8) = auVar148;
      auVar148 = vmulpd_avx512vl(auVar151,pauVar126[7]);
      auVar149 = vmulpd_avx512vl(local_b550,pauVar126[1]);
      auVar148 = vaddpd_avx512vl(auVar148,auVar149);
      *(undefined1 (*) [32])
       ((long)local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>.m_storage.
              m_data.array + lVar132 + 0xd8) = auVar148;
      auVar148 = vmulpd_avx512vl(auVar163,pauVar126[8]);
      auVar149 = vmulpd_avx512vl(local_b530,pauVar126[2]);
      auVar148 = vaddpd_avx512vl(auVar148,auVar149);
      *(undefined1 (*) [32])
       ((long)local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>.m_storage.
              m_data.array + lVar132 + 0xf8) = auVar148;
      auVar148 = vmulpd_avx512vl(auVar150,pauVar126[3]);
      auVar149 = vmulpd_avx512vl(auVar164,*pauVar126);
      auVar148 = vaddpd_avx512vl(auVar148,auVar149);
      *(undefined1 (*) [32])
       ((long)local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>.m_storage.
              m_data.array + lVar132 + 0x118) = auVar148;
      auVar148 = vmulpd_avx512vl(auVar151,pauVar126[4]);
      auVar149 = vmulpd_avx512vl(auVar165,pauVar126[1]);
      auVar148 = vaddpd_avx512vl(auVar148,auVar149);
      *(undefined1 (*) [32])
       ((long)local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>.m_storage.
              m_data.array + lVar132 + 0x138) = auVar148;
      auVar148 = vmulpd_avx512vl(auVar163,pauVar126[5]);
      auVar149 = vmulpd_avx512vl(auVar166,pauVar126[2]);
      auVar148 = vaddpd_avx512vl(auVar148,auVar149);
      *(undefined1 (*) [32])
       ((long)local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>.m_storage.
              m_data.array + lVar132 + 0x158) = auVar148;
      auVar136 = vmulpd_avx512vl(*(undefined1 (*) [16])pauVar126[9],local_b510);
      *(undefined1 (*) [16])
       ((long)local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>.m_storage.
              m_data.array + lVar132 + 0x178) = auVar136;
      auVar145._8_8_ = 0;
      auVar145._0_8_ = local_b500;
      auVar220._8_8_ = 0;
      auVar220._0_8_ = *(ulong *)(pauVar126[9] + 0x10);
      auVar136 = vmulsd_avx512f(auVar220,auVar145);
      puVar6 = (undefined8 *)
               ((long)local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>.
                      m_storage.m_data.array + lVar132 + 0x188);
      vmovsd_avx512f(auVar136);
      *puVar6 = *puVar6;
      auVar136 = vmulpd_avx512vl(*(undefined1 (*) [16])(pauVar126[9] + 0x18),local_b4f8);
      *(undefined1 (*) [16])
       ((long)local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>.m_storage.
              m_data.array + lVar132 + 400) = auVar136;
      auVar146._8_8_ = 0;
      auVar146._0_8_ = local_b4e8;
      auVar221._8_8_ = 0;
      auVar221._0_8_ = *(ulong *)(pauVar126[10] + 8);
      auVar136 = vmulsd_avx512f(auVar221,auVar146);
      puVar6 = (undefined8 *)
               ((long)local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>.
                      m_storage.m_data.array + lVar132 + 0x1a0);
      vmovsd_avx512f(auVar136);
      *puVar6 = *puVar6;
      auVar136 = vmulpd_avx512vl(*(undefined1 (*) [16])(pauVar126[10] + 0x10),local_b4e0);
      *(undefined1 (*) [16])
       ((long)local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_>.m_storage.
              m_data.array + lVar132 + 0x1a8) = auVar136;
      pauVar1 = pauVar126 + 0xb;
      pauVar126 = (undefined1 (*) [32])(*pauVar126 + uVar122 * 8);
      auVar147._8_8_ = 0;
      auVar147._0_8_ = local_b4d0;
      auVar222._8_8_ = 0;
      auVar222._0_8_ = *(ulong *)*pauVar1;
      auVar136 = vmulsd_avx512f(auVar222,auVar147);
      puVar6 = (undefined8 *)
               ((long)local_8908.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.
                      m_storage.m_data.array + lVar132);
      vmovsd_avx512f(auVar136);
      *puVar6 = *puVar6;
      lVar132 = lVar132 + 0x798;
    } while (lVar132 != 0x4be8);
    auVar172._8_8_ = 0;
    auVar172._0_8_ = this->m_Alpha;
    auVar178._8_8_ = 0;
    auVar178._0_8_ = local_bb10;
    auVar181._8_8_ = 0;
    auVar181._0_8_ = local_bb00._0_8_;
    local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [0] = (double)local_a938;
    local_a938[0].data = local_ae80;
    local_44b0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[9] = (double)&local_b4c8;
    local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [2] = (double)&local_aff0;
    auVar140 = vfmadd213sd_fma(auVar181,auVar172,auVar178);
    local_44b0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[7] = this->m_Alpha * local_bb10;
    local_44b0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = auVar140._0_8_;
    local_bb78 = this;
    local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [1] = (double)&local_44b0;
    local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [3] = (double)local_a938[0].data;
    local_44b0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = (double)local_b900;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_45,_3,_0,_45,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_45,_3,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_45,_3,_0,_45,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_45,_3,_false>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_45,_3,_0,_45,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_45,_3,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_45,_3,_0,_45,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_45,_3,_false>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)&local_a1a0);
    lVar132 = (local_bb78->m_kGQ_Dv).
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
    lVar133 = (local_bb78->m_kGQ_Dv).
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
    if (((local_bb78->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_rows != 0xc) ||
       ((local_bb78->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
        m_storage.m_cols != 1)) {
      pcVar127 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double, 45, 3, 0>, 12, 1>>, SrcXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, -1, -1>>, Functor = Eigen::internal::mul_assign_op<double>]"
      ;
      goto LAB_00721a9f;
    }
    pdVar129 = (local_bb78->m_kGQ_D0).
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
    pdVar123 = (local_bb78->m_kGQ_Dv).
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
    lVar130 = 0x160;
    do {
      dVar185 = pdVar129[1];
      dVar189 = pdVar129[2];
      dVar190 = pdVar129[3];
      *(double *)((long)local_afe0 + lVar130) = *pdVar129 * *(double *)((long)local_afe0 + lVar130);
      *(double *)((long)local_afe0 + lVar130 + 8) =
           dVar185 * *(double *)((long)local_afe0 + lVar130 + 8);
      *(double *)((long)local_afe0 + lVar130 + 0x10) =
           dVar189 * *(double *)((long)local_afe0 + lVar130 + 0x10);
      *(double *)((long)local_afe0 + lVar130 + 0x18) =
           dVar190 * *(double *)((long)local_afe0 + lVar130 + 0x18);
      dVar185 = pdVar129[5];
      dVar189 = pdVar129[6];
      dVar190 = pdVar129[7];
      *(double *)((long)local_afe0 + lVar130 + 0x20) =
           pdVar129[4] * *(double *)((long)local_afe0 + lVar130 + 0x20);
      *(double *)((long)local_afe0 + lVar130 + 0x28) =
           dVar185 * *(double *)((long)local_afe0 + lVar130 + 0x28);
      *(double *)((long)local_afe0 + lVar130 + 0x30) =
           dVar189 * *(double *)((long)local_afe0 + lVar130 + 0x30);
      *(double *)((long)local_afe0 + lVar130 + 0x38) =
           dVar190 * *(double *)((long)local_afe0 + lVar130 + 0x38);
      dVar185 = pdVar129[9];
      dVar189 = pdVar129[10];
      dVar190 = pdVar129[0xb];
      *(double *)((long)local_afe0 + lVar130 + 0x40) =
           pdVar129[8] * *(double *)((long)local_afe0 + lVar130 + 0x40);
      *(double *)((long)local_afe0 + lVar130 + 0x48) =
           dVar185 * *(double *)((long)local_afe0 + lVar130 + 0x48);
      *(double *)((long)local_afe0 + lVar130 + 0x50) =
           dVar189 * *(double *)((long)local_afe0 + lVar130 + 0x50);
      *(double *)((long)local_afe0 + lVar130 + 0x58) =
           dVar190 * *(double *)((long)local_afe0 + lVar130 + 0x58);
      dVar185 = pdVar129[1];
      dVar189 = pdVar129[2];
      dVar190 = pdVar129[3];
      *(double *)((long)local_afe0 + lVar130 + 0x60) =
           *pdVar129 * *(double *)((long)local_afe0 + lVar130 + 0x60);
      *(double *)((long)local_afe0 + lVar130 + 0x68) =
           dVar185 * *(double *)((long)local_afe0 + lVar130 + 0x68);
      *(double *)((long)local_afe0 + lVar130 + 0x70) =
           dVar189 * *(double *)((long)local_afe0 + lVar130 + 0x70);
      *(double *)((long)local_afe0 + lVar130 + 0x78) =
           dVar190 * *(double *)((long)local_afe0 + lVar130 + 0x78);
      dVar185 = pdVar129[5];
      dVar189 = pdVar129[6];
      dVar190 = pdVar129[7];
      *(double *)((long)local_afe0 + lVar130 + 0x80) =
           pdVar129[4] * *(double *)((long)local_afe0 + lVar130 + 0x80);
      *(double *)((long)local_afe0 + lVar130 + 0x88) =
           dVar185 * *(double *)((long)local_afe0 + lVar130 + 0x88);
      *(double *)((long)local_afe0 + lVar130 + 0x90) =
           dVar189 * *(double *)((long)local_afe0 + lVar130 + 0x90);
      *(double *)((long)local_afe0 + lVar130 + 0x98) =
           dVar190 * *(double *)((long)local_afe0 + lVar130 + 0x98);
      dVar185 = pdVar129[9];
      dVar189 = pdVar129[10];
      dVar190 = pdVar129[0xb];
      *(double *)((long)local_afe0 + lVar130 + 0xa0) =
           pdVar129[8] * *(double *)((long)local_afe0 + lVar130 + 0xa0);
      *(double *)((long)local_afe0 + lVar130 + 0xa8) =
           dVar185 * *(double *)((long)local_afe0 + lVar130 + 0xa8);
      *(double *)((long)local_afe0 + lVar130 + 0xb0) =
           dVar189 * *(double *)((long)local_afe0 + lVar130 + 0xb0);
      *(double *)((long)local_afe0 + lVar130 + 0xb8) =
           dVar190 * *(double *)((long)local_afe0 + lVar130 + 0xb8);
      dVar185 = pdVar129[1];
      dVar189 = pdVar129[2];
      dVar190 = pdVar129[3];
      *(double *)((long)local_afe0 + lVar130 + 0xc0) =
           *pdVar129 * *(double *)((long)local_afe0 + lVar130 + 0xc0);
      *(double *)((long)local_afe0 + lVar130 + 200) =
           dVar185 * *(double *)((long)local_afe0 + lVar130 + 200);
      *(double *)((long)local_afe0 + lVar130 + 0xd0) =
           dVar189 * *(double *)((long)local_afe0 + lVar130 + 0xd0);
      *(double *)((long)local_afe0 + lVar130 + 0xd8) =
           dVar190 * *(double *)((long)local_afe0 + lVar130 + 0xd8);
      dVar185 = pdVar129[5];
      dVar189 = pdVar129[6];
      dVar190 = pdVar129[7];
      *(double *)((long)local_afe0 + lVar130 + 0xe0) =
           pdVar129[4] * *(double *)((long)local_afe0 + lVar130 + 0xe0);
      *(double *)((long)local_afe0 + lVar130 + 0xe8) =
           dVar185 * *(double *)((long)local_afe0 + lVar130 + 0xe8);
      *(double *)((long)local_afe0 + lVar130 + 0xf0) =
           dVar189 * *(double *)((long)local_afe0 + lVar130 + 0xf0);
      *(double *)((long)local_afe0 + lVar130 + 0xf8) =
           dVar190 * *(double *)((long)local_afe0 + lVar130 + 0xf8);
      dVar185 = pdVar129[9];
      dVar189 = pdVar129[10];
      dVar190 = pdVar129[0xb];
      *(double *)((long)local_afe0 + lVar130 + 0x100) =
           pdVar129[8] * *(double *)((long)local_afe0 + lVar130 + 0x100);
      *(double *)((long)local_afe0 + lVar130 + 0x108) =
           dVar185 * *(double *)((long)local_afe0 + lVar130 + 0x108);
      *(double *)((long)local_afe0 + lVar130 + 0x110) =
           dVar189 * *(double *)((long)local_afe0 + lVar130 + 0x110);
      *(double *)((long)local_afe0 + lVar130 + 0x118) =
           dVar190 * *(double *)((long)local_afe0 + lVar130 + 0x118);
      if (lVar133 != 1 || lVar132 != 3) {
        pcVar127 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double, 45, 3, 0>, 3, 1>>, SrcXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, -1, -1>>, Functor = Eigen::internal::mul_assign_op<double>]"
        ;
        goto LAB_00721a9f;
      }
      dVar185 = pdVar123[1];
      *(double *)((long)local_afe0 + lVar130 + 0x120) =
           *pdVar123 * *(double *)((long)local_afe0 + lVar130 + 0x120);
      *(double *)((long)local_afe0 + lVar130 + 0x128) =
           dVar185 * *(double *)((long)local_afe0 + lVar130 + 0x128);
      *(double *)((long)local_afe0 + lVar130 + 0x130) =
           pdVar123[2] * *(double *)((long)local_afe0 + lVar130 + 0x130);
      dVar185 = pdVar123[1];
      *(double *)((long)local_afe0 + lVar130 + 0x138) =
           *pdVar123 * *(double *)((long)local_afe0 + lVar130 + 0x138);
      *(double *)((long)local_afe0 + lVar130 + 0x140) =
           dVar185 * *(double *)((long)local_afe0 + lVar130 + 0x140);
      *(double *)((long)local_afe0 + lVar130 + 0x148) =
           pdVar123[2] * *(double *)((long)local_afe0 + lVar130 + 0x148);
      dVar185 = pdVar123[1];
      *(double *)((long)local_afe0 + lVar130 + 0x150) =
           *pdVar123 * *(double *)((long)local_afe0 + lVar130 + 0x150);
      *(double *)((long)local_afe0 + lVar130 + 0x158) =
           dVar185 * *(double *)((long)local_afe0 + lVar130 + 0x158);
      *(double *)((long)local_ae80 + lVar130) =
           pdVar123[2] * *(double *)((long)local_ae80 + lVar130);
      lVar130 = lVar130 + 0x168;
    } while (lVar130 != 0x598);
    peVar35 = (local_bb78->m_material).
              super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    p_Var36 = (local_bb78->m_material).
              super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (p_Var36 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var36->_M_use_count = p_Var36->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var36->_M_use_count = p_Var36->_M_use_count + 1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var36);
    }
    pdVar129 = local_44b0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage
               .m_data.array + 0xe6;
    lVar132 = 0;
    do {
      if (((local_bb78->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
           m_storage.m_rows <= lVar132) ||
         (uVar122 = (local_bb78->m_SD).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                    m_cols, (long)uVar122 < 0xc)) goto LAB_00721a51;
      local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.
      array[0] = (peVar35->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                 m_storage.m_data.array[0];
      pdVar123 = (local_bb78->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                 .m_storage.m_data;
      lVar133 = uVar122 * lVar132;
      paVar2 = (assign_op<double,_double> *)(pdVar123 + lVar133);
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 8);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 0x10);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 0x18);
      ((plain_array<double,_2187,_1,_0> *)(pdVar129 + -0xe6))->array[0] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * local_ae80[0] * (double)*(Matrix<double,_27,_81,_1,_27,_81> **)paVar2;
      pdVar129[-0xe5] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * local_ae80[1] * (double)pMVar43;
      pdVar129[-0xe4] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * local_ae80[2] * (double)pMVar44;
      pdVar129[-0xe3] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * local_ae80[3] * (double)pMVar45;
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 0x28);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 0x30);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 0x38);
      pdVar129[-0xe2] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] *
           local_ae60 * (double)*(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 0x20);
      pdVar129[-0xe1] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * dStack_ae58 * (double)pMVar43;
      pdVar129[-0xe0] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * dStack_ae50 * (double)pMVar44;
      pdVar129[-0xdf] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * dStack_ae48 * (double)pMVar45;
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 0x48);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 0x50);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 0x58);
      pdVar129[-0xde] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] *
           local_ae40 * (double)*(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 0x40);
      pdVar129[-0xdd] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * dStack_ae38 * (double)pMVar43;
      pdVar129[-0xdc] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * dStack_ae30 * (double)pMVar44;
      pdVar129[-0xdb] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * dStack_ae28 * (double)pMVar45;
      local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.
      array[3] = (double)paVar2;
      if (uVar122 < 0x18) goto LAB_00721a51;
      local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.
      array[0] = *(double *)
                  ((long)(peVar35->m_D0).
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array + 8);
      local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.
      array[3] = (double)(pdVar123 + lVar133 + 0xc);
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 8);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x10);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x18);
      pdVar129[-0xda] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] *
           local_ae20 *
           (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                    local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                    m_storage.m_data.array[3];
      pdVar129[-0xd9] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * dStack_ae18 * (double)pMVar43;
      pdVar129[-0xd8] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * dStack_ae10 * (double)pMVar44;
      pdVar129[-0xd7] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * dStack_ae08 * (double)pMVar45;
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x28);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x30);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x38);
      pdVar129[-0xd6] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] *
           local_ae00 *
           (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                    ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>
                           .m_storage.m_data.array[3] + 0x20);
      pdVar129[-0xd5] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * dStack_adf8 * (double)pMVar43;
      pdVar129[-0xd4] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * dStack_adf0 * (double)pMVar44;
      pdVar129[-0xd3] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * dStack_ade8 * (double)pMVar45;
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x48);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x50);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x58);
      pdVar129[-0xd2] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] *
           local_ade0 *
           (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                    ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>
                           .m_storage.m_data.array[3] + 0x40);
      pdVar129[-0xd1] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * dStack_add8 * (double)pMVar43;
      pdVar129[-0xd0] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * dStack_add0 * (double)pMVar44;
      pdVar129[-0xcf] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * dStack_adc8 * (double)pMVar45;
      if (uVar122 < 0x24) goto LAB_00721a51;
      dVar185 = *(double *)
                 ((long)(peVar35->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                        .m_storage.m_data.array + 0x10);
      pdVar131 = pdVar123 + lVar133 + 0x18;
      dVar189 = pdVar131[1];
      dVar190 = pdVar131[2];
      dVar191 = pdVar131[3];
      pdVar129[-0xce] = local_adc0 * *pdVar131 * dVar185;
      pdVar129[-0xcd] = dStack_adb8 * dVar189 * dVar185;
      pdVar129[-0xcc] = dStack_adb0 * dVar190 * dVar185;
      pdVar129[-0xcb] = dStack_ada8 * dVar191 * dVar185;
      pdVar131 = pdVar123 + lVar133 + 0x1c;
      dVar189 = pdVar131[1];
      dVar190 = pdVar131[2];
      dVar191 = pdVar131[3];
      pdVar129[-0xca] = local_ada0 * *pdVar131 * dVar185;
      pdVar129[-0xc9] = dStack_ad98 * dVar189 * dVar185;
      pdVar129[-200] = dStack_ad90 * dVar190 * dVar185;
      pdVar129[-199] = dStack_ad88 * dVar191 * dVar185;
      pdVar131 = pdVar123 + lVar133 + 0x20;
      dVar189 = pdVar131[1];
      dVar190 = pdVar131[2];
      dVar191 = pdVar131[3];
      pdVar129[-0xc6] = local_ad80 * *pdVar131 * dVar185;
      pdVar129[-0xc5] = dStack_ad78 * dVar189 * dVar185;
      pdVar129[-0xc4] = dStack_ad70 * dVar190 * dVar185;
      pdVar129[-0xc3] = dStack_ad68 * dVar191 * dVar185;
      dVar185 = *(double *)
                 ((long)(peVar35->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                        .m_storage.m_data.array + 0x18);
      pdVar124 = pdVar123 + lVar133 + 0x18;
      dVar189 = pdVar124[1];
      dVar190 = pdVar124[2];
      dVar191 = pdVar124[3];
      pdVar131 = pdVar123 + lVar133 + 0xc;
      dVar198 = pdVar131[1];
      dVar202 = pdVar131[2];
      dVar203 = pdVar131[3];
      pdVar129[-0xc2] = (local_ae20 * *pdVar124 + local_adc0 * *pdVar131) * dVar185;
      pdVar129[-0xc1] = (dStack_ae18 * dVar189 + dStack_adb8 * dVar198) * dVar185;
      pdVar129[-0xc0] = (dStack_ae10 * dVar190 + dStack_adb0 * dVar202) * dVar185;
      pdVar129[-0xbf] = (dStack_ae08 * dVar191 + dStack_ada8 * dVar203) * dVar185;
      pdVar131 = pdVar123 + lVar133 + 0x1c;
      dVar189 = pdVar131[1];
      dVar190 = pdVar131[2];
      dVar191 = pdVar131[3];
      pdVar124 = pdVar123 + lVar133 + 0x10;
      dVar198 = pdVar124[1];
      dVar202 = pdVar124[2];
      dVar203 = pdVar124[3];
      pdVar129[-0xbe] = (local_ae00 * *pdVar131 + local_ada0 * *pdVar124) * dVar185;
      pdVar129[-0xbd] = (dStack_adf8 * dVar189 + dStack_ad98 * dVar198) * dVar185;
      pdVar129[-0xbc] = (dStack_adf0 * dVar190 + dStack_ad90 * dVar202) * dVar185;
      pdVar129[-0xbb] = (dStack_ade8 * dVar191 + dStack_ad88 * dVar203) * dVar185;
      pdVar131 = pdVar123 + lVar133 + 0x20;
      dVar189 = pdVar131[1];
      dVar190 = pdVar131[2];
      dVar191 = pdVar131[3];
      pdVar124 = pdVar123 + lVar133 + 0x14;
      dVar198 = pdVar124[1];
      dVar202 = pdVar124[2];
      dVar203 = pdVar124[3];
      pdVar129[-0xba] = (local_ade0 * *pdVar131 + local_ad80 * *pdVar124) * dVar185;
      pdVar129[-0xb9] = (dStack_add8 * dVar189 + dStack_ad78 * dVar198) * dVar185;
      pdVar129[-0xb8] = (dStack_add0 * dVar190 + dStack_ad70 * dVar202) * dVar185;
      pdVar129[-0xb7] = (dStack_adc8 * dVar191 + dStack_ad68 * dVar203) * dVar185;
      dVar185 = *(double *)
                 ((long)(peVar35->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                        .m_storage.m_data.array + 0x20);
      pdVar124 = pdVar123 + lVar133 + 0x18;
      dVar189 = pdVar124[1];
      dVar190 = pdVar124[2];
      dVar191 = pdVar124[3];
      pdVar131 = pdVar123 + lVar133;
      dVar198 = pdVar131[1];
      dVar202 = pdVar131[2];
      dVar203 = pdVar131[3];
      pdVar129[-0xb6] = dVar185 * (local_ae80[0] * *pdVar124 + local_adc0 * *pdVar131);
      pdVar129[-0xb5] = dVar185 * (local_ae80[1] * dVar189 + dStack_adb8 * dVar198);
      pdVar129[-0xb4] = dVar185 * (local_ae80[2] * dVar190 + dStack_adb0 * dVar202);
      pdVar129[-0xb3] = dVar185 * (local_ae80[3] * dVar191 + dStack_ada8 * dVar203);
      pdVar124 = pdVar123 + lVar133 + 0x1c;
      dVar189 = pdVar124[1];
      dVar190 = pdVar124[2];
      dVar191 = pdVar124[3];
      pdVar131 = pdVar123 + lVar133 + 4;
      dVar198 = pdVar131[1];
      dVar202 = pdVar131[2];
      dVar203 = pdVar131[3];
      pdVar129[-0xb2] = dVar185 * (local_ada0 * *pdVar131 + local_ae60 * *pdVar124);
      pdVar129[-0xb1] = dVar185 * (dStack_ad98 * dVar198 + dStack_ae58 * dVar189);
      pdVar129[-0xb0] = dVar185 * (dStack_ad90 * dVar202 + dStack_ae50 * dVar190);
      pdVar129[-0xaf] = dVar185 * (dStack_ad88 * dVar203 + dStack_ae48 * dVar191);
      pdVar124 = pdVar123 + lVar133 + 0x20;
      dVar189 = pdVar124[1];
      dVar190 = pdVar124[2];
      dVar191 = pdVar124[3];
      pdVar131 = pdVar123 + lVar133 + 8;
      dVar198 = pdVar131[1];
      dVar202 = pdVar131[2];
      dVar203 = pdVar131[3];
      pdVar129[-0xae] = dVar185 * (local_ad80 * *pdVar131 + local_ae40 * *pdVar124);
      pdVar129[-0xad] = dVar185 * (dStack_ad78 * dVar198 + dStack_ae38 * dVar189);
      pdVar129[-0xac] = dVar185 * (dStack_ad70 * dVar202 + dStack_ae30 * dVar190);
      pdVar129[-0xab] = dVar185 * (dStack_ad68 * dVar203 + dStack_ae28 * dVar191);
      dVar185 = *(double *)
                 ((long)(peVar35->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                        .m_storage.m_data.array + 0x28);
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 8);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x10);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x18);
      pdVar131 = pdVar123 + lVar133;
      dVar189 = pdVar131[1];
      dVar190 = pdVar131[2];
      dVar191 = pdVar131[3];
      pdVar129[-0xaa] =
           dVar185 * (local_ae80[0] *
                      (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                               local_a1a0.
                               super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                               m_storage.m_data.array[3] + local_ae20 * *pdVar131);
      pdVar129[-0xa9] = dVar185 * (local_ae80[1] * (double)pMVar43 + dStack_ae18 * dVar189);
      pdVar129[-0xa8] = dVar185 * (local_ae80[2] * (double)pMVar44 + dStack_ae10 * dVar190);
      pdVar129[-0xa7] = dVar185 * (local_ae80[3] * (double)pMVar45 + dStack_ae08 * dVar191);
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x28);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x30);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x38);
      pdVar131 = pdVar123 + lVar133 + 4;
      dVar189 = pdVar131[1];
      dVar190 = pdVar131[2];
      dVar191 = pdVar131[3];
      pdVar129[-0xa6] =
           dVar185 * (local_ae60 *
                      (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                               ((long)local_a1a0.
                                      super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>
                                      .m_storage.m_data.array[3] + 0x20) + local_ae00 * *pdVar131);
      pdVar129[-0xa5] = dVar185 * (dStack_ae58 * (double)pMVar43 + dStack_adf8 * dVar189);
      pdVar129[-0xa4] = dVar185 * (dStack_ae50 * (double)pMVar44 + dStack_adf0 * dVar190);
      pdVar129[-0xa3] = dVar185 * (dStack_ae48 * (double)pMVar45 + dStack_ade8 * dVar191);
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x48);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x50);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x58);
      pdVar131 = pdVar123 + lVar133 + 8;
      dVar189 = pdVar131[1];
      dVar190 = pdVar131[2];
      dVar191 = pdVar131[3];
      pdVar129[-0xa2] =
           dVar185 * (local_ae40 *
                      (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                               ((long)local_a1a0.
                                      super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>
                                      .m_storage.m_data.array[3] + 0x40) + local_ade0 * *pdVar131);
      pdVar129[-0xa1] = dVar185 * (dStack_ae38 * (double)pMVar43 + dStack_add8 * dVar189);
      pdVar129[-0xa0] = dVar185 * (dStack_ae30 * (double)pMVar44 + dStack_add0 * dVar190);
      pdVar129[-0x9f] = dVar185 * (dStack_ae28 * (double)pMVar45 + dStack_adc8 * dVar191);
      dVar185 = (peVar35->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                m_storage.m_data.array[0];
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 8);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 0x10);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 0x18);
      pdVar129[-0x95] = dVar185 * local_ad18 * (double)*(Matrix<double,_27,_81,_1,_27,_81> **)paVar2
      ;
      pdVar129[-0x94] = dVar185 * dStack_ad10 * (double)pMVar43;
      pdVar129[-0x93] = dVar185 * dStack_ad08 * (double)pMVar44;
      pdVar129[-0x92] = dVar185 * dStack_ad00 * (double)pMVar45;
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 0x28);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 0x30);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 0x38);
      pdVar129[-0x91] =
           dVar185 * local_acf8 * (double)*(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 0x20);
      pdVar129[-0x90] = dVar185 * dStack_acf0 * (double)pMVar43;
      pdVar129[-0x8f] = dVar185 * dStack_ace8 * (double)pMVar44;
      pdVar129[-0x8e] = dVar185 * dStack_ace0 * (double)pMVar45;
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 0x48);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 0x50);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 0x58);
      pdVar129[-0x8d] =
           dVar185 * local_acd8 * (double)*(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 0x40);
      pdVar129[-0x8c] = dVar185 * dStack_acd0 * (double)pMVar43;
      pdVar129[-0x8b] = dVar185 * dStack_acc8 * (double)pMVar44;
      pdVar129[-0x8a] = dVar185 * dStack_acc0 * (double)pMVar45;
      dVar185 = *(double *)
                 ((long)(peVar35->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                        .m_storage.m_data.array + 8);
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 8);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x10);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x18);
      pdVar129[-0x89] =
           dVar185 * local_acb8 *
                     (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                              local_a1a0.
                              super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                              m_storage.m_data.array[3];
      pdVar129[-0x88] = dVar185 * dStack_acb0 * (double)pMVar43;
      pdVar129[-0x87] = dVar185 * dStack_aca8 * (double)pMVar44;
      pdVar129[-0x86] = dVar185 * dStack_aca0 * (double)pMVar45;
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x28);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x30);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x38);
      pdVar129[-0x85] =
           dVar185 * local_ac98 *
                     (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                              ((long)local_a1a0.
                                     super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                                     m_storage.m_data.array[3] + 0x20);
      pdVar129[-0x84] = dVar185 * dStack_ac90 * (double)pMVar43;
      pdVar129[-0x83] = dVar185 * dStack_ac88 * (double)pMVar44;
      pdVar129[-0x82] = dVar185 * dStack_ac80 * (double)pMVar45;
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x48);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x50);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x58);
      pdVar129[-0x81] =
           dVar185 * local_ac78 *
                     (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                              ((long)local_a1a0.
                                     super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                                     m_storage.m_data.array[3] + 0x40);
      pdVar129[-0x80] = dVar185 * dStack_ac70 * (double)pMVar43;
      pdVar129[-0x7f] = dVar185 * dStack_ac68 * (double)pMVar44;
      pdVar129[-0x7e] = dVar185 * dStack_ac60 * (double)pMVar45;
      dVar185 = *(double *)
                 ((long)(peVar35->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                        .m_storage.m_data.array + 0x10);
      pdVar131 = pdVar123 + lVar133 + 0x18;
      dVar189 = pdVar131[1];
      dVar190 = pdVar131[2];
      dVar191 = pdVar131[3];
      pdVar129[-0x7d] = local_ac58 * *pdVar131 * dVar185;
      pdVar129[-0x7c] = dStack_ac50 * dVar189 * dVar185;
      pdVar129[-0x7b] = dStack_ac48 * dVar190 * dVar185;
      pdVar129[-0x7a] = dStack_ac40 * dVar191 * dVar185;
      pdVar131 = pdVar123 + lVar133 + 0x1c;
      dVar189 = pdVar131[1];
      dVar190 = pdVar131[2];
      dVar191 = pdVar131[3];
      pdVar129[-0x79] = local_ac38 * *pdVar131 * dVar185;
      pdVar129[-0x78] = dStack_ac30 * dVar189 * dVar185;
      pdVar129[-0x77] = dStack_ac28 * dVar190 * dVar185;
      pdVar129[-0x76] = dStack_ac20 * dVar191 * dVar185;
      pdVar131 = pdVar123 + lVar133 + 0x20;
      dVar189 = pdVar131[1];
      dVar190 = pdVar131[2];
      dVar191 = pdVar131[3];
      pdVar129[-0x75] = local_ac18 * *pdVar131 * dVar185;
      pdVar129[-0x74] = dStack_ac10 * dVar189 * dVar185;
      pdVar129[-0x73] = dStack_ac08 * dVar190 * dVar185;
      pdVar129[-0x72] = dStack_ac00 * dVar191 * dVar185;
      dVar185 = *(double *)
                 ((long)(peVar35->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                        .m_storage.m_data.array + 0x18);
      pdVar124 = pdVar123 + lVar133 + 0x18;
      dVar189 = pdVar124[1];
      dVar190 = pdVar124[2];
      dVar191 = pdVar124[3];
      pdVar131 = pdVar123 + lVar133 + 0xc;
      dVar198 = pdVar131[1];
      dVar202 = pdVar131[2];
      dVar203 = pdVar131[3];
      pdVar129[-0x71] = (local_acb8 * *pdVar124 + local_ac58 * *pdVar131) * dVar185;
      pdVar129[-0x70] = (dStack_acb0 * dVar189 + dStack_ac50 * dVar198) * dVar185;
      pdVar129[-0x6f] = (dStack_aca8 * dVar190 + dStack_ac48 * dVar202) * dVar185;
      pdVar129[-0x6e] = (dStack_aca0 * dVar191 + dStack_ac40 * dVar203) * dVar185;
      pdVar131 = pdVar123 + lVar133 + 0x1c;
      dVar189 = pdVar131[1];
      dVar190 = pdVar131[2];
      dVar191 = pdVar131[3];
      pdVar124 = pdVar123 + lVar133 + 0x10;
      dVar198 = pdVar124[1];
      dVar202 = pdVar124[2];
      dVar203 = pdVar124[3];
      pdVar129[-0x6d] = (local_ac98 * *pdVar131 + local_ac38 * *pdVar124) * dVar185;
      pdVar129[-0x6c] = (dStack_ac90 * dVar189 + dStack_ac30 * dVar198) * dVar185;
      pdVar129[-0x6b] = (dStack_ac88 * dVar190 + dStack_ac28 * dVar202) * dVar185;
      pdVar129[-0x6a] = (dStack_ac80 * dVar191 + dStack_ac20 * dVar203) * dVar185;
      pdVar131 = pdVar123 + lVar133 + 0x20;
      dVar189 = pdVar131[1];
      dVar190 = pdVar131[2];
      dVar191 = pdVar131[3];
      pdVar124 = pdVar123 + lVar133 + 0x14;
      dVar198 = pdVar124[1];
      dVar202 = pdVar124[2];
      dVar203 = pdVar124[3];
      pdVar129[-0x69] = (local_ac78 * *pdVar131 + local_ac18 * *pdVar124) * dVar185;
      pdVar129[-0x68] = (dStack_ac70 * dVar189 + dStack_ac10 * dVar198) * dVar185;
      pdVar129[-0x67] = (dStack_ac68 * dVar190 + dStack_ac08 * dVar202) * dVar185;
      pdVar129[-0x66] = (dStack_ac60 * dVar191 + dStack_ac00 * dVar203) * dVar185;
      dVar185 = *(double *)
                 ((long)(peVar35->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                        .m_storage.m_data.array + 0x20);
      pdVar124 = pdVar123 + lVar133 + 0x18;
      dVar189 = pdVar124[1];
      dVar190 = pdVar124[2];
      dVar191 = pdVar124[3];
      pdVar131 = pdVar123 + lVar133;
      dVar198 = pdVar131[1];
      dVar202 = pdVar131[2];
      dVar203 = pdVar131[3];
      pdVar129[-0x65] = dVar185 * (local_ad18 * *pdVar124 + local_ac58 * *pdVar131);
      pdVar129[-100] = dVar185 * (dStack_ad10 * dVar189 + dStack_ac50 * dVar198);
      pdVar129[-99] = dVar185 * (dStack_ad08 * dVar190 + dStack_ac48 * dVar202);
      pdVar129[-0x62] = dVar185 * (dStack_ad00 * dVar191 + dStack_ac40 * dVar203);
      pdVar124 = pdVar123 + lVar133 + 0x1c;
      dVar189 = pdVar124[1];
      dVar190 = pdVar124[2];
      dVar191 = pdVar124[3];
      pdVar131 = pdVar123 + lVar133 + 4;
      dVar198 = pdVar131[1];
      dVar202 = pdVar131[2];
      dVar203 = pdVar131[3];
      pdVar129[-0x61] = dVar185 * (local_ac38 * *pdVar131 + local_acf8 * *pdVar124);
      pdVar129[-0x60] = dVar185 * (dStack_ac30 * dVar198 + dStack_acf0 * dVar189);
      pdVar129[-0x5f] = dVar185 * (dStack_ac28 * dVar202 + dStack_ace8 * dVar190);
      pdVar129[-0x5e] = dVar185 * (dStack_ac20 * dVar203 + dStack_ace0 * dVar191);
      pdVar124 = pdVar123 + lVar133 + 0x20;
      dVar189 = pdVar124[1];
      dVar190 = pdVar124[2];
      dVar191 = pdVar124[3];
      pdVar131 = pdVar123 + lVar133 + 8;
      dVar198 = pdVar131[1];
      dVar202 = pdVar131[2];
      dVar203 = pdVar131[3];
      pdVar129[-0x5d] = dVar185 * (local_ac18 * *pdVar131 + local_acd8 * *pdVar124);
      pdVar129[-0x5c] = dVar185 * (dStack_ac10 * dVar198 + dStack_acd0 * dVar189);
      pdVar129[-0x5b] = dVar185 * (dStack_ac08 * dVar202 + dStack_acc8 * dVar190);
      pdVar129[-0x5a] = dVar185 * (dStack_ac00 * dVar203 + dStack_acc0 * dVar191);
      dVar185 = *(double *)
                 ((long)(peVar35->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                        .m_storage.m_data.array + 0x28);
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 8);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x10);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x18);
      pdVar131 = pdVar123 + lVar133;
      dVar189 = pdVar131[1];
      dVar190 = pdVar131[2];
      dVar191 = pdVar131[3];
      pdVar129[-0x59] =
           dVar185 * (local_ad18 *
                      (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                               local_a1a0.
                               super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                               m_storage.m_data.array[3] + local_acb8 * *pdVar131);
      pdVar129[-0x58] = dVar185 * (dStack_ad10 * (double)pMVar43 + dStack_acb0 * dVar189);
      pdVar129[-0x57] = dVar185 * (dStack_ad08 * (double)pMVar44 + dStack_aca8 * dVar190);
      pdVar129[-0x56] = dVar185 * (dStack_ad00 * (double)pMVar45 + dStack_aca0 * dVar191);
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x28);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x30);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x38);
      pdVar131 = pdVar123 + lVar133 + 4;
      dVar189 = pdVar131[1];
      dVar190 = pdVar131[2];
      dVar191 = pdVar131[3];
      pdVar129[-0x55] =
           dVar185 * (local_acf8 *
                      (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                               ((long)local_a1a0.
                                      super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>
                                      .m_storage.m_data.array[3] + 0x20) + local_ac98 * *pdVar131);
      pdVar129[-0x54] = dVar185 * (dStack_acf0 * (double)pMVar43 + dStack_ac90 * dVar189);
      pdVar129[-0x53] = dVar185 * (dStack_ace8 * (double)pMVar44 + dStack_ac88 * dVar190);
      pdVar129[-0x52] = dVar185 * (dStack_ace0 * (double)pMVar45 + dStack_ac80 * dVar191);
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x48);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x50);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x58);
      pdVar123 = pdVar123 + lVar133 + 8;
      dVar189 = pdVar123[1];
      dVar190 = pdVar123[2];
      dVar191 = pdVar123[3];
      pdVar129[-0x51] =
           dVar185 * (local_acd8 *
                      (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                               ((long)local_a1a0.
                                      super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>
                                      .m_storage.m_data.array[3] + 0x40) + local_ac78 * *pdVar123);
      pdVar129[-0x50] = dVar185 * (dStack_acd0 * (double)pMVar43 + dStack_ac70 * dVar189);
      pdVar129[-0x4f] = dVar185 * (dStack_acc8 * (double)pMVar44 + dStack_ac68 * dVar190);
      pdVar129[-0x4e] = dVar185 * (dStack_acc0 * (double)pMVar45 + dStack_ac60 * dVar191);
      dVar185 = (peVar35->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                m_storage.m_data.array[0];
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 8);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 0x10);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 0x18);
      pdVar129[-0x44] = dVar185 * local_abb0 * (double)*(Matrix<double,_27,_81,_1,_27,_81> **)paVar2
      ;
      pdVar129[-0x43] = dVar185 * dStack_aba8 * (double)pMVar43;
      pdVar129[-0x42] = dVar185 * dStack_aba0 * (double)pMVar44;
      pdVar129[-0x41] = dVar185 * dStack_ab98 * (double)pMVar45;
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 0x28);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 0x30);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 0x38);
      pdVar129[-0x40] =
           dVar185 * local_ab90 * (double)*(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 0x20);
      pdVar129[-0x3f] = dVar185 * dStack_ab88 * (double)pMVar43;
      pdVar129[-0x3e] = dVar185 * dStack_ab80 * (double)pMVar44;
      pdVar129[-0x3d] = dVar185 * dStack_ab78 * (double)pMVar45;
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 0x48);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 0x50);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 0x58);
      pdVar129[-0x3c] =
           dVar185 * local_ab70 * (double)*(Matrix<double,_27,_81,_1,_27,_81> **)(paVar2 + 0x40);
      pdVar129[-0x3b] = dVar185 * dStack_ab68 * (double)pMVar43;
      pdVar129[-0x3a] = dVar185 * dStack_ab60 * (double)pMVar44;
      pdVar129[-0x39] = dVar185 * dStack_ab58 * (double)pMVar45;
      local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.
      array[0] = *(double *)
                  ((long)(peVar35->m_D0).
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array + 8);
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 8);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x10);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x18);
      pdVar129[-0x38] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] *
           local_ab50 *
           (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                    local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                    m_storage.m_data.array[3];
      pdVar129[-0x37] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * dStack_ab48 * (double)pMVar43;
      pdVar129[-0x36] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * dStack_ab40 * (double)pMVar44;
      pdVar129[-0x35] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * dStack_ab38 * (double)pMVar45;
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x28);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x30);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x38);
      pdVar129[-0x34] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] *
           local_ab30 *
           (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                    ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>
                           .m_storage.m_data.array[3] + 0x20);
      pdVar129[-0x33] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * dStack_ab28 * (double)pMVar43;
      pdVar129[-0x32] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * dStack_ab20 * (double)pMVar44;
      pdVar129[-0x31] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * dStack_ab18 * (double)pMVar45;
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x48);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x50);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x58);
      pdVar129[-0x30] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] *
           local_ab10 *
           (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                    ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>
                           .m_storage.m_data.array[3] + 0x40);
      pdVar129[-0x2f] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * dStack_ab08 * (double)pMVar43;
      pdVar129[-0x2e] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * dStack_ab00 * (double)pMVar44;
      pdVar129[-0x2d] =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * dStack_aaf8 * (double)pMVar45;
      local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.
      array[2] = local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage
                 .m_data.array[3];
      if (((local_bb78->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
           m_storage.m_rows <= lVar132) ||
         (lVar133 = (local_bb78->m_SD).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                    m_cols, lVar133 < 0x24)) goto LAB_00721a51;
      dVar185 = *(double *)
                 ((long)(peVar35->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                        .m_storage.m_data.array + 0x10);
      lVar133 = lVar133 * lVar132;
      lVar132 = lVar132 + 1;
      pdVar123 = (local_bb08->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                 m_storage.m_data;
      local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.
      array[3] = (double)(pdVar123 + lVar133 + 0x18);
      local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.
      array[2] = (double)(pdVar123 + lVar133 + 0xc);
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 8);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x10);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x18);
      pdVar129[-0x2c] =
           local_aaf0 *
           (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                    local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                    m_storage.m_data.array[3] * dVar185;
      pdVar129[-0x2b] = dStack_aae8 * (double)pMVar43 * dVar185;
      pdVar129[-0x2a] = dStack_aae0 * (double)pMVar44 * dVar185;
      pdVar129[-0x29] = dStack_aad8 * (double)pMVar45 * dVar185;
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x28);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x30);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x38);
      pdVar129[-0x28] =
           local_aad0 *
           (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                    ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>
                           .m_storage.m_data.array[3] + 0x20) * dVar185;
      pdVar129[-0x27] = dStack_aac8 * (double)pMVar43 * dVar185;
      pdVar129[-0x26] = dStack_aac0 * (double)pMVar44 * dVar185;
      pdVar129[-0x25] = dStack_aab8 * (double)pMVar45 * dVar185;
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x48);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x50);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x58);
      pdVar129[-0x24] =
           local_aab0 *
           (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                    ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>
                           .m_storage.m_data.array[3] + 0x40) * dVar185;
      pdVar129[-0x23] = dStack_aaa8 * (double)pMVar43 * dVar185;
      pdVar129[-0x22] = dStack_aaa0 * (double)pMVar44 * dVar185;
      pdVar129[-0x21] = dStack_aa98 * (double)pMVar45 * dVar185;
      dVar185 = *(double *)
                 ((long)(peVar35->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                        .m_storage.m_data.array + 0x18);
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + 0x68);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + 0x70);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + 0x78);
      pMVar46 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + 8);
      pMVar47 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + 0x10);
      pMVar48 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + 0x18);
      pdVar129[-0x20] =
           (local_ab50 *
            (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                     ((long)local_a1a0.
                            super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage
                            .m_data.array[2] + 0x60) +
           local_aaf0 *
           (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                    local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                    m_storage.m_data.array[2]) * dVar185;
      pdVar129[-0x1f] = (dStack_ab48 * (double)pMVar43 + dStack_aae8 * (double)pMVar46) * dVar185;
      pdVar129[-0x1e] = (dStack_ab40 * (double)pMVar44 + dStack_aae0 * (double)pMVar47) * dVar185;
      pdVar129[-0x1d] = (dStack_ab38 * (double)pMVar45 + dStack_aad8 * (double)pMVar48) * dVar185;
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x28);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x30);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x38);
      pMVar46 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + 0x28);
      pMVar47 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + 0x30);
      pMVar48 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + 0x38);
      pdVar129[-0x1c] =
           (local_ab30 *
            (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                     ((long)local_a1a0.
                            super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage
                            .m_data.array[3] + 0x20) +
           local_aad0 *
           (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                    ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>
                           .m_storage.m_data.array[2] + 0x20)) * dVar185;
      pdVar129[-0x1b] = (dStack_ab28 * (double)pMVar43 + dStack_aac8 * (double)pMVar46) * dVar185;
      pdVar129[-0x1a] = (dStack_ab20 * (double)pMVar44 + dStack_aac0 * (double)pMVar47) * dVar185;
      pdVar129[-0x19] = (dStack_ab18 * (double)pMVar45 + dStack_aab8 * (double)pMVar48) * dVar185;
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x48);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x50);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x58);
      pMVar46 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + 0x48);
      pMVar47 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + 0x50);
      pMVar48 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + 0x58);
      pdVar129[-0x18] =
           (local_ab10 *
            (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                     ((long)local_a1a0.
                            super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage
                            .m_data.array[3] + 0x40) +
           local_aab0 *
           (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                    ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>
                           .m_storage.m_data.array[2] + 0x40)) * dVar185;
      pdVar129[-0x17] = (dStack_ab08 * (double)pMVar43 + dStack_aaa8 * (double)pMVar46) * dVar185;
      pdVar129[-0x16] = (dStack_ab00 * (double)pMVar44 + dStack_aaa0 * (double)pMVar47) * dVar185;
      pdVar129[-0x15] = (dStack_aaf8 * (double)pMVar45 + dStack_aa98 * (double)pMVar48) * dVar185;
      dVar185 = *(double *)
                 ((long)(peVar35->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                        .m_storage.m_data.array + 0x20);
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + 0x68);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + 0x70);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + 0x78);
      pMVar46 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + -0x58);
      pMVar47 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + -0x50);
      pMVar48 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + -0x48);
      pdVar129[-0x14] =
           dVar185 * (local_abb0 *
                      (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                               ((long)local_a1a0.
                                      super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>
                                      .m_storage.m_data.array[2] + 0x60) +
                     local_aaf0 *
                     (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                              ((long)local_a1a0.
                                     super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                                     m_storage.m_data.array[2] + -0x60));
      pdVar129[-0x13] = dVar185 * (dStack_aba8 * (double)pMVar43 + dStack_aae8 * (double)pMVar46);
      pdVar129[-0x12] = dVar185 * (dStack_aba0 * (double)pMVar44 + dStack_aae0 * (double)pMVar47);
      pdVar129[-0x11] = dVar185 * (dStack_ab98 * (double)pMVar45 + dStack_aad8 * (double)pMVar48);
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x28);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x30);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x38);
      pMVar46 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + -0x38);
      pMVar47 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + -0x30);
      pMVar48 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + -0x28);
      pdVar129[-0x10] =
           dVar185 * (local_aad0 *
                      (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                               ((long)local_a1a0.
                                      super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>
                                      .m_storage.m_data.array[2] + -0x40) +
                     local_ab90 *
                     (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                              ((long)local_a1a0.
                                     super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                                     m_storage.m_data.array[3] + 0x20));
      pdVar129[-0xf] = dVar185 * (dStack_aac8 * (double)pMVar46 + dStack_ab88 * (double)pMVar43);
      pdVar129[-0xe] = dVar185 * (dStack_aac0 * (double)pMVar47 + dStack_ab80 * (double)pMVar44);
      pdVar129[-0xd] = dVar185 * (dStack_aab8 * (double)pMVar48 + dStack_ab78 * (double)pMVar45);
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x48);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x50);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[3] + 0x58);
      pMVar46 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + -0x18);
      pMVar47 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + -0x10);
      pMVar48 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + -8);
      pdVar129[-0xc] =
           dVar185 * (local_aab0 *
                      (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                               ((long)local_a1a0.
                                      super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>
                                      .m_storage.m_data.array[2] + -0x20) +
                     local_ab70 *
                     (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                              ((long)local_a1a0.
                                     super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                                     m_storage.m_data.array[3] + 0x40));
      pdVar129[-0xb] = dVar185 * (dStack_aaa8 * (double)pMVar46 + dStack_ab68 * (double)pMVar43);
      pdVar129[-10] = dVar185 * (dStack_aaa0 * (double)pMVar47 + dStack_ab60 * (double)pMVar44);
      pdVar129[-9] = dVar185 * (dStack_aa98 * (double)pMVar48 + dStack_ab58 * (double)pMVar45);
      local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.
      array[0] = *(double *)
                  ((long)(peVar35->m_D0).
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array + 0x28);
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + 8);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + 0x10);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + 0x18);
      pMVar46 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + -0x58);
      pMVar47 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + -0x50);
      pMVar48 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + -0x48);
      pdVar129[-8] = local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                     m_storage.m_data.array[0] *
                     (local_abb0 *
                      (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                               local_a1a0.
                               super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                               m_storage.m_data.array[2] +
                     local_ab50 *
                     (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                              ((long)local_a1a0.
                                     super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                                     m_storage.m_data.array[2] + -0x60));
      pdVar129[-7] = local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                     m_storage.m_data.array[0] *
                     (dStack_aba8 * (double)pMVar43 + dStack_ab48 * (double)pMVar46);
      pdVar129[-6] = local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                     m_storage.m_data.array[0] *
                     (dStack_aba0 * (double)pMVar44 + dStack_ab40 * (double)pMVar47);
      pdVar129[-5] = local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                     m_storage.m_data.array[0] *
                     (dStack_ab98 * (double)pMVar45 + dStack_ab38 * (double)pMVar48);
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + 0x28);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + 0x30);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + 0x38);
      pMVar46 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + -0x38);
      pMVar47 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + -0x30);
      pMVar48 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + -0x28);
      pdVar129[-4] = local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                     m_storage.m_data.array[0] *
                     (local_ab90 *
                      (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                               ((long)local_a1a0.
                                      super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>
                                      .m_storage.m_data.array[2] + 0x20) +
                     local_ab30 *
                     (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                              ((long)local_a1a0.
                                     super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                                     m_storage.m_data.array[2] + -0x40));
      pdVar129[-3] = local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                     m_storage.m_data.array[0] *
                     (dStack_ab88 * (double)pMVar43 + dStack_ab28 * (double)pMVar46);
      pdVar129[-2] = local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                     m_storage.m_data.array[0] *
                     (dStack_ab80 * (double)pMVar44 + dStack_ab20 * (double)pMVar47);
      pdVar129[-1] = local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                     m_storage.m_data.array[0] *
                     (dStack_ab78 * (double)pMVar45 + dStack_ab18 * (double)pMVar48);
      pMVar43 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + 0x48);
      pMVar44 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + 0x50);
      pMVar45 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + 0x58);
      pMVar46 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + -0x18);
      pMVar47 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + -0x10);
      pMVar48 = *(Matrix<double,_27,_81,_1,_27,_81> **)
                 ((long)local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                        m_storage.m_data.array[2] + -8);
      *pdVar129 = local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                  m_storage.m_data.array[0] *
                  (local_ab70 *
                   (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                            ((long)local_a1a0.
                                   super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                                   m_storage.m_data.array[2] + 0x40) +
                  local_ab10 *
                  (double)*(Matrix<double,_27,_81,_1,_27,_81> **)
                           ((long)local_a1a0.
                                  super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                                  m_storage.m_data.array[2] + -0x20));
      pdVar129[1] = local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                    m_storage.m_data.array[0] *
                    (dStack_ab68 * (double)pMVar43 + dStack_ab08 * (double)pMVar46);
      pdVar129[2] = local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                    m_storage.m_data.array[0] *
                    (dStack_ab60 * (double)pMVar44 + dStack_ab00 * (double)pMVar47);
      pdVar129[3] = local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                    m_storage.m_data.array[0] *
                    (dStack_ab58 * (double)pMVar45 + dStack_aaf8 * (double)pMVar48);
      pdVar129 = pdVar129 + 0xf3;
    } while (lVar132 != 9);
    uVar122 = (local_bb78->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_cols;
    if ((long)uVar122 < 0x27) {
LAB_00721a68:
      pcVar127 = 
      "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, 3>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 1, BlockCols = 3, InnerPanel = false]"
      ;
      goto LAB_00721a7d;
    }
    uVar128 = (local_bb78->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows;
    auVar179._8_8_ = 0;
    auVar179._0_8_ = local_ad50;
    auVar182._8_8_ = 0;
    auVar182._0_8_ = local_ad38;
    auVar186._8_8_ = 0;
    auVar186._0_8_ = local_ad20;
    auVar195._8_8_ = 0;
    auVar195._0_8_ = local_abe8;
    auVar205._8_8_ = 0;
    auVar205._0_8_ = local_abd0;
    auVar208._8_8_ = 0;
    auVar208._0_8_ = local_abb8;
    auVar211._8_8_ = 0;
    auVar211._0_8_ = local_aa80;
    auVar214._8_8_ = 0;
    auVar214._0_8_ = local_aa68;
    lVar132 = 0xd0;
    pdVar129 = (local_bb78->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_data + 0x2c;
    uVar128 = ~((long)uVar128 >> 0x3f) & uVar128;
    do {
      bVar135 = uVar128 == 0;
      uVar128 = uVar128 - 1;
      if (bVar135) goto LAB_00721a68;
      auVar140 = *(undefined1 (*) [16])(pdVar129 + -8);
      auVar137 = vmulpd_avx512vl(auVar140,local_ad60);
      *(undefined1 (*) [16])(local_aa00 + lVar132 + -8) = auVar137;
      dVar185 = pdVar129[-6];
      auVar223._8_8_ = 0;
      auVar223._0_8_ = dVar185;
      auVar137 = vmulsd_avx512f(auVar223,auVar179);
      vmovsd_avx512f(auVar137);
      *(undefined8 *)(local_aa00 + lVar132 + 8) = *(undefined8 *)(local_aa00 + lVar132 + 8);
      if (uVar122 < 0x2a) goto LAB_00721a68;
      auVar137 = *(undefined1 (*) [16])(pdVar129 + -5);
      auVar138 = vmulpd_avx512vl(auVar137,local_ad48);
      *(undefined1 (*) [16])(local_aa00 + lVar132 + 0x10) = auVar138;
      dVar189 = pdVar129[-3];
      auVar229._8_8_ = 0;
      auVar229._0_8_ = dVar189;
      auVar138 = vmulsd_avx512f(auVar229,auVar182);
      vmovsd_avx512f(auVar138);
      *(undefined8 *)((long)&local_a9e0 + lVar132) = *(undefined8 *)((long)&local_a9e0 + lVar132);
      if (uVar122 < 0x2d) goto LAB_00721a68;
      auVar138 = *(undefined1 (*) [16])(pdVar129 + -2);
      auVar136 = vmulsd_avx512f(auVar223,auVar211);
      auVar139 = vmulpd_avx512vl(auVar138,local_ad30);
      *(undefined1 (*) [16])(auStack_a9d8 + lVar132) = auVar139;
      dVar190 = *pdVar129;
      pdVar129 = pdVar129 + uVar122;
      auVar233._8_8_ = 0;
      auVar233._0_8_ = dVar190;
      auVar139 = vmulsd_avx512f(auVar233,auVar186);
      vmovsd_avx512f(auVar139);
      *(undefined8 *)((long)&uStack_a9c8 + lVar132) = *(undefined8 *)((long)&uStack_a9c8 + lVar132);
      auVar139 = vmulpd_avx512vl(auVar140,local_abf8);
      auVar140 = vmulpd_avx512vl(auVar140,local_aa90);
      *(undefined1 (*) [16])(local_a9c0 + lVar132) = auVar139;
      auVar224._8_8_ = 0;
      auVar224._0_8_ = dVar185;
      auVar139 = vmulsd_avx512f(auVar224,auVar195);
      auVar141 = vmulsd_avx512f(auVar229,auVar214);
      vmovsd_avx512f(auVar139);
      *(undefined8 *)(local_a9c0 + lVar132 + 0x10) = *(undefined8 *)(local_a9c0 + lVar132 + 0x10);
      auVar139 = vmulpd_avx512vl(auVar137,local_abe0);
      *(undefined1 (*) [16])(local_a9c0 + lVar132 + 0x18) = auVar139;
      auVar230._8_8_ = 0;
      auVar230._0_8_ = dVar189;
      auVar139 = vmulsd_avx512f(auVar230,auVar205);
      vmovsd_avx512f(auVar139);
      *(undefined8 *)(local_a9a0 + lVar132 + 8) = *(undefined8 *)(local_a9a0 + lVar132 + 8);
      auVar139 = vmulpd_avx512vl(auVar138,local_abc8);
      *(undefined1 (*) [16])(local_a9a0 + lVar132 + 0x10) = auVar139;
      auVar139 = vmulsd_avx512f(auVar233,auVar208);
      vmovsd_avx512f(auVar139);
      *(undefined8 *)((long)&local_a980 + lVar132) = *(undefined8 *)((long)&local_a980 + lVar132);
      auVar137 = vmulpd_avx512vl(auVar137,local_aa78);
      *(undefined1 (*) [16])((long)adStack_a978 + lVar132) = auVar140;
      puVar6 = (undefined8 *)((long)adStack_a978 + lVar132 + 0x10);
      vmovsd_avx512f(auVar136);
      *puVar6 = *puVar6;
      auVar140 = vmulpd_avx512vl(auVar138,local_aa60);
      *(undefined1 (*) [16])((long)local_a960 + lVar132) = auVar137;
      puVar6 = (undefined8 *)((long)local_a960 + lVar132 + 0x10);
      vmovsd_avx512f(auVar141);
      *puVar6 = *puVar6;
      auVar216._8_8_ = 0;
      auVar216._0_8_ = local_aa50;
      auVar234._8_8_ = 0;
      auVar234._0_8_ = dVar190;
      auVar137 = vmulsd_avx512f(auVar234,auVar216);
      *(undefined1 (*) [16])((long)adStack_a948 + lVar132) = auVar140;
      puVar6 = (undefined8 *)((long)&local_a938[0].data + lVar132);
      vmovsd_avx512f(auVar137);
      *puVar6 = *puVar6;
      lVar132 = lVar132 + 0xd8;
    } while (lVar132 != 0x868);
    peVar37 = (local_bb78->m_material).
              super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    p_Var36 = (local_bb78->m_material).
              super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (p_Var36 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_bb40 = *(Matrix<double,_27,_81,_1,_27,_81> ***)
                    ((long)(peVar37->m_Dv).
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 0x20);
      dStack_bb38 = *(double *)
                     ((long)(peVar37->m_Dv).
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 0x28);
      local_bb60 = *(undefined1 (*) [16])
                    (peVar37->m_Dv).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                    m_storage.m_data.array;
      local_bb50 = *(undefined1 (*) [16])
                    ((long)(peVar37->m_Dv).
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 0x10);
      local_bb30 = *(double *)
                    ((long)(peVar37->m_Dv).
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 0x30);
      dStack_bb28 = *(double *)
                     ((long)(peVar37->m_Dv).
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 0x38);
      local_bb70 = *(double *)
                    ((long)(peVar37->m_Dv).
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 0x40);
      uStack_bb68 = 0;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var36->_M_use_count = p_Var36->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var36->_M_use_count = p_Var36->_M_use_count + 1;
      }
      local_bb60 = *(undefined1 (*) [16])
                    (peVar37->m_Dv).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                    m_storage.m_data.array;
      local_bb50 = *(undefined1 (*) [16])
                    ((long)(peVar37->m_Dv).
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 0x10);
      local_bb40 = *(Matrix<double,_27,_81,_1,_27,_81> ***)
                    ((long)(peVar37->m_Dv).
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 0x20);
      dStack_bb38 = *(double *)
                     ((long)(peVar37->m_Dv).
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 0x28);
      local_bb30 = *(double *)
                    ((long)(peVar37->m_Dv).
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 0x30);
      dStack_bb28 = *(double *)
                     ((long)(peVar37->m_Dv).
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 0x38);
      local_bb70 = *(double *)
                    ((long)(peVar37->m_Dv).
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 0x40);
      uStack_bb68 = 0;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var36);
    }
    local_b920 = local_bb60._0_8_;
    local_b910 = local_bb50._0_8_;
    local_bad0 = vshufpd_avx(local_bb60,local_bb60,1);
    local_b930 = vshufpd_avx(local_bb60,local_bb60,3);
    lVar132 = 0x40;
    pdVar129 = local_44b0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage
               .m_data.array + 0x4a;
    do {
      dVar190 = *(double *)((long)adStack_a978 + lVar132 + 8);
      dVar191 = *(double *)((long)local_a960 + lVar132 + 8);
      dVar185 = *(double *)((long)&local_a938[0].data + lVar132);
      dVar198 = *(double *)((long)adStack_a948 + lVar132 + 8);
      dVar189 = *(double *)((long)local_a960 + lVar132 + 0x10);
      pdVar129[-2] = local_b920 * *(double *)((long)adStack_a978 + lVar132) +
                     local_b930._0_8_ * *(double *)((long)local_a960 + lVar132) +
                     local_b910 * *(double *)((long)adStack_a948 + lVar132);
      pdVar129[-1] = local_b920 * dVar190 + local_b930._8_8_ * dVar191 + local_b910 * dVar198;
      lVar133 = lVar132 + 0x10;
      lVar132 = lVar132 + 0x48;
      *pdVar129 = local_b910 * dVar185 +
                  local_b920 * *(double *)((long)adStack_a978 + lVar133) +
                  local_bad0._0_8_ * dVar189;
      pdVar129 = pdVar129 + 0x51;
    } while (lVar132 != 0x7d8);
    auVar49._8_8_ = dStack_bb38;
    auVar49._0_8_ = local_bb40;
    local_b940 = vshufpd_avx(local_bb50,local_bb50,1);
    local_b970 = vshufpd_avx(local_bb50,local_bb50,3);
    auVar50._8_8_ = dStack_bb28;
    auVar50._0_8_ = local_bb30;
    lVar132 = 0x40;
    pdVar129 = local_44b0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage
               .m_data.array + 0x4d;
    local_b950 = vshufpd_avx(auVar49,auVar49,1);
    local_b960 = vshufpd_avx(auVar49,auVar49,3);
    do {
      dVar190 = *(double *)((long)adStack_a978 + lVar132 + 8);
      dVar191 = *(double *)((long)local_a960 + lVar132 + 8);
      dVar185 = *(double *)((long)&local_a938[0].data + lVar132);
      dVar198 = *(double *)((long)adStack_a948 + lVar132 + 8);
      dVar189 = *(double *)((long)local_a960 + lVar132 + 0x10);
      pdVar129[-2] = local_b970._0_8_ * *(double *)((long)adStack_a978 + lVar132) +
                     (double)local_bb40 * *(double *)((long)local_a960 + lVar132) +
                     local_b960._0_8_ * *(double *)((long)adStack_a948 + lVar132);
      pdVar129[-1] = local_b970._8_8_ * dVar190 + (double)local_bb40 * dVar191 +
                     local_b960._8_8_ * dVar198;
      lVar133 = lVar132 + 0x10;
      lVar132 = lVar132 + 0x48;
      *pdVar129 = local_b950._0_8_ * dVar185 +
                  local_b940._0_8_ * *(double *)((long)adStack_a978 + lVar133) +
                  (double)local_bb40 * dVar189;
      pdVar129 = pdVar129 + 0x51;
    } while (lVar132 != 0x7d8);
    local_b990 = vshufpd_avx(auVar50,auVar50,1);
    local_b9c0 = vshufpd_avx(auVar50,auVar50,3);
    lVar132 = 0x40;
    pdVar129 = local_44b0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage
               .m_data.array + 0x50;
    local_b980 = local_bb40;
    ppMStack_b978 = local_bb40;
    do {
      dVar190 = *(double *)((long)adStack_a978 + lVar132 + 8);
      dVar191 = *(double *)((long)local_a960 + lVar132 + 8);
      dVar185 = *(double *)((long)&local_a938[0].data + lVar132);
      dVar198 = *(double *)((long)adStack_a948 + lVar132 + 8);
      dVar189 = *(double *)((long)local_a960 + lVar132 + 0x10);
      pdVar129[-2] = local_bb30 * *(double *)((long)adStack_a978 + lVar132) +
                     local_b9c0._0_8_ * *(double *)((long)local_a960 + lVar132) +
                     local_bb70 * *(double *)((long)adStack_a948 + lVar132);
      pdVar129[-1] = local_bb30 * dVar190 + local_b9c0._8_8_ * dVar191 + local_bb70 * dVar198;
      lVar133 = lVar132 + 0x10;
      lVar132 = lVar132 + 0x48;
      *pdVar129 = local_bb70 * dVar185 +
                  local_bb30 * *(double *)((long)adStack_a978 + lVar133) +
                  local_b990._0_8_ * dVar189;
      pdVar129 = pdVar129 + 0x51;
    } while (lVar132 != 0x7d8);
    local_b9b0 = local_bb30;
    dStack_b9a8 = local_bb30;
    local_b9a0 = local_bb70;
    dStack_b998 = local_bb70;
    pdVar129 = (double *)&local_a1a0;
    dStack_b918 = local_b920;
    dStack_b908 = local_b910;
    local_aff0 = &local_8908;
    TStack_afe8.m_matrix = &local_44b0;
    memset(pdVar129,0,0x16c8);
    local_b090._0_8_ = 1.0;
    Eigen::internal::
    generic_product_impl<Eigen::Matrix<double,27,81,1,27,81>,Eigen::Transpose<Eigen::Matrix<double,27,81,1,27,81>>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,27,27,0,27,27>>
              ((Matrix<double,_27,_27,_0,_27,_27> *)pdVar129,&local_8908,&TStack_afe8,
               (Scalar *)&local_b090);
    if (((local_bb18->
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
         .
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
         .m_rows.m_value != 0x1b) ||
       ((local_bb18->
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        ).
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_cols.m_value != 0x1b)) {
      __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                    "void Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>]"
                   );
    }
    pdVar121 = (local_bb18->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_data;
    lVar132 = (local_bb18->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).m_stride.m_outer.m_value;
    lVar133 = 0;
    do {
      lVar130 = 0;
      pdVar123 = pdVar129;
      do {
        dVar185 = *pdVar123;
        pdVar123 = pdVar123 + 0x1b;
        pdVar121[lVar130] = dVar185;
        lVar130 = lVar130 + 1;
      } while (lVar130 != 0x1b);
      lVar133 = lVar133 + 1;
      pdVar129 = pdVar129 + 1;
      pdVar121 = pdVar121 + lVar132;
    } while (lVar133 != 0x1b);
    local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [1] = (double)local_ba40;
    local_ba40._8_8_ =
         (double)local_b900._8_8_ * dStack_b4c0 + dStack_b790 * dStack_b358 +
         dStack_b628 * dStack_b1f0;
    local_ba40._0_8_ =
         (double)local_b900._0_8_ * local_b4c8 + local_b798 * local_b360 + local_b630 * local_b1f8;
    dStack_ba30 = (double)local_b900._16_8_ * dStack_b4b8 + dStack_b788 * dStack_b350 +
                  dStack_b620 * dStack_b1e8;
    dStack_ba28 = (double)local_b900._24_8_ * dStack_b4b0 + dStack_b780 * dStack_b348 +
                  dStack_b618 * dStack_b1e0;
    local_ba20 = local_b610 * local_b1d8 +
                 (double)local_b900._32_8_ * local_b4a8 + local_b778 * local_b340;
    dStack_ba18 = dStack_b608 * dStack_b1d0 +
                  (double)local_b900._40_8_ * dStack_b4a0 + dStack_b770 * dStack_b338;
    dStack_ba10 = dStack_b600 * dStack_b1c8 +
                  (double)local_b900._48_8_ * dStack_b498 + dStack_b768 * dStack_b330;
    dStack_ba08 = dStack_b5f8 * dStack_b1c0 +
                  (double)local_b900._56_8_ * dStack_b490 + dStack_b760 * dStack_b328;
    local_ba00 = local_b5f0 * local_b1b8 +
                 local_b758 * local_b320 + (double)local_b900._64_8_ * local_b488;
    dStack_b9f8 = dStack_b5e8 * dStack_b1b0 +
                  dStack_b750 * dStack_b318 + (double)local_b900._72_8_ * dStack_b480;
    dStack_b9f0 = dStack_b5e0 * dStack_b1a8 +
                  dStack_b748 * dStack_b310 + (double)local_b900._80_8_ * dStack_b478;
    dStack_b9e8 = dStack_b5d8 * dStack_b1a0 +
                  dStack_b740 * dStack_b308 + (double)local_b900._88_8_ * dStack_b470;
    local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [0] = local_bb78->m_Alpha + local_bb78->m_Alpha;
    if (((local_bb78->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_rows == 0xc) &&
       ((local_bb78->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
        m_storage.m_cols == 1)) {
      auVar113._8_8_ =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[1];
      auVar113._0_8_ =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0];
      pauVar126 = (undefined1 (*) [32])
                  (local_bb78->m_kGQ_D0).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
      auVar10._8_8_ = 0;
      auVar10._0_8_ =
           (peVar35->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
           m_data.array[0];
      auVar140 = vmulsd_avx512f(ZEXT816(0x3fe0000000000000),auVar10);
      auVar206._8_8_ = 0xbff0000000000000;
      auVar206._0_8_ = 0xbff0000000000000;
      auVar206._16_8_ = 0xbff0000000000000;
      auVar206._24_8_ = 0xbff0000000000000;
      pdVar129 = (double *)vpextrq_avx(auVar113,1);
      auVar171._0_8_ =
           (double)local_b900._0_8_ * (double)local_b900._0_8_ + local_b798 * local_b798 +
           local_b630 * local_b630 + -1.0 +
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * *pdVar129;
      auVar171._8_8_ =
           (double)local_b900._8_8_ * (double)local_b900._8_8_ + dStack_b790 * dStack_b790 +
           dStack_b628 * dStack_b628 + -1.0 +
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * pdVar129[1];
      auVar171._16_8_ =
           (double)local_b900._16_8_ * (double)local_b900._16_8_ + dStack_b788 * dStack_b788 +
           dStack_b620 * dStack_b620 + -1.0 +
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * pdVar129[2];
      auVar171._24_8_ =
           (double)local_b900._24_8_ * (double)local_b900._24_8_ + dStack_b780 * dStack_b780 +
           dStack_b618 * dStack_b618 + -1.0 +
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * pdVar129[3];
      auVar152 = vmulpd_avx512vl(auVar171,*pauVar126);
      auVar183._0_8_ =
           (double)local_b900._32_8_ * (double)local_b900._32_8_ + local_b778 * local_b778 +
           local_b610 * local_b610 + -1.0 +
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * pdVar129[4];
      auVar183._8_8_ =
           (double)local_b900._40_8_ * (double)local_b900._40_8_ + dStack_b770 * dStack_b770 +
           dStack_b608 * dStack_b608 + -1.0 +
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * pdVar129[5];
      auVar183._16_8_ =
           (double)local_b900._48_8_ * (double)local_b900._48_8_ + dStack_b768 * dStack_b768 +
           dStack_b600 * dStack_b600 + -1.0 +
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * pdVar129[6];
      auVar183._24_8_ =
           (double)local_b900._56_8_ * (double)local_b900._56_8_ + dStack_b760 * dStack_b760 +
           dStack_b5f8 * dStack_b5f8 + -1.0 +
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * pdVar129[7];
      auVar192._0_8_ =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * pdVar129[8] +
           local_b5f0 * local_b5f0 +
           local_b758 * local_b758 + (double)local_b900._64_8_ * (double)local_b900._64_8_ + -1.0;
      auVar192._8_8_ =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * pdVar129[9] +
           dStack_b5e8 * dStack_b5e8 +
           dStack_b750 * dStack_b750 + (double)local_b900._72_8_ * (double)local_b900._72_8_ + -1.0;
      auVar192._16_8_ =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * pdVar129[10] +
           dStack_b5e0 * dStack_b5e0 +
           dStack_b748 * dStack_b748 + (double)local_b900._80_8_ * (double)local_b900._80_8_ + -1.0;
      auVar192._24_8_ =
           local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0] * pdVar129[0xb] +
           dStack_b5d8 * dStack_b5d8 +
           dStack_b740 * dStack_b740 + (double)local_b900._88_8_ * (double)local_b900._88_8_ + -1.0;
      auVar153 = vmulpd_avx512vl(auVar192,pauVar126[2]);
      auVar154 = vmulpd_avx512vl(auVar183,pauVar126[1]);
      auVar168._8_8_ = dStack_b400;
      auVar168._0_8_ = local_b408;
      auVar168._16_8_ = dStack_b3f8;
      auVar168._24_8_ = dStack_b3f0;
      auVar11._8_8_ = 0;
      auVar11._0_8_ =
           *(double *)
            ((long)(peVar35->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                   m_storage.m_data.array + 8);
      auVar137 = vmulsd_avx512f(ZEXT816(0x3fe0000000000000),auVar11);
      pdVar129 = (local_bb78->m_kGQ_D0).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
      auVar170._0_8_ =
           local_b590 * local_b590 +
           local_b6f8 * local_b6f8 + (double)local_b900._160_8_ * (double)local_b900._160_8_ + -1.0
           + ((double)local_b900._160_8_ * local_b428 + local_b6f8 * local_b2c0 +
             local_b590 * local_b158) *
             local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
             m_data.array[0];
      auVar170._8_8_ =
           dStack_b588 * dStack_b588 +
           dStack_b6f0 * dStack_b6f0 + (double)local_b900._168_8_ * (double)local_b900._168_8_ +
           -1.0 + ((double)local_b900._168_8_ * dStack_b420 + dStack_b6f0 * dStack_b2b8 +
                  dStack_b588 * dStack_b150) *
                  local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                  m_storage.m_data.array[0];
      auVar170._16_8_ =
           dStack_b580 * dStack_b580 +
           dStack_b6e8 * dStack_b6e8 + (double)local_b900._176_8_ * (double)local_b900._176_8_ +
           -1.0 + ((double)local_b900._176_8_ * dStack_b418 + dStack_b6e8 * dStack_b2b0 +
                  dStack_b580 * dStack_b148) *
                  local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                  m_storage.m_data.array[0];
      auVar170._24_8_ =
           dStack_b578 * dStack_b578 +
           dStack_b6e0 * dStack_b6e0 + (double)local_b900._184_8_ * (double)local_b900._184_8_ +
           -1.0 + ((double)local_b900._184_8_ * dStack_b410 + dStack_b6e0 * dStack_b2a8 +
                  dStack_b578 * dStack_b140) *
                  local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                  m_storage.m_data.array[0];
      auVar155 = vmulpd_avx512vl(auVar170,*(undefined1 (*) [32])(pdVar129 + 8));
      auVar167._8_8_ = local_b900._200_8_;
      auVar167._0_8_ = local_b900._192_8_;
      auVar167._16_8_ = local_b900._208_8_;
      auVar167._24_8_ = local_b900._216_8_;
      auVar169._8_8_ = dStack_b298;
      auVar169._0_8_ = local_b2a0;
      auVar169._16_8_ = dStack_b290;
      auVar169._24_8_ = dStack_b288;
      dVar185 = (local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage
                 .m_data.array[0] *
                 ((double)local_b900._96_8_ * local_b468 + local_b738 * local_b300 +
                 local_b5d0 * local_b198) +
                (double)local_b900._96_8_ * (double)local_b900._96_8_ + local_b738 * local_b738 +
                local_b5d0 * local_b5d0 + -1.0) * *pdVar129;
      dVar189 = (local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage
                 .m_data.array[0] *
                 ((double)local_b900._104_8_ * dStack_b460 + dStack_b730 * dStack_b2f8 +
                 dStack_b5c8 * dStack_b190) +
                (double)local_b900._104_8_ * (double)local_b900._104_8_ + dStack_b730 * dStack_b730
                + dStack_b5c8 * dStack_b5c8 + -1.0) * pdVar129[1];
      dVar190 = (local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage
                 .m_data.array[0] *
                 ((double)local_b900._112_8_ * dStack_b458 + dStack_b728 * dStack_b2f0 +
                 dStack_b5c0 * dStack_b188) +
                (double)local_b900._112_8_ * (double)local_b900._112_8_ + dStack_b728 * dStack_b728
                + dStack_b5c0 * dStack_b5c0 + -1.0) * pdVar129[2];
      dVar191 = (local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage
                 .m_data.array[0] *
                 ((double)local_b900._120_8_ * dStack_b450 + dStack_b720 * dStack_b2e8 +
                 dStack_b5b8 * dStack_b180) +
                (double)local_b900._120_8_ * (double)local_b900._120_8_ + dStack_b720 * dStack_b720
                + dStack_b5b8 * dStack_b5b8 + -1.0) * pdVar129[3];
      dVar198 = (local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage
                 .m_data.array[0] *
                 (local_b5b0 * local_b178 +
                 (double)local_b900._128_8_ * local_b448 + local_b718 * local_b2e0) +
                (double)local_b900._128_8_ * (double)local_b900._128_8_ + local_b718 * local_b718 +
                local_b5b0 * local_b5b0 + -1.0) * pdVar129[4];
      dVar202 = (local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage
                 .m_data.array[0] *
                 (dStack_b5a8 * dStack_b170 +
                 (double)local_b900._136_8_ * dStack_b440 + dStack_b710 * dStack_b2d8) +
                (double)local_b900._136_8_ * (double)local_b900._136_8_ + dStack_b710 * dStack_b710
                + dStack_b5a8 * dStack_b5a8 + -1.0) * pdVar129[5];
      dVar203 = (local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage
                 .m_data.array[0] *
                 (dStack_b5a0 * dStack_b168 +
                 (double)local_b900._144_8_ * dStack_b438 + dStack_b708 * dStack_b2d0) +
                (double)local_b900._144_8_ * (double)local_b900._144_8_ + dStack_b708 * dStack_b708
                + dStack_b5a0 * dStack_b5a0 + -1.0) * pdVar129[6];
      dVar204 = (local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage
                 .m_data.array[0] *
                 (dStack_b598 * dStack_b160 +
                 (double)local_b900._152_8_ * dStack_b430 + dStack_b700 * dStack_b2c8) +
                (double)local_b900._152_8_ * (double)local_b900._152_8_ + dStack_b700 * dStack_b700
                + dStack_b598 * dStack_b598 + -1.0) * pdVar129[7];
      auVar156 = vmulpd_avx512vl(local_b698,local_b260);
      auVar157 = vmulpd_avx512vl(local_b6b8,local_b280);
      local_ba40._8_8_ =
           (double)local_b900._200_8_ * dStack_b400 + local_b6d8._8_8_ * dStack_b298 +
           local_b570._8_8_ * dStack_b130;
      local_ba40._0_8_ =
           (double)local_b900._192_8_ * local_b408 + local_b6d8._0_8_ * local_b2a0 +
           local_b570._0_8_ * local_b138;
      dStack_ba30 = (double)local_b900._208_8_ * dStack_b3f8 + local_b6d8._16_8_ * dStack_b290 +
                    local_b570._16_8_ * dStack_b128;
      dStack_ba28 = (double)local_b900._216_8_ * dStack_b3f0 + local_b6d8._24_8_ * dStack_b288 +
                    local_b570._24_8_ * dStack_b120;
      auVar158 = vmulpd_avx512vl(local_b900._224_32_,local_b3e8);
      auVar159 = vmulpd_avx512vl(local_b550,local_b118);
      local_ba20 = auVar158._0_8_ + auVar157._0_8_ + auVar159._0_8_;
      dStack_ba18 = auVar158._8_8_ + auVar157._8_8_ + auVar159._8_8_;
      dStack_ba10 = auVar158._16_8_ + auVar157._16_8_ + auVar159._16_8_;
      dStack_ba08 = auVar158._24_8_ + auVar157._24_8_ + auVar159._24_8_;
      auVar157 = vmulpd_avx512vl(local_b800,local_b3c8);
      auVar158 = vmulpd_avx512vl(local_b530,local_b0f8);
      local_ba00 = auVar157._0_8_ + auVar156._0_8_ + auVar158._0_8_;
      dStack_b9f8 = auVar157._8_8_ + auVar156._8_8_ + auVar158._8_8_;
      dStack_b9f0 = auVar157._16_8_ + auVar156._16_8_ + auVar158._16_8_;
      dStack_b9e8 = auVar157._24_8_ + auVar156._24_8_ + auVar158._24_8_;
      ppVar7 = (plainobjectbase_evaluator_data<double,_45> *)local_bb78->m_Alpha;
      ppVar42 = (plainobjectbase_evaluator_data<double,_45> *)((double)ppVar7 + (double)ppVar7);
      local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.
      array[0] = (double)ppVar42;
      if (((local_bb78->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows == 0xc) &&
         ((local_bb78->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols == 1)) {
        auVar114._8_8_ =
             local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
             m_data.array[1];
        auVar114._0_8_ = ppVar42;
        auVar156 = vmulpd_avx512vl(local_b800,local_b800);
        auVar157 = vmulpd_avx512vl(local_b698,local_b698);
        auVar158 = vmulpd_avx512vl(local_b6b8,local_b6b8);
        auVar159 = vmulpd_avx512vl(local_b6d8,local_b6d8);
        auVar73._8_8_ = dStack_b710;
        auVar73._0_8_ = local_b718;
        auVar73._16_8_ = dStack_b708;
        auVar73._24_8_ = dStack_b700;
        auVar156 = vaddpd_avx512vl(auVar156,auVar157);
        auVar157 = vmulpd_avx512vl(local_b530,local_b530);
        auVar156 = vaddpd_avx512vl(auVar156,auVar157);
        pdVar123 = (double *)vpextrq_avx(auVar114,1);
        auVar196._8_8_ = ppVar42;
        auVar196._0_8_ = ppVar42;
        auVar196._16_8_ = ppVar42;
        auVar196._24_8_ = ppVar42;
        auVar157 = vmulpd_avx512vl(auVar196,*(undefined1 (*) [32])(pdVar123 + 8));
        auVar199._0_8_ = auVar156._0_8_ + -1.0;
        auVar199._8_8_ = auVar156._8_8_ + -1.0;
        auVar199._16_8_ = auVar156._16_8_ + -1.0;
        auVar199._24_8_ = auVar156._24_8_ + -1.0;
        auVar156 = vaddpd_avx512vl(auVar199,auVar157);
        auVar157 = vmulpd_avx512vl(local_b900._224_32_,local_b900._224_32_);
        auVar157 = vaddpd_avx512vl(auVar157,auVar158);
        auVar158 = vmulpd_avx512vl(local_b550,local_b550);
        auVar157 = vaddpd_avx512vl(auVar157,auVar158);
        auVar158 = vmulpd_avx512vl(auVar196,*(undefined1 (*) [32])(pdVar123 + 4));
        pdVar129 = (local_bb78->m_kGQ_D0).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
        ;
        auVar200._0_8_ = auVar157._0_8_ + -1.0;
        auVar200._8_8_ = auVar157._8_8_ + -1.0;
        auVar200._16_8_ = auVar157._16_8_ + -1.0;
        auVar200._24_8_ = auVar157._24_8_ + -1.0;
        _local_a9c0 = vmulpd_avx512vl(auVar156,*(undefined1 (*) [32])(pdVar129 + 8));
        auVar87._8_8_ = dStack_b460;
        auVar87._0_8_ = local_b468;
        auVar87._16_8_ = dStack_b458;
        auVar87._24_8_ = dStack_b450;
        auVar156 = vmulpd_avx512vl(auVar167,auVar87);
        auVar157 = vaddpd_avx512vl(auVar200,auVar158);
        auVar158 = vmulpd_avx512vl(auVar167,auVar167);
        auVar158 = vaddpd_avx512vl(auVar158,auVar159);
        auVar159 = vmulpd_avx512vl(local_b570,local_b570);
        auVar158 = vaddpd_avx512vl(auVar158,auVar159);
        auVar63._8_8_ = local_b900._136_8_;
        auVar63._0_8_ = local_b900._128_8_;
        auVar63._16_8_ = local_b900._144_8_;
        auVar63._24_8_ = local_b900._152_8_;
        auVar158 = vaddpd_avx512vl(auVar158,auVar206);
        auVar97._8_8_ = dStack_b2f8;
        auVar97._0_8_ = local_b300;
        auVar97._16_8_ = dStack_b2f0;
        auVar97._24_8_ = dStack_b2e8;
        auVar159 = vmulpd_avx512vl(local_b6d8,auVar97);
        auVar160 = vmulpd_avx512vl(auVar63,local_b3e8);
        auVar156 = vaddpd_avx512vl(auVar156,auVar159);
        auVar107._8_8_ = dStack_b190;
        auVar107._0_8_ = local_b198;
        auVar107._16_8_ = dStack_b188;
        auVar107._24_8_ = dStack_b180;
        auVar159 = vmulpd_avx512vl(local_b570,auVar107);
        auVar156 = vaddpd_avx512vl(auVar156,auVar159);
        auVar61._8_8_ = local_b900._104_8_;
        auVar61._0_8_ = local_b900._96_8_;
        auVar61._16_8_ = local_b900._112_8_;
        auVar61._24_8_ = local_b900._120_8_;
        auVar71._8_8_ = dStack_b730;
        auVar71._0_8_ = local_b738;
        auVar71._16_8_ = dStack_b728;
        auVar71._24_8_ = dStack_b720;
        auVar159 = vmulpd_avx512vl(auVar61,auVar168);
        auVar161 = vmulpd_avx512vl(auVar71,auVar169);
        auVar156 = vaddpd_avx512vl(auVar156,auVar159);
        auVar99._8_8_ = dStack_b2d8;
        auVar99._0_8_ = local_b2e0;
        auVar99._16_8_ = dStack_b2d0;
        auVar99._24_8_ = dStack_b2c8;
        auVar159 = vmulpd_avx512vl(local_b6b8,auVar99);
        local_ba40._8_8_ = auVar156._8_8_ + auVar161._8_8_ + dStack_b5c8 * dStack_b130;
        local_ba40._0_8_ = auVar156._0_8_ + auVar161._0_8_ + local_b5d0 * local_b138;
        dStack_ba30 = auVar156._16_8_ + auVar161._16_8_ + dStack_b5c0 * dStack_b128;
        dStack_ba28 = auVar156._24_8_ + auVar161._24_8_ + dStack_b5b8 * dStack_b120;
        auVar89._8_8_ = dStack_b440;
        auVar89._0_8_ = local_b448;
        auVar89._16_8_ = dStack_b438;
        auVar89._24_8_ = dStack_b430;
        auVar156 = vmulpd_avx512vl(local_b900._224_32_,auVar89);
        auVar109._8_8_ = dStack_b170;
        auVar109._0_8_ = local_b178;
        auVar109._16_8_ = dStack_b168;
        auVar109._24_8_ = dStack_b160;
        auVar161 = vmulpd_avx512vl(local_b550,auVar109);
        auVar162 = vmulpd_avx512vl(auVar73,local_b280);
        auVar80._8_8_ = dStack_b5a8;
        auVar80._0_8_ = local_b5b0;
        auVar80._16_8_ = dStack_b5a0;
        auVar80._24_8_ = dStack_b598;
        auVar148 = vmulpd_avx512vl(auVar80,local_b118);
        local_ba20 = auVar148._0_8_ +
                     auVar161._0_8_ + auVar159._0_8_ + auVar156._0_8_ + auVar160._0_8_ +
                     auVar162._0_8_;
        dStack_ba18 = auVar148._8_8_ +
                      auVar161._8_8_ + auVar159._8_8_ + auVar156._8_8_ + auVar160._8_8_ +
                      auVar162._8_8_;
        dStack_ba10 = auVar148._16_8_ +
                      auVar161._16_8_ + auVar159._16_8_ + auVar156._16_8_ + auVar160._16_8_ +
                      auVar162._16_8_;
        dStack_ba08 = auVar148._24_8_ +
                      auVar161._24_8_ + auVar159._24_8_ + auVar156._24_8_ + auVar160._24_8_ +
                      auVar162._24_8_;
        auVar101._8_8_ = dStack_b2b8;
        auVar101._0_8_ = local_b2c0;
        auVar101._16_8_ = dStack_b2b0;
        auVar101._24_8_ = dStack_b2a8;
        auVar156 = vmulpd_avx512vl(local_b698,auVar101);
        auVar91._8_8_ = dStack_b420;
        auVar91._0_8_ = local_b428;
        auVar91._16_8_ = dStack_b418;
        auVar91._24_8_ = dStack_b410;
        auVar159 = vmulpd_avx512vl(local_b800,auVar91);
        auVar111._8_8_ = dStack_b150;
        auVar111._0_8_ = local_b158;
        auVar111._16_8_ = dStack_b148;
        auVar111._24_8_ = dStack_b140;
        auVar160 = vmulpd_avx512vl(local_b530,auVar111);
        auVar65._8_8_ = local_b900._168_8_;
        auVar65._0_8_ = local_b900._160_8_;
        auVar65._16_8_ = local_b900._176_8_;
        auVar65._24_8_ = local_b900._184_8_;
        auVar75._8_8_ = dStack_b6f0;
        auVar75._0_8_ = local_b6f8;
        auVar75._16_8_ = dStack_b6e8;
        auVar75._24_8_ = dStack_b6e0;
        auVar82._8_8_ = dStack_b588;
        auVar82._0_8_ = local_b590;
        auVar82._16_8_ = dStack_b580;
        auVar82._24_8_ = dStack_b578;
        local_ba00 = auVar160._0_8_ + auVar156._0_8_ + auVar159._0_8_ +
                     (double)local_b900._160_8_ * local_b3c8._0_8_ + local_b6f8 * local_b260._0_8_ +
                     local_b590 * local_b0f8._0_8_;
        dStack_b9f8 = auVar160._8_8_ + auVar156._8_8_ + auVar159._8_8_ +
                      (double)local_b900._168_8_ * local_b3c8._8_8_ + dStack_b6f0 * local_b260._8_8_
                      + dStack_b588 * local_b0f8._8_8_;
        dStack_b9f0 = auVar160._16_8_ + auVar156._16_8_ + auVar159._16_8_ +
                      (double)local_b900._176_8_ * local_b3c8._16_8_ +
                      dStack_b6e8 * local_b260._16_8_ + dStack_b580 * local_b0f8._16_8_;
        dStack_b9e8 = auVar160._24_8_ + auVar156._24_8_ + auVar159._24_8_ +
                      (double)local_b900._184_8_ * local_b3c8._24_8_ +
                      dStack_b6e0 * local_b260._24_8_ + dStack_b578 * local_b0f8._24_8_;
        _local_bb00 = auVar152;
        _local_ba80 = auVar153;
        _local_ba60 = auVar154;
        local_b9e0 = auVar137;
        local_b9d0 = auVar140;
        _local_a9a0 = auVar155;
        local_a980 = dVar198;
        adStack_a978[0] = dVar202;
        adStack_a978[1] = dVar203;
        adStack_a978[2] = dVar204;
        local_a960[0] = dVar185;
        local_a960[1] = dVar189;
        local_a960[2] = dVar190;
        adStack_a948[0] = dVar191;
        local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.
        array[0] = (double)ppVar7;
        if (((local_bb78->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
             .m_storage.m_rows == 0xc) &&
           ((local_bb78->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_cols == 1)) {
          auVar115._8_8_ =
               local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
          auVar115._0_8_ = ppVar7;
          auVar156 = vmulpd_avx512vl(auVar65,local_b800);
          auVar159 = vmulpd_avx512vl(auVar75,local_b698);
          auVar160 = vmulpd_avx512vl(auVar82,local_b530);
          auVar85._8_8_ = dStack_b4a0;
          auVar85._0_8_ = local_b4a8;
          auVar85._16_8_ = dStack_b498;
          auVar85._24_8_ = dStack_b490;
          auVar95._8_8_ = dStack_b338;
          auVar95._0_8_ = local_b340;
          auVar95._16_8_ = dStack_b330;
          auVar95._24_8_ = dStack_b328;
          auVar69._8_8_ = dStack_b770;
          auVar69._0_8_ = local_b778;
          auVar69._16_8_ = dStack_b768;
          auVar69._24_8_ = dStack_b760;
          auVar77._8_8_ = dStack_b608;
          auVar77._0_8_ = local_b610;
          auVar77._16_8_ = dStack_b600;
          auVar77._24_8_ = dStack_b5f8;
          auVar60._8_8_ = local_b900._72_8_;
          auVar60._0_8_ = local_b900._64_8_;
          auVar60._16_8_ = local_b900._80_8_;
          auVar60._24_8_ = local_b900._88_8_;
          auVar161 = vmulpd_avx512vl(auVar73,local_b6b8);
          pdVar124 = (double *)vpextrq_avx(auVar115,1);
          auVar162 = vmulpd_avx512vl(auVar63,local_b900._224_32_);
          auVar148 = vmulpd_avx512vl(auVar80,local_b550);
          auVar149 = vmulpd_avx512vl(auVar71,local_b6d8);
          dVar8 = *(double *)
                   ((long)(peVar35->m_D0).
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array + 0x18);
          auVar59._8_8_ = local_b900._40_8_;
          auVar59._0_8_ = local_b900._32_8_;
          auVar59._16_8_ = local_b900._48_8_;
          auVar59._24_8_ = local_b900._56_8_;
          pdVar131 = (local_bb78->m_kGQ_D0).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_data;
          auVar150 = vmulpd_avx512vl(auVar61,auVar167);
          auVar93._8_8_ = dStack_b358;
          auVar93._0_8_ = local_b360;
          auVar93._16_8_ = dStack_b350;
          auVar93._24_8_ = dStack_b348;
          auVar151 = vmulpd_avx512vl(local_b6d8,auVar93);
          auVar67._8_8_ = dStack_b790;
          auVar67._0_8_ = local_b798;
          auVar67._16_8_ = dStack_b788;
          auVar67._24_8_ = dStack_b780;
          auVar103._8_8_ = dStack_b1f0;
          auVar103._0_8_ = local_b1f8;
          auVar103._16_8_ = dStack_b1e8;
          auVar103._24_8_ = dStack_b1e0;
          auVar163 = vmulpd_avx512vl(local_b570,auVar103);
          local_baa0 = SUB84(local_b630,0);
          uStack_ba9c = (undefined4)((ulong)local_b630 >> 0x20);
          dStack_ba98 = dStack_b628;
          dStack_ba90 = dStack_b620;
          dStack_ba88 = dStack_b618;
          auVar164 = vmulpd_avx512vl(local_b6b8,auVar95);
          local_ba40._8_8_ =
               (double)local_b900._200_8_ * dStack_b4c0 + auVar151._8_8_ + auVar163._8_8_ +
               (double)local_b900._8_8_ * dStack_b400 + dStack_b790 * dStack_b298 +
               dStack_b628 * dStack_b130;
          local_ba40._0_8_ =
               (double)local_b900._192_8_ * local_b4c8 + auVar151._0_8_ + auVar163._0_8_ +
               (double)local_b900._0_8_ * local_b408 + local_b798 * local_b2a0 +
               local_b630 * local_b138;
          dStack_ba30 = (double)local_b900._208_8_ * dStack_b4b8 + auVar151._16_8_ + auVar163._16_8_
                        + (double)local_b900._16_8_ * dStack_b3f8 + dStack_b788 * dStack_b290 +
                        dStack_b620 * dStack_b128;
          dStack_ba28 = (double)local_b900._216_8_ * dStack_b4b0 + auVar151._24_8_ + auVar163._24_8_
                        + (double)local_b900._24_8_ * dStack_b3f0 + dStack_b780 * dStack_b288 +
                        dStack_b618 * dStack_b120;
          auVar151 = vmulpd_avx512vl(local_b900._224_32_,auVar85);
          auVar105._8_8_ = dStack_b1d0;
          auVar105._0_8_ = local_b1d8;
          auVar105._16_8_ = dStack_b1c8;
          auVar105._24_8_ = dStack_b1c0;
          auVar163 = vmulpd_avx512vl(local_b550,auVar105);
          auVar165 = vmulpd_avx512vl(auVar59,local_b3e8);
          auVar166 = vmulpd_avx512vl(auVar69,local_b280);
          auVar167 = vmulpd_avx512vl(auVar77,local_b118);
          local_ba20 = auVar151._0_8_ + auVar164._0_8_ + auVar163._0_8_ + auVar165._0_8_ +
                       auVar166._0_8_ + auVar167._0_8_;
          dStack_ba18 = auVar151._8_8_ + auVar164._8_8_ + auVar163._8_8_ + auVar165._8_8_ +
                        auVar166._8_8_ + auVar167._8_8_;
          dStack_ba10 = auVar151._16_8_ + auVar164._16_8_ + auVar163._16_8_ + auVar165._16_8_ +
                        auVar166._16_8_ + auVar167._16_8_;
          dStack_ba08 = auVar151._24_8_ + auVar164._24_8_ + auVar163._24_8_ + auVar165._24_8_ +
                        auVar166._24_8_ + auVar167._24_8_;
          auVar96._8_8_ = dStack_b318;
          auVar96._0_8_ = local_b320;
          auVar96._16_8_ = dStack_b310;
          auVar96._24_8_ = dStack_b308;
          auVar86._8_8_ = dStack_b480;
          auVar86._0_8_ = local_b488;
          auVar86._16_8_ = dStack_b478;
          auVar86._24_8_ = dStack_b470;
          auVar151 = vmulpd_avx512vl(local_b698,auVar96);
          auVar163 = vmulpd_avx512vl(local_b800,auVar86);
          auVar193._0_8_ = auVar163._0_8_ + auVar151._0_8_;
          auVar193._8_8_ = auVar163._8_8_ + auVar151._8_8_;
          auVar193._16_8_ = auVar163._16_8_ + auVar151._16_8_;
          auVar193._24_8_ = auVar163._24_8_ + auVar151._24_8_;
          auVar106._8_8_ = dStack_b1b0;
          auVar106._0_8_ = local_b1b8;
          auVar106._16_8_ = dStack_b1a8;
          auVar106._24_8_ = dStack_b1a0;
          auVar151 = vmulpd_avx512vl(local_b530,auVar106);
          auVar151 = vaddpd_avx512vl(auVar193,auVar151);
          auVar163 = vmulpd_avx512vl(auVar60,local_b3c8);
          auVar151 = vaddpd_avx512vl(auVar151,auVar163);
          auVar70._8_8_ = dStack_b750;
          auVar70._0_8_ = local_b758;
          auVar70._16_8_ = dStack_b748;
          auVar70._24_8_ = dStack_b740;
          auVar163 = vmulpd_avx512vl(auVar70,local_b260);
          auVar151 = vaddpd_avx512vl(auVar151,auVar163);
          auVar78._8_8_ = dStack_b5e8;
          auVar78._0_8_ = local_b5f0;
          auVar78._16_8_ = dStack_b5e0;
          auVar78._24_8_ = dStack_b5d8;
          auVar163 = vmulpd_avx512vl(auVar78,local_b0f8);
          local_ba00 = auVar151._0_8_ + auVar163._0_8_;
          dStack_b9f8 = auVar151._8_8_ + auVar163._8_8_;
          dStack_b9f0 = auVar151._16_8_ + auVar163._16_8_;
          dStack_b9e8 = auVar151._24_8_ + auVar163._24_8_;
          local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data
          .array[0] = local_bb78->m_Alpha;
          if (((local_bb78->m_kGQ_D0).
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows ==
               0xc) && ((local_bb78->m_kGQ_D0).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_cols == 1)) {
            auVar116._8_8_ =
                 local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage
                 .m_data.array[1];
            auVar116._0_8_ =
                 local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage
                 .m_data.array[0];
            auVar151 = vmulpd_avx512vl(auVar60,local_b800);
            auVar163 = vmulpd_avx512vl(auVar70,local_b698);
            auVar164 = vmulpd_avx512vl(auVar59,local_b900._224_32_);
            auVar165 = vmulpd_avx512vl(auVar69,local_b6b8);
            auVar166 = vmulpd_avx512vl(auVar67,local_b6d8);
            auVar51._8_8_ = dStack_b628;
            auVar51._0_8_ = local_b630;
            auVar51._16_8_ = dStack_b620;
            auVar51._24_8_ = dStack_b618;
            auVar167 = vmulpd_avx512vl(auVar77,local_b550);
            auVar164 = vaddpd_avx512vl(auVar164,auVar165);
            auVar151 = vaddpd_avx512vl(auVar151,auVar163);
            auVar163 = vmulpd_avx512vl(auVar78,local_b530);
            auVar68._8_8_ = dStack_b790;
            auVar68._0_8_ = local_b798;
            auVar68._16_8_ = dStack_b788;
            auVar68._24_8_ = dStack_b780;
            auVar64._8_8_ = local_b900._136_8_;
            auVar64._0_8_ = local_b900._128_8_;
            auVar64._16_8_ = local_b900._144_8_;
            auVar64._24_8_ = local_b900._152_8_;
            auVar151 = vaddpd_avx512vl(auVar151,auVar163);
            auVar163 = vaddpd_avx512vl(auVar164,auVar167);
            pdVar125 = (double *)vpextrq_avx(auVar116,1);
            auVar187._8_8_ =
                 local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage
                 .m_data.array[0];
            auVar187._0_8_ =
                 local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage
                 .m_data.array[0];
            auVar187._16_8_ =
                 local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage
                 .m_data.array[0];
            auVar187._24_8_ =
                 local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage
                 .m_data.array[0];
            auVar164 = vmulpd_avx512vl(auVar51,local_b570);
            auVar58._8_8_ = local_b900._8_8_;
            auVar58._0_8_ = local_b900._0_8_;
            auVar58._16_8_ = local_b900._16_8_;
            auVar58._24_8_ = local_b900._24_8_;
            auVar165 = vmulpd_avx512vl(auVar187,*(undefined1 (*) [32])(pdVar125 + 8));
            auVar167 = vmulpd_avx512vl(auVar187,*(undefined1 (*) [32])(pdVar125 + 4));
            pdVar38 = (local_bb78->m_kGQ_D0).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_data;
            auVar163 = vaddpd_avx512vl(auVar163,auVar167);
            auVar151 = vaddpd_avx512vl(auVar151,auVar165);
            _local_aa00 = vmulpd_avx512vl(auVar151,*(undefined1 (*) [32])(pdVar38 + 8));
            auVar62._8_8_ = local_b900._104_8_;
            auVar62._0_8_ = local_b900._96_8_;
            auVar62._16_8_ = local_b900._112_8_;
            auVar62._24_8_ = local_b900._120_8_;
            auVar72._8_8_ = dStack_b730;
            auVar72._0_8_ = local_b738;
            auVar72._16_8_ = dStack_b728;
            auVar72._24_8_ = dStack_b720;
            auVar151 = vmulpd_avx512vl(auVar163,*(undefined1 (*) [32])(pdVar38 + 4));
            auVar79._8_8_ = dStack_b5c8;
            auVar79._0_8_ = local_b5d0;
            auVar79._16_8_ = dStack_b5c0;
            auVar79._24_8_ = dStack_b5b8;
            auVar84._8_8_ = dStack_b4c0;
            auVar84._0_8_ = local_b4c8;
            auVar84._16_8_ = dStack_b4b8;
            auVar84._24_8_ = dStack_b4b0;
            auVar163 = vmulpd_avx512vl(auVar62,auVar84);
            auVar94._8_8_ = dStack_b358;
            auVar94._0_8_ = local_b360;
            auVar94._16_8_ = dStack_b350;
            auVar94._24_8_ = dStack_b348;
            auVar165 = vmulpd_avx512vl(auVar72,auVar94);
            dVar9 = *(double *)
                     ((long)(peVar35->m_D0).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                            m_data.array + 0x20);
            auVar163 = vaddpd_avx512vl(auVar163,auVar165);
            auVar104._8_8_ = dStack_b1f0;
            auVar104._0_8_ = local_b1f8;
            auVar104._16_8_ = dStack_b1e8;
            auVar104._24_8_ = dStack_b1e0;
            auVar165 = vmulpd_avx512vl(auVar79,auVar104);
            auVar163 = vaddpd_avx512vl(auVar163,auVar165);
            auVar88._8_8_ = dStack_b460;
            auVar88._0_8_ = local_b468;
            auVar88._16_8_ = dStack_b458;
            auVar88._24_8_ = dStack_b450;
            auVar165 = vmulpd_avx512vl(auVar58,auVar88);
            auVar76._8_8_ = dStack_b6f0;
            auVar76._0_8_ = local_b6f8;
            auVar76._16_8_ = dStack_b6e8;
            auVar76._24_8_ = dStack_b6e0;
            auVar163 = vaddpd_avx512vl(auVar163,auVar165);
            auVar98._8_8_ = dStack_b2f8;
            auVar98._0_8_ = local_b300;
            auVar98._16_8_ = dStack_b2f0;
            auVar98._24_8_ = dStack_b2e8;
            auVar165 = vmulpd_avx512vl(auVar68,auVar98);
            auVar163 = vaddpd_avx512vl(auVar163,auVar165);
            auVar108._8_8_ = dStack_b190;
            auVar108._0_8_ = local_b198;
            auVar108._16_8_ = dStack_b188;
            auVar108._24_8_ = dStack_b180;
            auVar165 = vmulpd_avx512vl(auVar51,auVar108);
            auVar66._8_8_ = local_b900._168_8_;
            auVar66._0_8_ = local_b900._160_8_;
            auVar66._16_8_ = local_b900._176_8_;
            auVar66._24_8_ = local_b900._184_8_;
            _local_ba40 = vaddpd_avx512vl(auVar163,auVar165);
            auVar163 = vmulpd_avx512vl(auVar64,auVar85);
            auVar74._8_8_ = dStack_b710;
            auVar74._0_8_ = local_b718;
            auVar74._16_8_ = dStack_b708;
            auVar74._24_8_ = dStack_b700;
            auVar165 = vmulpd_avx512vl(auVar74,auVar95);
            auVar81._8_8_ = dStack_b5a8;
            auVar81._0_8_ = local_b5b0;
            auVar81._16_8_ = dStack_b5a0;
            auVar81._24_8_ = dStack_b598;
            auVar163 = vaddpd_avx512vl(auVar163,auVar165);
            auVar165 = vmulpd_avx512vl(auVar76,auVar96);
            auVar92._8_8_ = dStack_b420;
            auVar92._0_8_ = local_b428;
            auVar92._16_8_ = dStack_b418;
            auVar92._24_8_ = dStack_b410;
            auVar167 = vmulpd_avx512vl(auVar60,auVar92);
            auVar168 = vmulpd_avx512vl(auVar81,auVar105);
            auVar90._8_8_ = dStack_b440;
            auVar90._0_8_ = local_b448;
            auVar90._16_8_ = dStack_b438;
            auVar90._24_8_ = dStack_b430;
            auVar169 = vmulpd_avx512vl(auVar59,auVar90);
            auVar100._8_8_ = dStack_b2d8;
            auVar100._0_8_ = local_b2e0;
            auVar100._16_8_ = dStack_b2d0;
            auVar100._24_8_ = dStack_b2c8;
            auVar170 = vmulpd_avx512vl(auVar69,auVar100);
            auVar110._8_8_ = dStack_b170;
            auVar110._0_8_ = local_b178;
            auVar110._16_8_ = dStack_b168;
            auVar110._24_8_ = dStack_b160;
            auVar171 = vmulpd_avx512vl(auVar77,auVar110);
            local_ba20 = auVar163._0_8_ + auVar168._0_8_ + auVar169._0_8_ + auVar170._0_8_ +
                         auVar171._0_8_;
            dStack_ba18 = auVar163._8_8_ + auVar168._8_8_ + auVar169._8_8_ + auVar170._8_8_ +
                          auVar171._8_8_;
            dStack_ba10 = auVar163._16_8_ + auVar168._16_8_ + auVar169._16_8_ + auVar170._16_8_ +
                          auVar171._16_8_;
            dStack_ba08 = auVar163._24_8_ + auVar168._24_8_ + auVar169._24_8_ + auVar170._24_8_ +
                          auVar171._24_8_;
            auVar163 = vmulpd_avx512vl(auVar66,auVar86);
            auVar163 = vaddpd_avx512vl(auVar163,auVar165);
            auVar83._8_8_ = dStack_b588;
            auVar83._0_8_ = local_b590;
            auVar83._16_8_ = dStack_b580;
            auVar83._24_8_ = dStack_b578;
            auVar165 = vmulpd_avx512vl(auVar83,auVar106);
            auVar102._8_8_ = dStack_b2b8;
            auVar102._0_8_ = local_b2c0;
            auVar102._16_8_ = dStack_b2b0;
            auVar102._24_8_ = dStack_b2a8;
            auVar168 = vmulpd_avx512vl(auVar70,auVar102);
            auVar112._8_8_ = dStack_b150;
            auVar112._0_8_ = local_b158;
            auVar112._16_8_ = dStack_b148;
            auVar112._24_8_ = dStack_b140;
            auVar169 = vmulpd_avx512vl(auVar78,auVar112);
            local_ba00 = auVar163._0_8_ + auVar165._0_8_ + auVar167._0_8_ + auVar168._0_8_ +
                         auVar169._0_8_;
            dStack_b9f8 = auVar163._8_8_ + auVar165._8_8_ + auVar167._8_8_ + auVar168._8_8_ +
                          auVar169._8_8_;
            dStack_b9f0 = auVar163._16_8_ + auVar165._16_8_ + auVar167._16_8_ + auVar168._16_8_ +
                          auVar169._16_8_;
            dStack_b9e8 = auVar163._24_8_ + auVar165._24_8_ + auVar167._24_8_ + auVar168._24_8_ +
                          auVar169._24_8_;
            if (((local_bb78->m_kGQ_D0).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
                 == 0xc) &&
               ((local_bb78->m_kGQ_D0).
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols ==
                1)) {
              if (((local_bb78->m_kGQ_Dv).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
                   != 3) ||
                 ((local_bb78->m_kGQ_Dv).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
                  != 1)) {
                pcVar127 = 
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, 3, 1>>, SrcXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, -1, -1>>, Functor = Eigen::internal::mul_assign_op<double>]"
                ;
                goto LAB_00721a9f;
              }
              uVar122 = (local_bb78->m_SD).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_cols;
              if (0xb < (long)uVar122) {
                auVar207._0_8_ =
                     (auVar150._0_8_ + auVar149._0_8_ + local_b5d0 * local_b570._0_8_ +
                     (double)ppVar7 * *pdVar124) * *pdVar131 * dVar8;
                auVar207._8_8_ =
                     (auVar150._8_8_ + auVar149._8_8_ + dStack_b5c8 * local_b570._8_8_ +
                     (double)ppVar7 * pdVar124[1]) * pdVar131[1] * dVar8;
                auVar207._16_8_ =
                     (auVar150._16_8_ + auVar149._16_8_ + dStack_b5c0 * local_b570._16_8_ +
                     (double)ppVar7 * pdVar124[2]) * pdVar131[2] * dVar8;
                auVar207._24_8_ =
                     (auVar150._24_8_ + auVar149._24_8_ + dStack_b5b8 * local_b570._24_8_ +
                     (double)ppVar7 * pdVar124[3]) * pdVar131[3] * dVar8;
                auVar209._0_8_ =
                     dVar8 * (auVar162._0_8_ + auVar161._0_8_ + auVar148._0_8_ +
                             (double)ppVar7 * pdVar124[4]) * pdVar131[4];
                auVar209._8_8_ =
                     dVar8 * (auVar162._8_8_ + auVar161._8_8_ + auVar148._8_8_ +
                             (double)ppVar7 * pdVar124[5]) * pdVar131[5];
                auVar209._16_8_ =
                     dVar8 * (auVar162._16_8_ + auVar161._16_8_ + auVar148._16_8_ +
                             (double)ppVar7 * pdVar124[6]) * pdVar131[6];
                auVar209._24_8_ =
                     dVar8 * (auVar162._24_8_ + auVar161._24_8_ + auVar148._24_8_ +
                             (double)ppVar7 * pdVar124[7]) * pdVar131[7];
                auVar210._0_8_ =
                     dVar8 * (auVar156._0_8_ + auVar159._0_8_ + auVar160._0_8_ +
                             (double)ppVar7 * pdVar124[8]) * pdVar131[8];
                auVar210._8_8_ =
                     dVar8 * (auVar156._8_8_ + auVar159._8_8_ + auVar160._8_8_ +
                             (double)ppVar7 * pdVar124[9]) * pdVar131[9];
                auVar210._16_8_ =
                     dVar8 * (auVar156._16_8_ + auVar159._16_8_ + auVar160._16_8_ +
                             (double)ppVar7 * pdVar124[10]) * pdVar131[10];
                auVar210._24_8_ =
                     dVar8 * (auVar156._24_8_ + auVar159._24_8_ + auVar160._24_8_ +
                             (double)ppVar7 * pdVar124[0xb]) * pdVar131[0xb];
                auVar213._0_8_ = auVar151._0_8_ * dVar9;
                auVar213._8_8_ = auVar151._8_8_ * dVar9;
                auVar213._16_8_ = auVar151._16_8_ * dVar9;
                auVar213._24_8_ = auVar151._24_8_ * dVar9;
                auVar212._0_8_ =
                     (auVar164._0_8_ +
                      auVar166._0_8_ + (double)local_b900._192_8_ * (double)local_b900._0_8_ +
                     local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                     m_storage.m_data.array[0] * *pdVar125) * *pdVar38 * dVar9;
                auVar212._8_8_ =
                     (auVar164._8_8_ +
                      auVar166._8_8_ + (double)local_b900._200_8_ * (double)local_b900._8_8_ +
                     local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                     m_storage.m_data.array[0] * pdVar125[1]) * pdVar38[1] * dVar9;
                auVar212._16_8_ =
                     (auVar164._16_8_ +
                      auVar166._16_8_ + (double)local_b900._208_8_ * (double)local_b900._16_8_ +
                     local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                     m_storage.m_data.array[0] * pdVar125[2]) * pdVar38[2] * dVar9;
                auVar212._24_8_ =
                     (auVar164._24_8_ +
                      auVar166._24_8_ + (double)local_b900._216_8_ * (double)local_b900._24_8_ +
                     local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                     m_storage.m_data.array[0] * pdVar125[3]) * pdVar38[3] * dVar9;
                auVar215._0_8_ = dVar9 * (double)local_aa00;
                auVar215._8_8_ = dVar9 * dStack_a9f8;
                auVar215._16_8_ = dVar9 * dStack_a9f0;
                auVar215._24_8_ = dVar9 * dStack_a9e8;
                auVar156 = vmulpd_avx512vl(auVar60,auVar66);
                auVar159 = vmulpd_avx512vl(auVar70,auVar76);
                auVar160 = vmulpd_avx512vl(auVar78,auVar83);
                auVar161 = vmulpd_avx512vl(auVar68,auVar72);
                local_b9d0._0_8_ = auVar140._0_8_;
                dVar8 = *(double *)
                         ((long)(peVar35->m_D0).
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array + 0x10) * 0.5;
                local_b9e0._0_8_ = auVar137._0_8_;
                uVar134 = 0;
                auVar140 = vmulpd_avx512vl(local_b660,local_b228);
                local_bb00._0_8_ = auVar152._0_8_;
                local_bb00._8_8_ = auVar152._8_8_;
                dStack_baf0 = auVar152._16_8_;
                dStack_bae8 = auVar152._24_8_;
                auVar184._0_8_ = (double)local_b9e0._0_8_ * dVar185;
                auVar184._8_8_ = (double)local_b9e0._0_8_ * dVar189;
                auVar184._16_8_ = (double)local_b9e0._0_8_ * dVar190;
                auVar184._24_8_ = (double)local_b9e0._0_8_ * dVar191;
                auVar188._0_8_ = (double)local_b9e0._0_8_ * dVar198;
                auVar188._8_8_ = (double)local_b9e0._0_8_ * dVar202;
                auVar188._16_8_ = (double)local_b9e0._0_8_ * dVar203;
                auVar188._24_8_ = (double)local_b9e0._0_8_ * dVar204;
                local_a9a0 = auVar155._0_8_;
                dStack_a998 = auVar155._8_8_;
                dStack_a990 = auVar155._16_8_;
                dStack_a988 = auVar155._24_8_;
                auVar194._0_8_ = (double)local_b9e0._0_8_ * (double)local_a9a0;
                auVar194._8_8_ = (double)local_b9e0._0_8_ * dStack_a998;
                auVar194._16_8_ = (double)local_b9e0._0_8_ * dStack_a990;
                auVar194._24_8_ = (double)local_b9e0._0_8_ * dStack_a988;
                auVar152 = vaddpd_avx512vl(auVar156,auVar159);
                auVar152 = vaddpd_avx512vl(auVar152,auVar160);
                auVar117._8_8_ =
                     local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                     m_storage.m_data.array[1];
                auVar117._0_8_ =
                     local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                     m_storage.m_data.array[0];
                auVar137 = vmovdqa64_avx512vl(auVar117);
                pdVar124 = local_a1a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>
                           .m_storage.m_data.array + 0x2c;
                pdVar131 = (local_bb78->m_SD).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_data + 0x2c;
                auVar138 = vmulpd_avx512vl(local_b678,local_b678);
                auVar136 = vmulpd_avx512vl(local_b660,local_b660);
                local_bb00._8_8_ = (double)local_b9d0._0_8_ * (double)local_bb00._8_8_;
                local_bb00._0_8_ = (double)local_b9d0._0_8_ * (double)local_bb00._0_8_;
                dStack_baf0 = (double)local_b9d0._0_8_ * dStack_baf0;
                dStack_bae8 = (double)local_b9d0._0_8_ * dStack_bae8;
                local_ba60._0_8_ = auVar154._0_8_;
                local_ba60._8_8_ = auVar154._8_8_;
                dStack_ba50 = auVar154._16_8_;
                dStack_ba48 = auVar154._24_8_;
                auVar197._0_8_ = dVar8 * (auVar158._0_8_ + (double)ppVar42 * *pdVar123) * *pdVar129;
                auVar197._8_8_ =
                     dVar8 * (auVar158._8_8_ + (double)ppVar42 * pdVar123[1]) * pdVar129[1];
                auVar197._16_8_ =
                     dVar8 * (auVar158._16_8_ + (double)ppVar42 * pdVar123[2]) * pdVar129[2];
                auVar197._24_8_ =
                     dVar8 * (auVar158._24_8_ + (double)ppVar42 * pdVar123[3]) * pdVar129[3];
                auVar201._0_8_ = dVar8 * auVar157._0_8_ * pdVar129[4];
                auVar201._8_8_ = dVar8 * auVar157._8_8_ * pdVar129[5];
                auVar201._16_8_ = dVar8 * auVar157._16_8_ * pdVar129[6];
                auVar201._24_8_ = dVar8 * auVar157._24_8_ * pdVar129[7];
                pauVar126 = auVar137._8_8_;
                auVar154 = vpbroadcastq_avx512vl(auVar137);
                auVar155 = vmulpd_avx512vl(auVar154,pauVar126[2]);
                local_ba60._8_8_ = (double)local_b9d0._0_8_ * (double)local_ba60._8_8_;
                local_ba60._0_8_ = (double)local_b9d0._0_8_ * (double)local_ba60._0_8_;
                dStack_ba50 = (double)local_b9d0._0_8_ * dStack_ba50;
                dStack_ba48 = (double)local_b9d0._0_8_ * dStack_ba48;
                local_ba80._0_8_ = auVar153._0_8_;
                local_ba80._8_8_ = auVar153._8_8_;
                dStack_ba70 = auVar153._16_8_;
                dStack_ba68 = auVar153._24_8_;
                auVar152 = vaddpd_avx512vl(auVar152,auVar155);
                auVar153 = vmulpd_avx512vl(auVar59,auVar64);
                auVar155 = vmulpd_avx512vl(auVar69,auVar74);
                auVar153 = vaddpd_avx512vl(auVar153,auVar155);
                auVar155 = vmulpd_avx512vl(auVar77,auVar81);
                auVar12._8_8_ = 0;
                auVar12._0_8_ = local_b230;
                auVar225._8_8_ = 0;
                auVar225._0_8_ = local_b668;
                auVar137 = vmulsd_avx512f(auVar225,auVar12);
                auVar13._8_8_ = 0;
                auVar13._0_8_ = local_b218;
                auVar239._8_8_ = 0;
                auVar239._0_8_ = local_b650;
                auVar139 = vmulsd_avx512f(auVar239,auVar13);
                auVar153 = vaddpd_avx512vl(auVar153,auVar155);
                auVar155 = vmulpd_avx512vl(auVar154,pauVar126[1]);
                auVar154 = vmulpd_avx512vl(auVar154,*pauVar126);
                pauVar126 = (undefined1 (*) [32])
                            (local_bb78->m_kGQ_D0).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_data;
                local_ba80._8_8_ = (double)local_b9d0._0_8_ * (double)local_ba80._8_8_;
                local_ba80._0_8_ = (double)local_b9d0._0_8_ * (double)local_ba80._0_8_;
                dStack_ba70 = (double)local_b9d0._0_8_ * dStack_ba70;
                dStack_ba68 = (double)local_b9d0._0_8_ * dStack_ba68;
                auVar226._8_8_ = 0;
                auVar226._0_8_ = local_b668;
                auVar141 = vmulsd_avx512f(auVar225,auVar226);
                auVar177._0_8_ = auVar152._0_8_ * *(double *)pauVar126[2];
                auVar177._8_8_ = auVar152._8_8_ * *(double *)(pauVar126[2] + 8);
                auVar177._16_8_ = auVar152._16_8_ * *(double *)(pauVar126[2] + 0x10);
                auVar177._24_8_ = auVar152._24_8_ * *(double *)(pauVar126[2] + 0x18);
                auVar152 = vaddpd_avx512vl(auVar153,auVar155);
                auVar153 = vmulpd_avx512vl(auVar62,auVar58);
                auVar152 = vmulpd_avx512vl(auVar152,pauVar126[1]);
                auVar153 = vaddpd_avx512vl(auVar153,auVar161);
                auVar52._8_8_ = dStack_b628;
                auVar52._0_8_ = local_b630;
                auVar52._16_8_ = dStack_b620;
                auVar52._24_8_ = dStack_b618;
                auVar155 = vmulpd_avx512vl(auVar79,auVar52);
                auVar153 = vaddpd_avx512vl(auVar153,auVar155);
                auVar153 = vaddpd_avx512vl(auVar153,auVar154);
                auVar153 = vmulpd_avx512vl(auVar153,*pauVar126);
                auVar14._8_8_ = 0;
                auVar14._0_8_ =
                     *(double *)
                      ((long)(peVar35->m_D0).
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                             m_data.array + 0x28);
                auVar154 = vbroadcastsd_avx512vl(auVar14);
                pauVar39 = (undefined1 (*) [16])
                           (local_bb78->m_kGQ_Dv).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_data;
                auVar152 = vmulpd_avx512vl(auVar154,auVar152);
                auVar153 = vmulpd_avx512vl(auVar153,auVar154);
                auVar154 = vmulpd_avx512vl(auVar154,auVar177);
                auVar173._8_8_ = 0;
                auVar173._0_8_ = local_b7d0;
                auVar15._8_8_ = 0;
                auVar15._0_8_ = local_b398;
                auVar142 = vmulsd_avx512f(auVar173,auVar15);
                auVar137 = vaddsd_avx512f(auVar142,auVar137);
                auVar174._8_8_ = 0;
                auVar174._0_8_ = local_b7d0 * local_b7d0;
                auVar141 = vaddsd_avx512f(auVar174,auVar141);
                auVar16._8_8_ = 0;
                auVar16._0_8_ = local_b0c8;
                auVar231._8_8_ = 0;
                auVar231._0_8_ = local_b500;
                auVar142 = vmulsd_avx512f(auVar231,auVar16);
                auVar232._8_8_ = 0;
                auVar232._0_8_ = local_b500;
                auVar143 = vmulsd_avx512f(auVar231,auVar232);
                auVar141 = vaddsd_avx512f(auVar141,auVar143);
                auVar17._8_8_ = 0;
                auVar17._0_8_ = local_bb78->m_Alpha;
                auVar143 = vmovddup_avx512vl(auVar17);
                auVar137 = vaddsd_avx512f(auVar137,auVar142);
                auVar137 = vmulsd_avx512f(auVar143,auVar137);
                auVar175._8_8_ = 0;
                auVar175._0_8_ = (auVar141._0_8_ + -1.0) * 0.5;
                auVar137 = vaddsd_avx512f(auVar137,auVar175);
                auVar141 = vmulpd_avx512vl(local_b7e0,local_b7e0);
                auVar176._0_8_ = local_b7e0._0_8_ * local_b3a8;
                auVar176._8_8_ = local_b7e0._8_8_ * dStack_b3a0;
                auVar138 = vaddpd_avx512vl(auVar141,auVar138);
                auVar141 = vmulpd_avx512vl(local_b510,local_b510);
                auVar138 = vaddpd_avx512vl(auVar138,auVar141);
                auVar141 = vmulpd_avx512vl(local_b678,local_b240);
                auVar142 = vmovddup_avx512vl(ZEXT816(0x3fe0000000000000));
                auVar141 = vaddpd_avx512vl(auVar176,auVar141);
                auVar144 = vmulpd_avx512vl(local_b510,local_b0d8);
                auVar141 = vaddpd_avx512vl(auVar141,auVar144);
                auVar144 = vmovddup_avx512vl(ZEXT816(0xbff0000000000000));
                auVar141 = vmulpd_avx512vl(auVar143,auVar141);
                auVar138 = vaddpd_avx512vl(auVar138,auVar144);
                auVar138 = vmulpd_avx512vl(auVar138,auVar142);
                auVar138 = vaddpd_avx512vl(auVar138,auVar141);
                auVar141 = vmulpd_avx512vl(local_b7c8,local_b390);
                local_baa0 = auVar138._0_4_;
                uStack_ba9c = auVar138._4_4_;
                dStack_ba98 = auVar138._8_8_;
                auVar145 = vmulpd_avx512vl(local_b7c8,local_b7c8);
                auVar140 = vaddpd_avx512vl(auVar141,auVar140);
                auVar136 = vaddpd_avx512vl(auVar145,auVar136);
                auVar141 = vmulpd_avx512vl(local_b4f8,local_b0c0);
                auVar145 = vmulpd_avx512vl(local_b4f8,local_b4f8);
                auVar240._8_8_ = 0;
                auVar240._0_8_ = local_b650;
                auVar146 = vmulsd_avx512f(auVar239,auVar240);
                auVar140 = vaddpd_avx512vl(auVar140,auVar141);
                auVar136 = vaddpd_avx512vl(auVar136,auVar145);
                auVar18._8_8_ = 0;
                auVar18._0_8_ = local_b380;
                auVar235._8_8_ = 0;
                auVar235._0_8_ = local_b7b8;
                auVar141 = vmulsd_avx512f(auVar235,auVar18);
                auVar136 = vaddpd_avx512vl(auVar136,auVar144);
                auVar140 = vmulpd_avx512vl(auVar143,auVar140);
                auVar136 = vmulpd_avx512vl(auVar136,auVar142);
                auVar236._8_8_ = 0;
                auVar236._0_8_ = local_b7b8;
                auVar145 = vmulsd_avx512f(auVar235,auVar236);
                auVar136 = vaddpd_avx512vl(auVar136,auVar140);
                auVar140 = vaddsd_avx512f(auVar141,auVar139);
                auVar139 = vaddsd_avx512f(auVar145,auVar146);
                auVar19._8_8_ = 0;
                auVar19._0_8_ = local_b0b0;
                auVar243._8_8_ = 0;
                auVar243._0_8_ = local_b4e8;
                auVar141 = vmulsd_avx512f(auVar243,auVar19);
                auVar244._8_8_ = 0;
                auVar244._0_8_ = local_b4e8;
                auVar145 = vmulsd_avx512f(auVar243,auVar244);
                auVar20._8_8_ = 0;
                auVar20._0_8_ = local_b200;
                auVar245._8_8_ = 0;
                auVar245._0_8_ = local_b638;
                auVar146 = vmulsd_avx512f(auVar245,auVar20);
                auVar139 = vaddsd_avx512f(auVar139,auVar145);
                auVar140 = vaddsd_avx512f(auVar140,auVar141);
                auVar141 = vmulpd_avx512vl(local_b648,local_b210);
                auVar139 = vaddsd_avx512f(auVar139,ZEXT816(0xbff0000000000000));
                auVar140 = vmulsd_avx512f(auVar143,auVar140);
                auVar139 = vmulsd_avx512f(auVar139,ZEXT816(0x3fe0000000000000));
                auVar139 = vaddsd_avx512f(auVar140,auVar139);
                auVar140 = vmulpd_avx512vl(local_b7b0,local_b378);
                auVar140 = vaddpd_avx512vl(auVar140,auVar141);
                auVar141 = vmulpd_avx512vl(local_b4e0,local_b0a8);
                auVar140 = vaddpd_avx512vl(auVar140,auVar141);
                auVar21._8_8_ = 0;
                auVar21._0_8_ = local_b368;
                auVar237._8_8_ = 0;
                auVar237._0_8_ = local_b7a0;
                auVar141 = vmulsd_avx512f(auVar237,auVar21);
                auVar141 = vaddsd_avx512f(auVar141,auVar146);
                auVar22._8_8_ = 0;
                auVar22._0_8_ = local_b098;
                auVar241._8_8_ = 0;
                auVar241._0_8_ = local_b4d0;
                auVar145 = vmulsd_avx512f(auVar241,auVar22);
                auVar141 = vaddsd_avx512f(auVar141,auVar145);
                auVar145 = vmulpd_avx512vl(local_b7b0,local_b7b0);
                auVar146 = vmulpd_avx512vl(local_b648,local_b648);
                auVar246._8_8_ = 0;
                auVar246._0_8_ = local_b638;
                auVar147 = vmulsd_avx512f(auVar245,auVar246);
                auVar145 = vaddpd_avx512vl(auVar145,auVar146);
                auVar146 = vmulpd_avx512vl(local_b4e0,local_b4e0);
                auVar141 = vmulsd_avx512f(auVar143,auVar141);
                auVar145 = vaddpd_avx512vl(auVar145,auVar146);
                auVar238._8_8_ = 0;
                auVar238._0_8_ = local_b7a0;
                auVar146 = vmulsd_avx512f(auVar237,auVar238);
                auVar146 = vaddsd_avx512f(auVar146,auVar147);
                auVar242._8_8_ = 0;
                auVar242._0_8_ = local_b4d0;
                auVar147 = vmulsd_avx512f(auVar241,auVar242);
                auVar144 = vaddpd_avx512vl(auVar145,auVar144);
                auVar145 = vaddsd_avx512f(auVar146,auVar147);
                auVar142 = vmulpd_avx512vl(auVar144,auVar142);
                auVar143 = vmulpd_avx512vl(auVar143,auVar140);
                auVar140 = *pauVar39;
                auVar144 = vaddsd_avx512f(auVar145,ZEXT816(0xbff0000000000000));
                auVar142 = vaddpd_avx512vl(auVar142,auVar143);
                auVar143 = vmulsd_avx512f(auVar144,ZEXT816(0x3fe0000000000000));
                auVar136 = vmulpd_avx512vl(auVar140,auVar136);
                auVar142 = vmulpd_avx512vl(auVar140,auVar142);
                auVar55._8_8_ = ppMStack_b978;
                auVar55._0_8_ = local_b980;
                auVar144 = vmulpd_avx512vl(auVar136,auVar55);
                auVar141 = vaddsd_avx512f(auVar141,auVar143);
                auVar140 = vmulpd_avx512vl(auVar140,auVar138);
                uVar128 = *(ulong *)pauVar39[1];
                uVar40 = (local_bb78->m_SD).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                         m_rows;
                auVar227._8_8_ = 0;
                auVar227._0_8_ = uVar128;
                auVar138 = vmulsd_avx512f(auVar227,auVar139);
                auVar139 = vmulsd_avx512f(auVar227,auVar141);
                auVar141 = vmulpd_avx512vl(auVar136,local_b930);
                auVar56._8_8_ = dStack_b918;
                auVar56._0_8_ = local_b920;
                auVar143 = vmulpd_avx512vl(auVar140,auVar56);
                auVar228._8_8_ = 0;
                auVar228._0_8_ = uVar128;
                auVar137 = vmulsd_avx512f(auVar137,auVar228);
                auVar23._8_8_ = 0;
                auVar23._0_8_ = local_bad0._0_8_;
                auVar145 = vmulsd_avx512f(auVar138,auVar23);
                auVar136 = vmulpd_avx512vl(auVar136,local_b9c0);
                auVar24._8_8_ = 0;
                auVar24._0_8_ = local_bb40;
                auVar146 = vmulsd_avx512f(auVar138,auVar24);
                auVar25._8_8_ = 0;
                auVar25._0_8_ = local_b950._0_8_;
                auVar147 = vmulsd_avx512f(auVar139,auVar25);
                auVar141 = vaddpd_avx512vl(auVar143,auVar141);
                auVar57._8_8_ = dStack_b908;
                auVar57._0_8_ = local_b910;
                auVar143 = vmulpd_avx512vl(auVar142,auVar57);
                auVar141 = vaddpd_avx512vl(auVar141,auVar143);
                auVar26._8_8_ = 0;
                auVar26._0_8_ = local_bb60._0_8_;
                auVar143 = vmulsd_avx512f(auVar137,auVar26);
                auVar143 = vaddsd_avx512f(auVar143,auVar145);
                auVar27._8_8_ = 0;
                auVar27._0_8_ = local_bb50._0_8_;
                auVar145 = vmulsd_avx512f(auVar139,auVar27);
                auVar143 = vaddsd_avx512f(auVar143,auVar145);
                auVar145 = vmulpd_avx512vl(auVar140,local_b970);
                auVar53._8_8_ = dStack_b9a8;
                auVar53._0_8_ = local_b9b0;
                auVar140 = vmulpd_avx512vl(auVar140,auVar53);
                auVar140 = vaddpd_avx512vl(auVar140,auVar136);
                auVar54._8_8_ = dStack_b998;
                auVar54._0_8_ = local_b9a0;
                auVar136 = vmulpd_avx512vl(auVar142,auVar54);
                auVar144 = vaddpd_avx512vl(auVar145,auVar144);
                auVar142 = vmulpd_avx512vl(auVar142,local_b960);
                auVar28._8_8_ = 0;
                auVar28._0_8_ = local_b990._0_8_;
                auVar138 = vmulsd_avx512f(auVar138,auVar28);
                auVar140 = vaddpd_avx512vl(auVar140,auVar136);
                auVar29._8_8_ = 0;
                auVar29._0_8_ = local_bb30;
                auVar136 = vmulsd_avx512f(auVar137,auVar29);
                auVar142 = vaddpd_avx512vl(auVar144,auVar142);
                auVar30._8_8_ = 0;
                auVar30._0_8_ = local_b940._0_8_;
                auVar137 = vmulsd_avx512f(auVar137,auVar30);
                auVar138 = vaddsd_avx512f(auVar136,auVar138);
                auVar31._8_8_ = 0;
                auVar31._0_8_ = local_bb70;
                auVar136 = vmulsd_avx512f(auVar139,auVar31);
                auVar137 = vaddsd_avx512f(auVar137,auVar146);
                auVar137 = vaddsd_avx512f(auVar137,auVar147);
                auVar138 = vaddsd_avx512f(auVar138,auVar136);
                while ((((~((long)uVar40 >> 0x3f) & uVar40) != uVar134 && (0x17 < uVar122)) &&
                       (0x23 < uVar122))) {
                  auVar155 = vmulpd_avx512vl(auVar153,*(undefined1 (*) [32])(pdVar131 + -0x20));
                  auVar156 = vmulpd_avx512vl(_local_bb00,*(undefined1 (*) [32])(pdVar131 + -0x2c));
                  auVar155 = vaddpd_avx512vl(auVar156,auVar155);
                  auVar156 = vmulpd_avx512vl(auVar212,*(undefined1 (*) [32])(pdVar131 + -0x14));
                  auVar155 = vaddpd_avx512vl(auVar155,auVar156);
                  *(undefined1 (*) [32])
                   ((plain_array<double,_405,_1,_0> *)(pdVar124 + -0x2c))->array = auVar155;
                  auVar155 = vmulpd_avx512vl(_local_ba60,*(undefined1 (*) [32])(pdVar131 + -0x28));
                  auVar156 = vmulpd_avx512vl(auVar152,*(undefined1 (*) [32])(pdVar131 + -0x1c));
                  auVar155 = vaddpd_avx512vl(auVar155,auVar156);
                  auVar156 = vmulpd_avx512vl(auVar213,*(undefined1 (*) [32])(pdVar131 + -0x10));
                  auVar155 = vaddpd_avx512vl(auVar155,auVar156);
                  *(undefined1 (*) [32])(pdVar124 + -0x28) = auVar155;
                  auVar155 = vmulpd_avx512vl(_local_ba80,*(undefined1 (*) [32])(pdVar131 + -0x24));
                  auVar156 = vmulpd_avx512vl(auVar154,*(undefined1 (*) [32])(pdVar131 + -0x18));
                  auVar180._0_8_ = auVar215._0_8_ * pdVar131[-0xc];
                  auVar180._8_8_ = auVar215._8_8_ * pdVar131[-0xb];
                  auVar180._16_8_ = auVar215._16_8_ * pdVar131[-10];
                  auVar180._24_8_ = auVar215._24_8_ * pdVar131[-9];
                  auVar155 = vaddpd_avx512vl(auVar155,auVar156);
                  auVar155 = vaddpd_avx512vl(auVar155,auVar180);
                  *(undefined1 (*) [32])(pdVar124 + -0x24) = auVar155;
                  if ((long)uVar40 <= (long)uVar134) break;
                  auVar155 = *(undefined1 (*) [32])(pdVar131 + -0x2c);
                  auVar156 = *(undefined1 (*) [32])(pdVar131 + -0x20);
                  auVar157 = *(undefined1 (*) [32])(pdVar131 + -0x14);
                  auVar158 = vmulpd_avx512vl(auVar153,auVar155);
                  auVar159 = vmulpd_avx512vl(auVar184,auVar156);
                  auVar158 = vaddpd_avx512vl(auVar158,auVar159);
                  auVar159 = vmulpd_avx512vl(auVar207,auVar157);
                  auVar158 = vaddpd_avx512vl(auVar158,auVar159);
                  *(undefined1 (*) [32])(pdVar124 + -0x20) = auVar158;
                  auVar158 = *(undefined1 (*) [32])(pdVar131 + -0x28);
                  auVar159 = *(undefined1 (*) [32])(pdVar131 + -0x1c);
                  auVar160 = *(undefined1 (*) [32])(pdVar131 + -0x10);
                  auVar161 = vmulpd_avx512vl(auVar152,auVar158);
                  auVar162 = vmulpd_avx512vl(auVar188,auVar159);
                  auVar161 = vaddpd_avx512vl(auVar161,auVar162);
                  auVar162 = vmulpd_avx512vl(auVar209,auVar160);
                  auVar161 = vaddpd_avx512vl(auVar161,auVar162);
                  *(undefined1 (*) [32])(pdVar124 + -0x1c) = auVar161;
                  auVar161 = *(undefined1 (*) [32])(pdVar131 + -0x24);
                  auVar162 = *(undefined1 (*) [32])(pdVar131 + -0x18);
                  dVar185 = pdVar131[-0xc];
                  dVar189 = pdVar131[-0xb];
                  dVar190 = pdVar131[-10];
                  dVar191 = pdVar131[-9];
                  auVar148 = vmulpd_avx512vl(auVar154,auVar161);
                  auVar149 = vmulpd_avx512vl(auVar194,auVar162);
                  auVar156 = vmulpd_avx512vl(auVar207,auVar156);
                  pdVar124[-0x18] = auVar148._0_8_ + auVar149._0_8_ + auVar210._0_8_ * dVar185;
                  pdVar124[-0x17] = auVar148._8_8_ + auVar149._8_8_ + auVar210._8_8_ * dVar189;
                  pdVar124[-0x16] = auVar148._16_8_ + auVar149._16_8_ + auVar210._16_8_ * dVar190;
                  pdVar124[-0x15] = auVar148._24_8_ + auVar149._24_8_ + auVar210._24_8_ * dVar191;
                  auVar155 = vmulpd_avx512vl(auVar212,auVar155);
                  auVar157 = vmulpd_avx512vl(auVar197,auVar157);
                  auVar159 = vmulpd_avx512vl(auVar209,auVar159);
                  pdVar124[-0x14] = auVar155._0_8_ + auVar156._0_8_ + auVar157._0_8_;
                  pdVar124[-0x13] = auVar155._8_8_ + auVar156._8_8_ + auVar157._8_8_;
                  pdVar124[-0x12] = auVar155._16_8_ + auVar156._16_8_ + auVar157._16_8_;
                  pdVar124[-0x11] = auVar155._24_8_ + auVar156._24_8_ + auVar157._24_8_;
                  auVar155 = vmulpd_avx512vl(auVar213,auVar158);
                  auVar156 = vmulpd_avx512vl(auVar201,auVar160);
                  auVar157 = vmulpd_avx512vl(auVar210,auVar162);
                  pdVar124[-0x10] = auVar155._0_8_ + auVar159._0_8_ + auVar156._0_8_;
                  pdVar124[-0xf] = auVar155._8_8_ + auVar159._8_8_ + auVar156._8_8_;
                  pdVar124[-0xe] = auVar155._16_8_ + auVar159._16_8_ + auVar156._16_8_;
                  pdVar124[-0xd] = auVar155._24_8_ + auVar159._24_8_ + auVar156._24_8_;
                  auVar155 = vmulpd_avx512vl(auVar215,auVar161);
                  pdVar124[-0xc] =
                       auVar155._0_8_ + auVar157._0_8_ + dVar8 * (double)local_a9c0._0_8_ * dVar185;
                  pdVar124[-0xb] =
                       auVar155._8_8_ + auVar157._8_8_ + dVar8 * (double)local_a9c0._8_8_ * dVar189;
                  pdVar124[-10] = auVar155._16_8_ + auVar157._16_8_ + dVar8 * dStack_a9b0 * dVar190;
                  pdVar124[-9] = auVar155._24_8_ + auVar157._24_8_ + dVar8 * dStack_a9a8 * dVar191;
                  if ((long)uVar122 < 0x27) goto LAB_00721a68;
                  dVar185 = pdVar131[-7];
                  pdVar124[-8] = auVar141._0_8_ * pdVar131[-8];
                  pdVar124[-7] = auVar141._8_8_ * dVar185;
                  auVar32._8_8_ = 0;
                  auVar32._0_8_ = pdVar131[-6];
                  auVar136 = vmulsd_avx512f(auVar143,auVar32);
                  pdVar124[-6] = auVar136._0_8_;
                  if ((long)uVar122 < 0x2a) goto LAB_00721a68;
                  auVar136 = vmulpd_avx512vl(auVar142,*(undefined1 (*) [16])(pdVar131 + -5));
                  *(undefined1 (*) [16])(pdVar124 + -5) = auVar136;
                  auVar33._8_8_ = 0;
                  auVar33._0_8_ = pdVar131[-3];
                  auVar136 = vmulsd_avx512f(auVar137,auVar33);
                  pdVar124[-3] = auVar136._0_8_;
                  if ((long)uVar122 < 0x2d) goto LAB_00721a68;
                  auVar136 = vmulpd_avx512vl(auVar140,*(undefined1 (*) [16])(pdVar131 + -2));
                  uVar134 = uVar134 + 1;
                  *(undefined1 (*) [16])(pdVar124 + -2) = auVar136;
                  auVar34._8_8_ = 0;
                  auVar34._0_8_ = *pdVar131;
                  auVar136 = vmulsd_avx512f(auVar138,auVar34);
                  pdVar131 = pdVar131 + uVar122;
                  *pdVar124 = auVar136._0_8_;
                  pdVar124 = pdVar124 + 0x2d;
                  if (uVar134 == 9) {
                    local_baa0 = 9;
                    pdVar129 = (double *)&local_a1a0;
                    auVar118._8_8_ = 0;
                    auVar118._0_8_ = local_bb50._8_8_;
                    local_bb50 = auVar118 << 0x40;
                    lVar132 = 0;
                    dVar185 = 0.0;
                    local_bb70 = 7.90505033345994e-323;
                    local_bb60._0_8_ = 8;
                    uVar120 = 0;
                    local_aff0 = (Matrix<double,_27,_81,_1,_27,_81> *)
                                 ((double)local_bac0 *
                                 (local_bb78->m_MassMatrix).
                                 super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                                 m_storage.m_data.array[0]);
                    TStack_afe8.m_matrix =
                         (non_const_type)
                         ((double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[1]);
                    local_afe0[0] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[2];
                    local_afe0[1] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[3];
                    local_afe0[2] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[4];
                    local_afe0[3] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[5];
                    local_afe0[4] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[6];
                    local_afe0[5] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[7];
                    local_afe0[6] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[8];
                    local_afe0[7] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[9];
                    local_afe0[8] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[10];
                    local_afe0[9] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0xb];
                    local_afe0[10] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0xc];
                    local_afe0[0xb] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0xd];
                    local_afe0[0xc] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0xe];
                    local_afe0[0xd] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0xf];
                    local_afe0[0xe] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0x10];
                    local_afe0[0xf] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0x11];
                    local_afe0[0x10] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0x12];
                    local_afe0[0x11] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0x13];
                    local_afe0[0x12] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0x14];
                    local_afe0[0x13] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0x15];
                    local_afe0[0x14] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0x16];
                    local_afe0[0x15] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0x17];
                    local_afe0[0x16] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0x18];
                    local_afe0[0x17] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0x19];
                    local_afe0[0x18] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0x1a];
                    local_afe0[0x19] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0x1b];
                    local_afe0[0x1a] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0x1c];
                    local_afe0[0x1b] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0x1d];
                    local_afe0[0x1c] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0x1e];
                    local_afe0[0x1d] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0x1f];
                    local_afe0[0x1e] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0x20];
                    local_afe0[0x1f] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0x21];
                    local_afe0[0x20] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0x22];
                    local_afe0[0x21] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0x23];
                    local_afe0[0x22] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0x24];
                    local_afe0[0x23] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0x25];
                    local_afe0[0x24] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0x26];
                    local_afe0[0x25] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0x27];
                    local_afe0[0x26] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0x28];
                    local_afe0[0x27] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0x29];
                    local_afe0[0x28] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0x2a];
                    local_afe0[0x29] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0x2b];
                    local_afe0[0x2a] =
                         (double)local_bac0 *
                         (local_bb78->m_MassMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
                         m_data.array[0x2c];
                    do {
                      local_bad0._0_4_ = uVar120;
                      uVar122 = (ulong)uVar120;
                      local_bb30 = (double)(0x2d - uVar122);
                      local_bb40 = &local_aff0 + uVar122;
                      local_bb00._0_8_ = (long)dVar185 * 3;
                      local_ba60._0_8_ = (long)dVar185 * 3 + 1;
                      if (0x2d < uVar122) {
                        local_bb30 = 0.0;
                      }
                      lVar133 = 0;
                      dVar189 = 0.0;
                      local_ba80._0_8_ = (long)dVar185 * 3 + 2;
                      local_bac0 = pdVar129;
                      do {
                        pdVar123 = (local_bb78->m_SD).
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                                   m_storage.m_data;
                        lVar130 = (local_bb78->m_SD).
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                                  m_storage.m_cols;
                        if (lVar130 < 0 && pdVar123 != (double *)0x0) {
                          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                                        ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                                        "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>, Level = 0]"
                                       );
                        }
                        if ((local_bb78->m_SD).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                            m_storage.m_rows <= (long)dVar185) {
                          __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                                        ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                                        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 1, BlockCols = -1, InnerPanel = true]"
                                       );
                        }
                        if (lVar130 < 0) {
                          __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                                        ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                                        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, 1, -1>]"
                                       );
                        }
                        if (lVar130 != 0x2d) {
                          pcVar127 = 
                          "Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 1, -1>>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>, Eigen::Transpose<Eigen::Block<Eigen::Matrix<double, 9, 45, 1>, 1, 45, true>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 1, -1>>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>, Rhs = Eigen::Transpose<Eigen::Block<Eigen::Matrix<double, 9, 45, 1>, 1, 45, true>>, Option = 0]"
                          ;
                          goto LAB_00721a44;
                        }
                        local_bab0 = &local_baa8;
                        local_b090.m_rhs.m_matrix.
                        super_BlockImpl<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_45,_true,_Eigen::Dense>
                        .
                        super_BlockImpl_dense<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_45,_true,_true>
                        .m_startRow.m_value = (long)dVar185 + (long)dVar189;
                        local_b090.m_rhs.m_matrix.
                        super_BlockImpl<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_45,_true,_Eigen::Dense>
                        .
                        super_BlockImpl_dense<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_45,_true,_true>
                        .m_xpr = &local_a1a0;
                        local_b090.m_lhs.m_matrix.m_rhs.
                        super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_Eigen::Dense>
                        .
                        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>
                        .
                        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_1>
                        .
                        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_0>
                        .m_data = pdVar123 + (long)dVar185 * 0x2d;
                        local_b090.m_lhs.m_matrix.m_lhs.m_cols.m_value = 0x2d;
                        local_b090.m_lhs.m_matrix.m_lhs.m_functor.m_other = local_bb10;
                        local_b090.m_lhs.m_matrix.m_rhs.
                        super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_Eigen::Dense>
                        .
                        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>
                        .
                        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_1>
                        .
                        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_0>
                        .m_cols.m_value = 0x2d;
                        local_b090.m_lhs.m_matrix.m_rhs.
                        super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_Eigen::Dense>
                        .
                        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>
                        .m_xpr = local_bb08;
                        local_aa48.
                        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_45,_true>_>_>_>
                        .
                        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_45,_true>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                        .m_d.lhsImpl.
                        super_evaluator<Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>_>
                        .
                        super_unary_evaluator<Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>,_Eigen::internal::IndexBased,_double>
                        .m_argImpl.
                        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>
                        .
                        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                        .m_d.lhsImpl.
                        super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
                        .m_functor.m_other = local_bb10;
                        local_aa48.
                        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_45,_true>_>_>_>
                        .
                        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_45,_true>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                        .m_d.lhsImpl.
                        super_evaluator<Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>_>
                        .
                        super_unary_evaluator<Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>,_Eigen::internal::IndexBased,_double>
                        .m_argImpl.
                        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>
                        .
                        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                        .m_d.rhsImpl.
                        super_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>
                        .
                        super_block_evaluator<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>
                        .
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                        .m_outerStride.m_value = 0x2d;
                        local_b090.m_lhs.m_matrix.m_rhs.
                        super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_Eigen::Dense>
                        .
                        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>
                        .m_startCol.m_value = 0;
                        local_b090.m_lhs.m_matrix.m_rhs.
                        super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_Eigen::Dense>
                        .
                        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>
                        .m_outerStride = 0x2d;
                        local_b090.m_rhs.m_matrix.
                        super_BlockImpl<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_45,_true,_Eigen::Dense>
                        .
                        super_BlockImpl_dense<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_45,_true,_true>
                        .m_startCol.m_value = 0;
                        local_b090.m_rhs.m_matrix.
                        super_BlockImpl<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_45,_true,_Eigen::Dense>
                        .
                        super_BlockImpl_dense<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_45,_true,_true>
                        .m_outerStride = 0x2d;
                        local_b090.m_lhs.m_matrix.m_rhs.
                        super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_Eigen::Dense>
                        .
                        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>
                        .m_startRow.m_value = (long)dVar185;
                        local_b090.m_rhs.m_matrix.
                        super_BlockImpl<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_45,_true,_Eigen::Dense>
                        .
                        super_BlockImpl_dense<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_45,_true,_true>
                        .
                        super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_45,_true>,_1>
                        .
                        super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_45,_true>,_0>
                        .m_data = pdVar129;
                        local_aa48.
                        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_45,_true>_>_>_>
                        .
                        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_45,_true>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                        .m_d.lhsImpl.
                        super_evaluator<Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>_>
                        .
                        super_unary_evaluator<Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>,_Eigen::internal::IndexBased,_double>
                        .m_argImpl.
                        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>
                        .
                        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                        .m_d.rhsImpl.
                        super_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>
                        .
                        super_block_evaluator<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>
                        .
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                        .m_data = local_b090.m_lhs.m_matrix.m_rhs.
                                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_Eigen::Dense>
                                  .
                                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>
                                  .
                                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_1>
                                  .
                                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_0>
                                  .m_data;
                        local_aa48.
                        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_45,_true>_>_>_>
                        .
                        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_45,_true>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                        .m_d.rhsImpl.
                        super_evaluator<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_45,_true>_>_>
                        .
                        super_unary_evaluator<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_45,_true>_>,_Eigen::internal::IndexBased,_double>
                        .m_argImpl.
                        super_block_evaluator<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_45,_true,_true>
                        .
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_45,_true>,_Eigen::Matrix<double,_1,_45,_1,_1,_45>_>
                        .m_data = pdVar129;
                        local_baa8 = Eigen::internal::
                                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,-1,1,1,-1>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,1,-1,true>const>const>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,45,1,9,45>,1,45,true>>const>>,3,0>
                                     ::
                                     run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,_1,true>const>const>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,45,1,9,45>,1,45,true>>const>>
                                               (&local_aa48,&local_bb79,&local_b090);
                        if (local_bb30 == dVar189) {
                          __assert_fail("index >= 0 && index < size()",
                                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab
                                        ,
                                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, 45, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, 45, 1>, Level = 1]"
                                       );
                        }
                        lVar130 = (local_bb18->
                                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                  ).
                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                  .
                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                  .m_rows.m_value;
                        if ((lVar130 <= (long)local_bb00._0_8_) ||
                           (lVar3 = lVar132 + lVar133,
                           (local_bb18->
                           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                           ).
                           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                           .
                           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                           .m_cols.m_value <= lVar3)) {
LAB_0072198b:
                          __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f
                                        ,
                                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 1]"
                                       );
                        }
                        lVar41 = (local_bb18->
                                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                 ).m_stride.m_outer.m_value;
                        dVar190 = *local_bab0 + (double)local_bb40[(long)dVar189];
                        pdVar121 = (local_bb18->
                                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                   ).
                                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                   .
                                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                   .m_data;
                        lVar4 = local_bb50._0_8_ * lVar41 + local_bb50._0_8_;
                        *(double *)((long)pdVar121 + lVar133 * 8 + lVar4) =
                             dVar190 + *(double *)((long)pdVar121 + lVar133 * 8 + lVar4);
                        if (((lVar130 <= (long)local_ba60._0_8_) ||
                            ((lVar4 = lVar132 + 1 + lVar133,
                             (local_bb18->
                             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                             ).
                             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                             .
                             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                             .m_cols.m_value <= lVar4 ||
                             (lVar5 = local_bb60._0_8_ * lVar41 + local_bb50._0_8_,
                             *(double *)((long)pdVar121 + lVar133 * 8 + lVar5 + 8) =
                                  dVar190 + *(double *)((long)pdVar121 + lVar133 * 8 + lVar5 + 8),
                             lVar130 <= (long)local_ba80._0_8_)))) ||
                           (lVar5 = lVar132 + 2 + lVar133,
                           (local_bb18->
                           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                           ).
                           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                           .
                           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                           .m_cols.m_value <= lVar5)) goto LAB_0072198b;
                        lVar119 = (long)local_bb70 * lVar41 + local_bb50._0_8_;
                        *(double *)((long)pdVar121 + lVar133 * 8 + lVar119 + 0x10) =
                             dVar190 + *(double *)((long)pdVar121 + lVar133 * 8 + lVar119 + 0x10);
                        if (lVar133 != 0) {
                          if ((lVar130 <= lVar3) ||
                             ((local_bb18->
                              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                              ).
                              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                              .
                              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                              .m_cols.m_value <= (long)local_bb00._0_8_)) goto LAB_0072198b;
                          pdVar121[local_bb00._0_8_ + lVar3 * lVar41] =
                               dVar190 + pdVar121[local_bb00._0_8_ + lVar3 * lVar41];
                          if ((lVar130 <= lVar4) ||
                             ((local_bb18->
                              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                              ).
                              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                              .
                              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                              .m_cols.m_value <= (long)local_ba60._0_8_)) goto LAB_0072198b;
                          pdVar121[local_ba60._0_8_ + lVar4 * lVar41] =
                               dVar190 + pdVar121[local_ba60._0_8_ + lVar4 * lVar41];
                          if ((lVar130 <= lVar5) ||
                             ((local_bb18->
                              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                              ).
                              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                              .
                              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                              .m_cols.m_value <= (long)local_ba80._0_8_)) goto LAB_0072198b;
                          pdVar121[local_ba80._0_8_ + lVar41 * lVar5] =
                               dVar190 + pdVar121[local_ba80._0_8_ + lVar41 * lVar5];
                        }
                        lVar133 = lVar133 + 3;
                        dVar189 = (double)((long)dVar189 + 1);
                        pdVar129 = pdVar129 + 0x2d;
                      } while ((int)lVar133 + (int)lVar132 != 0x1b);
                      local_bb70 = (double)((long)local_bb70 + 0x18);
                      local_bb50._0_8_ = local_bb50._0_8_ + 0x18;
                      local_bb60._0_8_ = local_bb60._0_8_ + 0x18;
                      dVar185 = (double)((long)dVar185 + 1);
                      lVar132 = lVar132 + 3;
                      uVar120 = local_bad0._0_4_ + local_baa0;
                      local_baa0 = local_baa0 + -1;
                      pdVar129 = local_bac0 + 0x2d;
                      if (dVar185 == 4.44659081257122e-323) {
                        return;
                      }
                    } while( true );
                  }
                }
              }
              goto LAB_00721a51;
            }
          }
        }
      }
    }
    pcVar127 = 
    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, 12, 1>>, SrcXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, -1, -1>>, Functor = Eigen::internal::mul_assign_op<double>]"
    ;
LAB_00721a9f:
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar127);
  }
LAB_00721a51:
  pcVar127 = 
  "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, 12>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 1, BlockCols = 12, InnerPanel = false]"
  ;
LAB_00721a7d:
  __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,pcVar127);
}

Assistant:

void ChElementBeamANCF_3333::ComputeInternalJacobianContIntDamping(ChMatrixRef& H,
                                                                   double Kfactor,
                                                                   double Rfactor,
                                                                   double Mfactor) {
    // Calculate the Jacobian of the generalize internal force vector using the "Continuous Integration" style of method
    // assuming a linear viscoelastic material model (single term damping model).  For this style of method, the
    // Jacobian of the generalized internal force vector is integrated across the volume of the element every time this
    // calculation is performed. For this element, this is likely more efficient than the "Pre-Integration" style
    // calculation method.

    MatrixNx6 ebar_ebardot;
    CalcCombinedCoordMatrix(ebar_ebardot);

    // No values from the generalized internal force vector are cached for reuse in the Jacobian.  Instead these
    // quantities are recalculated again during the Jacobian calculations.  This both simplifies the code and speeds
    // up the generalized internal force calculation while only having a minimal impact on the performance of the
    // Jacobian calculation speed.  The Jacobian calculation is performed in two major pieces.  First is the
    // calculation of the potentially non-symmetric and non-sparse component.  The second piece is the symmetric
    // and sparse component.

    // =============================================================================
    // Calculate the deformation gradient and time derivative of the deformation gradient for all Gauss quadrature
    // points in a single matrix multiplication.  Note that since the shape function derivative matrix is ordered by
    // columns, the resulting deformation gradient will be ordered by block matrix (column vectors) components
    // Note that the indices of the components are in transposed order
    //      [F11  F21  F31  F11dot  F21dot  F31dot ] <-- D0 Block (No Poisson Effect)
    //      [F12  F22  F32  F12dot  F22dot  F32dot ] <-- D0 Block (No Poisson Effect)
    // FC = [F13  F23  F33  F13dot  F23dot  F33dot ] <-- D0 Block (No Poisson Effect)
    //      [F11  F21  F31  F11dot  F21dot  F31dot ] <-- Dv Block (With Poisson Effect)
    //      [F12  F22  F32  F12dot  F22dot  F32dot ] <-- Dv Block (With Poisson Effect)
    //      [F13  F23  F33  F13dot  F23dot  F33dot ] <-- Dv Block (With Poisson Effect)
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 6> FC = m_SD.transpose() * ebar_ebardot;

    //==============================================================================
    //==============================================================================
    // Calculate the potentially non-symmetric and non-sparse component of the Jacobian matrix
    //==============================================================================
    //==============================================================================

    // =============================================================================
    // Calculate the partial derivative of the Green-Largrange strains with respect to the nodal coordinates
    // (transposed).  This calculation is performed in blocks across all the Gauss quadrature points at the same
    // time.  This value should be store in row major memory layout to align with the access patterns for
    // calculating this matrix.
    // PE = [(d epsilon1/d e)GQPnt1' (d epsilon1/d e)GQPnt2' ... (d epsilon1/d e)GQPntNIP_D0'...
    //       (d epsilon2/d e)GQPnt1' (d epsilon2/d e)GQPnt2' ... (d epsilon2/d e)GQPntNIP_D0'...
    //       (d epsilon3/d e)GQPnt1' (d epsilon3/d e)GQPnt2' ... (d epsilon3/d e)GQPntNIP_D0'...
    //       (d epsilon4/d e)GQPnt1' (d epsilon4/d e)GQPnt2' ... (d epsilon4/d e)GQPntNIP_D0'...
    //       (d epsilon5/d e)GQPnt1' (d epsilon5/d e)GQPnt2' ... (d epsilon5/d e)GQPntNIP_D0'...
    //       (d epsilon6/d e)GQPnt1' (d epsilon6/d e)GQPnt2' ... (d epsilon6/d e)GQPntNIP_D0'...
    //       (d epsilon1/d e)GQPntDv1' ... (d epsilon1/d e)GQPntNIP_Dv'...
    //       (d epsilon2/d e)GQPntDv1' ... (d epsilon2/d e)GQPntNIP_Dv'...
    //       (d epsilon3/d e)GQPntDv1' ... (d epsilon3/d e)GQPntNIP_Dv']
    // Note that each partial derivative block shown is placed to the left of the previous block.
    // The explanation of the calculation above is just too long to write it all on a single line.
    // Since there are no shear terms with the material assumption for Dv, there is no need to calculate
    // (d epsilon4/d e), (d epsilon5/d e), (d epsilon6/d e) for the Dv Gauss points since these partial
    // derivatives will be multiplied by zero and will not contribute anything to the Jacobian matrix.
    // The calculation is performed on 3 rows at a time to capture the partial with respect to the vector of nodal
    // coordinates e while using the compact matrix form ebar for the calculations.
    // =============================================================================

    ChMatrixNM<double, 3 * NSF, 6 * NIP_D0 + 3 * NIP_Dv> PE;

    for (auto i = 0; i < NSF; i++) {
        PE.template block<1, NIP_D0>(3 * i, 0 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(0 * NIP_D0, 0).transpose());
        PE.template block<1, NIP_D0>(3 * i, 1 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(1 * NIP_D0, 0).transpose());
        PE.template block<1, NIP_D0>(3 * i, 2 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).transpose());
        PE.template block<1, NIP_D0>(3 * i, 3 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(1 * NIP_D0, 0).transpose()) +
            m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).transpose());
        PE.template block<1, NIP_D0>(3 * i, 4 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(0 * NIP_D0, 0).transpose()) +
            m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).transpose());
        PE.template block<1, NIP_D0>(3 * i, 5 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(0 * NIP_D0, 0).transpose()) +
            m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(1 * NIP_D0, 0).transpose());

        PE.template block<1, NIP_Dv>(3 * i, 6 * NIP_D0 + 0 * NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 0 * NIP_Dv)
                .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0 * NIP_Dv, 0).transpose());
        PE.template block<1, NIP_Dv>(3 * i, 6 * NIP_D0 + 1 * NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 1 * NIP_Dv)
                .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 1 * NIP_Dv, 0).transpose());
        PE.template block<1, NIP_Dv>(3 * i, 6 * NIP_D0 + 2 * NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 2 * NIP_Dv)
                .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0).transpose());

        PE.template block<1, NIP_D0>((3 * i) + 1, 0) =
            m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 1).transpose());
        PE.template block<1, NIP_D0>((3 * i) + 1, NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1).transpose());
        PE.template block<1, NIP_D0>((3 * i) + 1, 2 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).transpose());
        PE.template block<1, NIP_D0>((3 * i) + 1, 3 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1).transpose()) +
            m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).transpose());
        PE.template block<1, NIP_D0>((3 * i) + 1, 4 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 1).transpose()) +
            m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).transpose());
        PE.template block<1, NIP_D0>((3 * i) + 1, 5 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 1).transpose()) +
            m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1).transpose());

        PE.template block<1, NIP_Dv>((3 * i) + 1, 6 * NIP_D0 + 0) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 0 * NIP_Dv)
                .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).transpose());
        PE.template block<1, NIP_Dv>((3 * i) + 1, 6 * NIP_D0 + NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 1 * NIP_Dv)
                .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1).transpose());
        PE.template block<1, NIP_Dv>((3 * i) + 1, 6 * NIP_D0 + 2 * NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 2 * NIP_Dv)
                .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1).transpose());

        PE.template block<1, NIP_D0>((3 * i) + 2, 0) =
            m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 2).transpose());
        PE.template block<1, NIP_D0>((3 * i) + 2, NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2).transpose());
        PE.template block<1, NIP_D0>((3 * i) + 2, 2 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).transpose());
        PE.template block<1, NIP_D0>((3 * i) + 2, 3 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2).transpose()) +
            m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).transpose());
        PE.template block<1, NIP_D0>((3 * i) + 2, 4 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 2).transpose()) +
            m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).transpose());
        PE.template block<1, NIP_D0>((3 * i) + 2, 5 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 2).transpose()) +
            m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2).transpose());

        PE.template block<1, NIP_Dv>((3 * i) + 2, 6 * NIP_D0 + 0) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 0 * NIP_Dv)
                .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).transpose());
        PE.template block<1, NIP_Dv>((3 * i) + 2, 6 * NIP_D0 + NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 1 * NIP_Dv)
                .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2).transpose());
        PE.template block<1, NIP_Dv>((3 * i) + 2, 6 * NIP_D0 + 2 * NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 2 * NIP_Dv)
                .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2).transpose());
    }

    // =============================================================================
    // Combine the deformation gradient, time derivative of the deformation gradient, damping coefficient, Gauss
    // quadrature weighting times the element Jacobian, and Jacobian component scale factors into a scaled block
    // deformation gradient matrix Calculate the deformation gradient and time derivative of the deformation
    // gradient for all Gauss quadrature points in a single matrix multiplication.  Note that the resulting combined
    // deformation gradient block matrix will be ordered by block matrix (column vectors) components Note that the
    // indices of the components are in transposed order
    //            [kGQ*(Kfactor+alpha*Rfactor)*F11+alpha*Rfactor*F11dot ... similar for F21 & F31 blocks] <- D0
    // FCscaled = [kGQ*(Kfactor+alpha*Rfactor)*F12+alpha*Rfactor*F12dot ... similar for F22 & F32 blocks] <- D0
    //            [kGQ*(Kfactor+alpha*Rfactor)*F13+alpha*Rfactor*F13dot ... similar for F23 & F33 blocks] <- D0
    //            [kGQ*(Kfactor+alpha*Rfactor)*F11+alpha*Rfactor*F11dot ... similar for F21 & F31 blocks] <- Dv
    //            [kGQ*(Kfactor+alpha*Rfactor)*F12+alpha*Rfactor*F12dot ... similar for F22 & F32 blocks] <- Dv
    //            [kGQ*(Kfactor+alpha*Rfactor)*F13+alpha*Rfactor*F13dot ... similar for F23 & F33 blocks] <- Dv
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 3> FCscaled = (Kfactor + m_Alpha * Rfactor) * FC.template block<3 * NIP, 3>(0, 0) +
                                               (m_Alpha * Kfactor) * FC.template block<3 * NIP, 3>(0, 3);

    for (auto i = 0; i < 3; i++) {
        FCscaled.template block<NIP_D0, 1>(0, i).array() *= m_kGQ_D0.array();
        FCscaled.template block<NIP_D0, 1>(NIP_D0, i).array() *= m_kGQ_D0.array();
        FCscaled.template block<NIP_D0, 1>(2 * NIP_D0, i).array() *= m_kGQ_D0.array();
        FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, i).array() *= m_kGQ_Dv.array();
        FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, i).array() *= m_kGQ_Dv.array();
        FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, i).array() *= m_kGQ_Dv.array();
    }

    // =============================================================================
    // Get the diagonal terms of the 6x6 matrix (do not include the Poisson effect
    // =============================================================================
    const ChVectorN<double, 6>& D0 = GetMaterial()->Get_D0();

    // =============================================================================
    // Calculate the combination of the scaled partial derivative of the Green-Largrange strains with respect to the
    // nodal coordinates, the scaled partial derivative of the time derivative of the Green-Largrange strains with
    // respect to the nodal coordinates, the scaled partial derivative of the Green-Largrange strains with respect
    // to the time derivative of the nodal coordinates, and the other parameters to correctly integrate across the
    // volume of the element.  This calculation is performed in blocks across all the Gauss quadrature points at the
    // same time.  This value should be store in row major memory layout to align with the access patterns for
    // calculating this matrix.
    // =============================================================================
    // For the D0 Gauss quadrature points, the stiffness matrix D0 is diagonal so the scaled partial derivatives can be
    // easily multiplied by D0.  The Dv Gauss quadrature points are handled separately after this
    // =============================================================================

    ChMatrixNM<double, 3 * NSF, 6 * NIP_D0 + 3 * NIP_Dv> DScaled_Combined_PE;

    for (auto i = 0; i < NSF; i++) {
        DScaled_Combined_PE.template block<1, NIP_D0>(3 * i, 0) =
            D0(0) * m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                        .cwiseProduct(FCscaled.template block<NIP_D0, 1>(0, 0).transpose());
        DScaled_Combined_PE.template block<1, NIP_D0>(3 * i, NIP_D0) =
            D0(1) * m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                        .cwiseProduct(FCscaled.template block<NIP_D0, 1>(NIP_D0, 0).transpose());
        DScaled_Combined_PE.template block<1, NIP_D0>(3 * i, 2 * NIP_D0) =
            D0(2) * m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                        .cwiseProduct(FCscaled.template block<NIP_D0, 1>(2 * NIP_D0, 0).transpose());
        DScaled_Combined_PE.template block<1, NIP_D0>(3 * i, 3 * NIP_D0) =
            D0(3) * (m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(NIP_D0, 0).transpose()) +
                     m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(2 * NIP_D0, 0).transpose()));
        DScaled_Combined_PE.template block<1, NIP_D0>(3 * i, 4 * NIP_D0) =
            D0(4) * (m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(0, 0).transpose()) +
                     m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(2 * NIP_D0, 0).transpose()));
        DScaled_Combined_PE.template block<1, NIP_D0>(3 * i, 5 * NIP_D0) =
            D0(5) * (m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(0, 0).transpose()) +
                     m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(NIP_D0, 0).transpose()));

        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 1, 0) =
            D0(0) * m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                        .cwiseProduct(FCscaled.template block<NIP_D0, 1>(0, 1).transpose());
        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 1, NIP_D0) =
            D0(1) * m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                        .cwiseProduct(FCscaled.template block<NIP_D0, 1>(NIP_D0, 1).transpose());
        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 1, 2 * NIP_D0) =
            D0(2) * m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                        .cwiseProduct(FCscaled.template block<NIP_D0, 1>(2 * NIP_D0, 1).transpose());
        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 1, 3 * NIP_D0) =
            D0(3) * (m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(NIP_D0, 1).transpose()) +
                     m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(2 * NIP_D0, 1).transpose()));
        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 1, 4 * NIP_D0) =
            D0(4) * (m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(0, 1).transpose()) +
                     m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(2 * NIP_D0, 1).transpose()));
        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 1, 5 * NIP_D0) =
            D0(5) * (m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(0, 1).transpose()) +
                     m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(NIP_D0, 1).transpose()));

        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 2, 0) =
            D0(0) * m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                        .cwiseProduct(FCscaled.template block<NIP_D0, 1>(0, 2).transpose());
        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 2, NIP_D0) =
            D0(1) * m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                        .cwiseProduct(FCscaled.template block<NIP_D0, 1>(NIP_D0, 2).transpose());
        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 2, 2 * NIP_D0) =
            D0(2) * m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                        .cwiseProduct(FCscaled.template block<NIP_D0, 1>(2 * NIP_D0, 2).transpose());
        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 2, 3 * NIP_D0) =
            D0(3) * (m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(NIP_D0, 2).transpose()) +
                     m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(2 * NIP_D0, 2).transpose()));
        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 2, 4 * NIP_D0) =
            D0(4) * (m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(0, 2).transpose()) +
                     m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(2 * NIP_D0, 2).transpose()));
        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 2, 5 * NIP_D0) =
            D0(5) * (m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(0, 2).transpose()) +
                     m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(NIP_D0, 2).transpose()));
    }

    // =============================================================================
    // For the Dv Gauss quadrature points, the matrix of scaled partial derivatives needs to be calculated first since
    // they will be will be combined together when multiplying by the Dv stiffness matrix (upper 3x3 block is
    // potentially non-zero)
    // =============================================================================

    ChMatrixNM<double, 3 * NSF, 3 * NIP_Dv> Scaled_Combined_PE_Dv;

    for (auto i = 0; i < NSF; i++) {
        Scaled_Combined_PE_Dv.template block<1, NIP_Dv>(3 * i, 0) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 0 * NIP_Dv)
                .cwiseProduct(FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).transpose());
        Scaled_Combined_PE_Dv.template block<1, NIP_Dv>(3 * i, NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 1 * NIP_Dv)
                .cwiseProduct(FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0).transpose());
        Scaled_Combined_PE_Dv.template block<1, NIP_Dv>(3 * i, 2 * NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 2 * NIP_Dv)
                .cwiseProduct(FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0).transpose());

        Scaled_Combined_PE_Dv.template block<1, NIP_Dv>((3 * i) + 1, 0) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 0 * NIP_Dv)
                .cwiseProduct(FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).transpose());
        Scaled_Combined_PE_Dv.template block<1, NIP_Dv>((3 * i) + 1, NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 1 * NIP_Dv)
                .cwiseProduct(FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1).transpose());
        Scaled_Combined_PE_Dv.template block<1, NIP_Dv>((3 * i) + 1, 2 * NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 2 * NIP_Dv)
                .cwiseProduct(FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1).transpose());

        Scaled_Combined_PE_Dv.template block<1, NIP_Dv>((3 * i) + 2, 0) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 0 * NIP_Dv)
                .cwiseProduct(FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).transpose());
        Scaled_Combined_PE_Dv.template block<1, NIP_Dv>((3 * i) + 2, NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 1 * NIP_Dv)
                .cwiseProduct(FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2).transpose());
        Scaled_Combined_PE_Dv.template block<1, NIP_Dv>((3 * i) + 2, 2 * NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 2 * NIP_Dv)
                .cwiseProduct(FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2).transpose());
    }

    // =============================================================================
    // Get the upper 3x3 block of the stiffness tensor in 6x6 matrix that accounts for the Poisson effect.  Note that
    // with the split of the stiffness matrix and the assumed materials, the entries in the 6x6 stiffness matrix outside
    // of the upper 3x3 block are all zeros.
    // =============================================================================

    const ChMatrix33<double>& Dv = GetMaterial()->Get_Dv();

    // =============================================================================
    // For the Dv Gauss quadrature points, multiply the scaled and combined partial derivative block matrix by the
    // stiffness matrix for each individual Gauss quadrature point and place the results in th last 3*NIP_Dv columns of
    // the final scaled and combined partial derivative block matrix since the D0 Gauss quadrature point columns were
    // calculated above.
    // =============================================================================

    DScaled_Combined_PE.template block<3 * NSF, NIP_Dv>(0, 6 * NIP_D0 + 0) =
        Dv(0, 0) * Scaled_Combined_PE_Dv.template block<3 * NSF, NIP_Dv>(0, 0) +
        Dv(0, 1) * Scaled_Combined_PE_Dv.template block<3 * NSF, NIP_Dv>(0, NIP_Dv) +
        Dv(0, 2) * Scaled_Combined_PE_Dv.template block<3 * NSF, NIP_Dv>(0, 2 * NIP_Dv);
    DScaled_Combined_PE.template block<3 * NSF, NIP_Dv>(0, 6 * NIP_D0 + NIP_Dv) =
        Dv(1, 0) * Scaled_Combined_PE_Dv.template block<3 * NSF, NIP_Dv>(0, 0) +
        Dv(1, 1) * Scaled_Combined_PE_Dv.template block<3 * NSF, NIP_Dv>(0, NIP_Dv) +
        Dv(1, 2) * Scaled_Combined_PE_Dv.template block<3 * NSF, NIP_Dv>(0, 2 * NIP_Dv);
    DScaled_Combined_PE.template block<3 * NSF, NIP_Dv>(0, 6 * NIP_D0 + 2 * NIP_Dv) =
        Dv(2, 0) * Scaled_Combined_PE_Dv.template block<3 * NSF, NIP_Dv>(0, 0) +
        Dv(2, 1) * Scaled_Combined_PE_Dv.template block<3 * NSF, NIP_Dv>(0, NIP_Dv) +
        Dv(2, 2) * Scaled_Combined_PE_Dv.template block<3 * NSF, NIP_Dv>(0, 2 * NIP_Dv);

    // =============================================================================
    // Multiply the partial derivative block matrix by the final scaled and combined partial derivative block matrix
    // to obtain the potentially non-symmetric and non-sparse component of the Jacobian matrix
    // =============================================================================

    H = PE * DScaled_Combined_PE.transpose();

    //==============================================================================
    //==============================================================================
    // Calculate the sparse and symmetric component of the Jacobian matrix
    //==============================================================================
    //==============================================================================

    // =============================================================================
    // Calculate each individual value of the Green-Lagrange strain component by component across all the
    // Gauss-Quadrature points at a time to better leverage vectorized CPU instructions.
    // Note that the scaled time derivatives of the Green-Lagrange strain are added to make the later calculation of
    // the 2nd Piola-Kirchoff stresses more efficient.  The combined result is then scaled by minus the Gauss
    // quadrature weight times the element Jacobian at the corresponding Gauss point (m_kGQ) again for efficiency.
    // =============================================================================
    // For the D0 Gauss quadrature points:
    // Since only the diagonal terms in the 6x6 stiffness matrix are used, the 2nd Piola-Kirchoff stress can be
    // calculated by simply scaling the vector of scaled Green-Lagrange strains in Voight notation by the corresponding
    // diagonal entry in the stiffness matrix.
    // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
    //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
    // =============================================================================

    // Each entry in SPK2_1 = D11*kGQ*(E11+alpha*E11dot)
    //     = D11*kGQ*(1/2*(F11*F11+F21*F21+F31*F31-1)+alpha*(F11*F11dot+F21*F21dot+F31*F31dot))
    VectorNIP_D0 E_BlockDamping_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 3)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 4)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 5));
    VectorNIP_D0 SPK2_1_Block_D0 = FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 0)) +
                                   FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 1)) +
                                   FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 2));
    SPK2_1_Block_D0.array() -= 1;
    SPK2_1_Block_D0 += (2 * m_Alpha) * E_BlockDamping_D0;
    SPK2_1_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_1_Block_D0 *= (0.5 * D0(0));

    // Each entry in SPK2_2 = D22*kGQ*(E22+alpha*E22dot)
    //     = D22*kGQ*(1/2*(F12*F12+F22*F22+F32*F32-1)+alpha*(F12*F12dot+F22*F22dot+F32*F32dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 5));
    VectorNIP_D0 SPK2_2_Block_D0 =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2));
    SPK2_2_Block_D0.array() -= 1;
    SPK2_2_Block_D0 += (2 * m_Alpha) * E_BlockDamping_D0;
    SPK2_2_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_2_Block_D0 *= (0.5 * D0(1));

    // Each entry in SPK2_3 = D33*kGQ*(E33+alpha*E33dot)
    //     = D33*kGQ*(1/2*(F13*F13+F23*F23+F33*F33-1)+alpha*(F13*F13dot+F23*F23dot+F33*F33dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 5));
    VectorNIP_D0 SPK2_3_Block_D0 =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_3_Block_D0.array() -= 1;
    SPK2_3_Block_D0 += (2 * m_Alpha) * E_BlockDamping_D0;
    SPK2_3_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_3_Block_D0 *= (0.5 * D0(2));

    // Each entry in SPK2_4 = D44*kGQ*(2*(E23+alpha*E23dot))
    //     = D44*kGQ*((F12*F13+F22*F23+F32*F33)
    //       +alpha*(F12dot*F13+F22dot*F23+F32dot*F33 + F12*F13dot+F22*F23dot+F32*F33dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 5)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 5));
    VectorNIP_D0 SPK2_4_Block_D0 =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_4_Block_D0 += m_Alpha * E_BlockDamping_D0;
    SPK2_4_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_4_Block_D0 *= D0(3);

    // Each entry in SPK2_5 = D55*kGQ*(2*(E13+alpha*E13dot))
    //     = D55*kGQ*((F11*F13+F21*F23+F31*F33)
    //       +alpha*(F11dot*F13+F21dot*F23+F31dot*F33 + F11*F13dot+F21*F23dot+F31*F33dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 3)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 4)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 5)) +
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 5));
    VectorNIP_D0 SPK2_5_Block_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_5_Block_D0 += m_Alpha * E_BlockDamping_D0;
    SPK2_5_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_5_Block_D0 *= D0(4);

    // Each entry in SPK2_6 = D66*kGQ*(2*(E12+alpha*E12dot))
    //     = D66*kGQ*((F11*F12+F21*F22+F31*F32)
    //       +alpha*(F11dot*F12+F21dot*F22+F31dot*F32 + F11*F12dot+F21*F22dot+F31*F32dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 3)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 4)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 5)) +
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 5));
    VectorNIP_D0 SPK2_6_Block_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2));
    SPK2_6_Block_D0 += m_Alpha * E_BlockDamping_D0;
    SPK2_6_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_6_Block_D0 *= D0(5);

    // =============================================================================
    // For the Dv Gauss quadrature points:
    // Since only the upper 3x3 terms in the 6x6 stiffness matrix are used, only the E11, E22, and E33 components of the
    // Green-Lagrange strain tensor (combined and scaled) are needed since multiplying by the Dv stiffness matrix will
    // result in 2nd Piola-Kirchoff stresses that are only possibly non-zero for SPK2_11, SPK2_22, and SPK2_33. Results
    // are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
    // =============================================================================

    // Each entry in E1 = kGQ*(E11+alpha*E11dot)
    //                  = kGQ*(1/2*(F11*F11+F21*F21+F31*F31-1)+alpha*(F11*F11dot+F21*F21dot+F31*F31dot))
    VectorNIP_Dv E_BlockDamping_Dv =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 3)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 4)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 5));
    VectorNIP_Dv E1_Block_Dv =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2));
    E1_Block_Dv.array() -= 1;
    E1_Block_Dv *= 0.5;
    E1_Block_Dv += m_Alpha * E_BlockDamping_Dv;
    E1_Block_Dv.array() *= m_kGQ_Dv.array();

    // Each entry in E2 = kGQ*(E22+alpha*E22dot)
    //                  = kGQ*(1/2*(F12*F12+F22*F22+F32*F32-1)+alpha*(F12*F12dot+F22*F22dot+F32*F32dot))
    E_BlockDamping_Dv.noalias() = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 3)) +
                                  FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 4)) +
                                  FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 5));
    VectorNIP_Dv E2_Block_Dv = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2));
    E2_Block_Dv.array() -= 1;
    E2_Block_Dv *= 0.5;
    E2_Block_Dv += m_Alpha * E_BlockDamping_Dv;
    E2_Block_Dv.array() *= m_kGQ_Dv.array();

    // Each entry in E3 = kGQ*(E33+alpha*E33dot)
    //                  = kGQ*(1/2*(F13*F13+F23*F23+F33*F33-1)+alpha*(F13*F13dot+F23*F23dot+F33*F33dot))
    E_BlockDamping_Dv.noalias() = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 3)) +
                                  FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 4)) +
                                  FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 5));
    VectorNIP_Dv E3_Block_Dv = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2));
    E3_Block_Dv.array() -= 1;
    E3_Block_Dv *= 0.5;
    E3_Block_Dv += m_Alpha * E_BlockDamping_Dv;
    E3_Block_Dv.array() *= m_kGQ_Dv.array();

    // =============================================================================
    // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Dv Gauss quadrature points.
    // Note that the Green-Largrange strain components have been scaled have already been combined with their scaled
    // time derivatives and minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss
    // point to make the calculation of the 2nd Piola-Kirchoff stresses more efficient.
    //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
    //  where SPK2_23, SPK2_13, and SPK2_12 are zeros for the Dv Gauss quadrature points
    // =============================================================================

    VectorNIP_Dv SPK2_1_Block_Dv = Dv(0, 0) * E1_Block_Dv + Dv(0, 1) * E2_Block_Dv + Dv(0, 2) * E3_Block_Dv;
    VectorNIP_Dv SPK2_2_Block_Dv = Dv(1, 0) * E1_Block_Dv + Dv(1, 1) * E2_Block_Dv + Dv(1, 2) * E3_Block_Dv;
    VectorNIP_Dv SPK2_3_Block_Dv = Dv(2, 0) * E1_Block_Dv + Dv(2, 1) * E2_Block_Dv + Dv(2, 2) * E3_Block_Dv;

    // =============================================================================
    // Multiply the shape function derivative matrix by the 2nd Piola-Kirchoff stresses for each corresponding Gauss
    // quadrature point
    // =============================================================================

    ChMatrixNM<double, NSF, 3 * NIP> S_scaled_SD;

    for (auto i = 0; i < NSF; i++) {
        S_scaled_SD.template block<1, NIP_D0>(i, 0) =
            SPK2_1_Block_D0.transpose().cwiseProduct(m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)) +
            SPK2_6_Block_D0.transpose().cwiseProduct(m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)) +
            SPK2_5_Block_D0.transpose().cwiseProduct(m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0));

        S_scaled_SD.template block<1, NIP_D0>(i, NIP_D0) =
            SPK2_6_Block_D0.transpose().cwiseProduct(m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)) +
            SPK2_2_Block_D0.transpose().cwiseProduct(m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)) +
            SPK2_4_Block_D0.transpose().cwiseProduct(m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0));

        S_scaled_SD.template block<1, NIP_D0>(i, 2 * NIP_D0) =
            SPK2_5_Block_D0.transpose().cwiseProduct(m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)) +
            SPK2_4_Block_D0.transpose().cwiseProduct(m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)) +
            SPK2_3_Block_D0.transpose().cwiseProduct(m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0));

        S_scaled_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 0) =
            SPK2_1_Block_Dv.transpose().cwiseProduct(m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 0 * NIP_Dv));

        S_scaled_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + NIP_Dv) =
            SPK2_2_Block_Dv.transpose().cwiseProduct(m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 1 * NIP_Dv));

        S_scaled_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 2 * NIP_Dv) =
            SPK2_3_Block_Dv.transpose().cwiseProduct(m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 2 * NIP_Dv));
    }

    // =============================================================================
    // Calculate just the non-sparse upper triangular entires of the sparse and symmetric component of the Jacobian
    // matrix, combine this with the scaled mass matrix, and then expand them out to full size by summing the
    // contribution into the correct locations of the full sized Jacobian matrix
    // =============================================================================

    // Add in the Mass Matrix Which is Stored in Compact Upper Triangular Form
    ChVectorN<double, (NSF * (NSF + 1)) / 2> ScaledMassMatrix = Mfactor * m_MassMatrix;

    unsigned int idx = 0;
    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = i; j < NSF; j++) {
            double d = Kfactor * m_SD.row(i) * S_scaled_SD.row(j).transpose();
            d += ScaledMassMatrix(idx);

            H(3 * i, 3 * j) += d;
            H(3 * i + 1, 3 * j + 1) += d;
            H(3 * i + 2, 3 * j + 2) += d;
            if (i != j) {
                H(3 * j, 3 * i) += d;
                H(3 * j + 1, 3 * i + 1) += d;
                H(3 * j + 2, 3 * i + 2) += d;
            }
            idx++;
        }
    }
}